

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

bool embree::avx::CurveNvIntersector1<8>::
     occluded_t<embree::avx::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [28];
  undefined1 (*pauVar2) [32];
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined4 uVar7;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Primitive PVar16;
  Geometry *pGVar17;
  RTCFilterFunctionN p_Var18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  long lVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [28];
  undefined1 auVar126 [28];
  undefined1 auVar127 [28];
  undefined1 auVar128 [24];
  int iVar129;
  Geometry *pGVar130;
  ulong uVar131;
  ulong uVar132;
  uint uVar133;
  ulong uVar134;
  Geometry *pGVar135;
  byte bVar136;
  long lVar137;
  long lVar138;
  ulong uVar139;
  bool bVar140;
  undefined1 auVar144 [16];
  float fVar141;
  float fVar142;
  undefined1 auVar145 [16];
  float fVar143;
  float fVar157;
  float fVar159;
  float fVar161;
  float fVar162;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  float fVar160;
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  float fVar158;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar163;
  float fVar176;
  float fVar177;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  float fVar178;
  float fVar179;
  undefined1 auVar171 [32];
  float fVar180;
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  float fVar191;
  undefined1 auVar192 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar193 [16];
  float fVar206;
  float fVar208;
  float fVar211;
  float fVar212;
  float fVar214;
  undefined1 auVar198 [32];
  float fVar210;
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  float fVar207;
  float fVar209;
  float fVar213;
  float fVar215;
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [64];
  float fVar216;
  float fVar239;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar217;
  float fVar218;
  float fVar219;
  undefined1 auVar223 [16];
  float fVar231;
  float fVar235;
  float fVar243;
  float fVar244;
  float fVar245;
  undefined1 auVar224 [32];
  float fVar232;
  float fVar233;
  float fVar236;
  float fVar237;
  float fVar240;
  float fVar241;
  undefined1 auVar225 [32];
  float fVar234;
  float fVar238;
  float fVar242;
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  float fVar246;
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [64];
  float fVar247;
  float fVar256;
  float fVar258;
  undefined1 auVar249 [16];
  float fVar260;
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar264;
  undefined1 auVar251 [32];
  float fVar259;
  undefined1 auVar250 [16];
  float fVar248;
  float fVar257;
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  float fVar265;
  float fVar277;
  float fVar278;
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  float fVar279;
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  float fVar280;
  float fVar281;
  undefined1 auVar275 [32];
  undefined1 auVar276 [64];
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  float fVar297;
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  float fVar298;
  float fVar305;
  float fVar306;
  float fVar307;
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [64];
  float fVar308;
  float fVar314;
  float fVar315;
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar319;
  undefined1 auVar309 [32];
  float fVar320;
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  float fVar327;
  float fVar328;
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  float fVar332;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  float fVar337;
  float fVar344;
  float fVar345;
  float fVar346;
  float in_register_0000151c;
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  float fVar347;
  float fVar348;
  float fVar353;
  float fVar355;
  float fVar357;
  undefined1 auVar349 [32];
  float fVar354;
  float fVar356;
  float fVar358;
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  float fVar359;
  float fVar360;
  float fVar364;
  float fVar366;
  float fVar368;
  float fVar370;
  float fVar371;
  float fVar372;
  float in_register_0000159c;
  undefined1 auVar361 [32];
  float fVar365;
  float fVar367;
  float fVar369;
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  float fVar373;
  float fVar376;
  float fVar377;
  float fVar378;
  float in_register_000015dc;
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  int local_7dc;
  Ray *local_7d8;
  ulong local_7d0;
  undefined4 local_7c4;
  undefined1 local_7c0 [8];
  undefined8 uStack_7b8;
  Precalculations *local_7a8;
  ulong local_7a0;
  undefined1 auStack_798 [24];
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  uint local_740;
  undefined4 uStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  RTCFilterFunctionNArguments local_6b0;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  undefined1 auStack_670 [8];
  float fStack_668;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  undefined1 auStack_650 [8];
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [16];
  undefined1 auStack_630 [16];
  uint local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined8 local_5b0;
  undefined4 local_5a8;
  float local_5a4;
  undefined4 local_5a0;
  undefined4 local_59c;
  undefined4 local_598;
  uint local_594;
  uint local_590;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 auStack_4f0 [16];
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [8];
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [8];
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [32];
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  uint local_2c0;
  uint local_2bc;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined1 local_260 [32];
  float local_240 [4];
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  
  PVar16 = prim[1];
  uVar139 = (ulong)(byte)PVar16;
  lVar137 = uVar139 * 5;
  lVar111 = uVar139 * 0x19;
  auVar194 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar111 + 6));
  fVar247 = *(float *)(prim + lVar111 + 0x12);
  auVar164._0_4_ = fVar247 * auVar194._0_4_;
  auVar164._4_4_ = fVar247 * auVar194._4_4_;
  auVar164._8_4_ = fVar247 * auVar194._8_4_;
  auVar164._12_4_ = fVar247 * auVar194._12_4_;
  auVar249._0_4_ = fVar247 * (ray->dir).field_0.m128[0];
  auVar249._4_4_ = fVar247 * (ray->dir).field_0.m128[1];
  auVar249._8_4_ = fVar247 * (ray->dir).field_0.m128[2];
  auVar249._12_4_ = fVar247 * (ray->dir).field_0.m128[3];
  auVar194 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 * 4 + 6)));
  auVar182 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 * 4 + 10)));
  auVar146._16_16_ = auVar182;
  auVar146._0_16_ = auVar194;
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar194 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar137 + 6)));
  auVar182 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar137 + 10)));
  auVar186._16_16_ = auVar182;
  auVar186._0_16_ = auVar194;
  auVar194 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 * 6 + 6)));
  auVar182 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 * 6 + 10)));
  auVar301 = vcvtdq2ps_avx(auVar186);
  auVar198._16_16_ = auVar182;
  auVar198._0_16_ = auVar194;
  auVar20 = vcvtdq2ps_avx(auVar198);
  auVar194 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 * 0xb + 6)));
  auVar182 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 * 0xb + 10)));
  auVar224._16_16_ = auVar182;
  auVar224._0_16_ = auVar194;
  uVar131 = (ulong)((uint)(byte)PVar16 * 0xc);
  auVar194 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar224);
  auVar182 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 + 10)));
  auVar269._16_16_ = auVar182;
  auVar269._0_16_ = auVar194;
  auVar22 = vcvtdq2ps_avx(auVar269);
  auVar194 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 + uVar139 + 6)));
  auVar182 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 + uVar139 + 10)));
  auVar282._16_16_ = auVar182;
  auVar282._0_16_ = auVar194;
  auVar23 = vcvtdq2ps_avx(auVar282);
  lVar138 = uVar139 * 9;
  uVar131 = (ulong)(uint)((int)lVar138 * 2);
  auVar194 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 + 6)));
  auVar182 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 + 10)));
  auVar299._16_16_ = auVar182;
  auVar299._0_16_ = auVar194;
  auVar194 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 + uVar139 + 6)));
  auVar182 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 + uVar139 + 10)));
  auVar24 = vcvtdq2ps_avx(auVar299);
  auVar309._16_16_ = auVar182;
  auVar309._0_16_ = auVar194;
  auVar25 = vcvtdq2ps_avx(auVar309);
  uVar131 = (ulong)(uint)((int)lVar137 << 2);
  auVar194 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 + 6)));
  auVar182 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 + 10)));
  auVar321._16_16_ = auVar182;
  auVar321._0_16_ = auVar194;
  auVar26 = vcvtdq2ps_avx(auVar321);
  auVar194 = vshufps_avx(auVar249,auVar249,0);
  auVar182 = vshufps_avx(auVar249,auVar249,0x55);
  auVar223 = vshufps_avx(auVar249,auVar249,0xaa);
  fVar247 = auVar223._0_4_;
  fVar256 = auVar223._4_4_;
  fVar258 = auVar223._8_4_;
  fVar259 = auVar223._12_4_;
  fVar260 = auVar182._0_4_;
  fVar262 = auVar182._4_4_;
  fVar263 = auVar182._8_4_;
  fVar191 = auVar182._12_4_;
  fVar206 = auVar194._0_4_;
  fVar208 = auVar194._4_4_;
  fVar210 = auVar194._8_4_;
  fVar211 = auVar194._12_4_;
  auVar338._0_4_ = fVar206 * auVar146._0_4_ + fVar260 * auVar301._0_4_ + fVar247 * auVar20._0_4_;
  auVar338._4_4_ = fVar208 * auVar146._4_4_ + fVar262 * auVar301._4_4_ + fVar256 * auVar20._4_4_;
  auVar338._8_4_ = fVar210 * auVar146._8_4_ + fVar263 * auVar301._8_4_ + fVar258 * auVar20._8_4_;
  auVar338._12_4_ = fVar211 * auVar146._12_4_ + fVar191 * auVar301._12_4_ + fVar259 * auVar20._12_4_
  ;
  auVar338._16_4_ = fVar206 * auVar146._16_4_ + fVar260 * auVar301._16_4_ + fVar247 * auVar20._16_4_
  ;
  auVar338._20_4_ = fVar208 * auVar146._20_4_ + fVar262 * auVar301._20_4_ + fVar256 * auVar20._20_4_
  ;
  auVar338._24_4_ = fVar210 * auVar146._24_4_ + fVar263 * auVar301._24_4_ + fVar258 * auVar20._24_4_
  ;
  auVar338._28_4_ = fVar191 + in_register_000015dc + in_register_0000151c;
  auVar329._0_4_ = fVar206 * auVar21._0_4_ + fVar260 * auVar22._0_4_ + fVar247 * auVar23._0_4_;
  auVar329._4_4_ = fVar208 * auVar21._4_4_ + fVar262 * auVar22._4_4_ + fVar256 * auVar23._4_4_;
  auVar329._8_4_ = fVar210 * auVar21._8_4_ + fVar263 * auVar22._8_4_ + fVar258 * auVar23._8_4_;
  auVar329._12_4_ = fVar211 * auVar21._12_4_ + fVar191 * auVar22._12_4_ + fVar259 * auVar23._12_4_;
  auVar329._16_4_ = fVar206 * auVar21._16_4_ + fVar260 * auVar22._16_4_ + fVar247 * auVar23._16_4_;
  auVar329._20_4_ = fVar208 * auVar21._20_4_ + fVar262 * auVar22._20_4_ + fVar256 * auVar23._20_4_;
  auVar329._24_4_ = fVar210 * auVar21._24_4_ + fVar263 * auVar22._24_4_ + fVar258 * auVar23._24_4_;
  auVar329._28_4_ = fVar191 + in_register_000015dc + in_register_0000159c;
  auVar251._0_4_ = fVar206 * auVar24._0_4_ + fVar260 * auVar25._0_4_ + auVar26._0_4_ * fVar247;
  auVar251._4_4_ = fVar208 * auVar24._4_4_ + fVar262 * auVar25._4_4_ + auVar26._4_4_ * fVar256;
  auVar251._8_4_ = fVar210 * auVar24._8_4_ + fVar263 * auVar25._8_4_ + auVar26._8_4_ * fVar258;
  auVar251._12_4_ = fVar211 * auVar24._12_4_ + fVar191 * auVar25._12_4_ + auVar26._12_4_ * fVar259;
  auVar251._16_4_ = fVar206 * auVar24._16_4_ + fVar260 * auVar25._16_4_ + auVar26._16_4_ * fVar247;
  auVar251._20_4_ = fVar208 * auVar24._20_4_ + fVar262 * auVar25._20_4_ + auVar26._20_4_ * fVar256;
  auVar251._24_4_ = fVar210 * auVar24._24_4_ + fVar263 * auVar25._24_4_ + auVar26._24_4_ * fVar258;
  auVar251._28_4_ = fVar211 + fVar191 + fVar259;
  auVar194 = vshufps_avx(auVar164,auVar164,0);
  auVar182 = vshufps_avx(auVar164,auVar164,0x55);
  auVar223 = vshufps_avx(auVar164,auVar164,0xaa);
  fVar256 = auVar223._0_4_;
  fVar258 = auVar223._4_4_;
  fVar259 = auVar223._8_4_;
  fVar260 = auVar223._12_4_;
  fVar208 = auVar182._0_4_;
  fVar210 = auVar182._4_4_;
  fVar211 = auVar182._8_4_;
  fVar212 = auVar182._12_4_;
  fVar262 = auVar194._0_4_;
  fVar263 = auVar194._4_4_;
  fVar191 = auVar194._8_4_;
  fVar206 = auVar194._12_4_;
  fVar247 = auVar146._28_4_;
  auVar270._0_4_ = fVar262 * auVar146._0_4_ + fVar208 * auVar301._0_4_ + fVar256 * auVar20._0_4_;
  auVar270._4_4_ = fVar263 * auVar146._4_4_ + fVar210 * auVar301._4_4_ + fVar258 * auVar20._4_4_;
  auVar270._8_4_ = fVar191 * auVar146._8_4_ + fVar211 * auVar301._8_4_ + fVar259 * auVar20._8_4_;
  auVar270._12_4_ = fVar206 * auVar146._12_4_ + fVar212 * auVar301._12_4_ + fVar260 * auVar20._12_4_
  ;
  auVar270._16_4_ = fVar262 * auVar146._16_4_ + fVar208 * auVar301._16_4_ + fVar256 * auVar20._16_4_
  ;
  auVar270._20_4_ = fVar263 * auVar146._20_4_ + fVar210 * auVar301._20_4_ + fVar258 * auVar20._20_4_
  ;
  auVar270._24_4_ = fVar191 * auVar146._24_4_ + fVar211 * auVar301._24_4_ + fVar259 * auVar20._24_4_
  ;
  auVar270._28_4_ = fVar247 + auVar301._28_4_ + auVar20._28_4_;
  auVar187._0_4_ = fVar262 * auVar21._0_4_ + fVar208 * auVar22._0_4_ + fVar256 * auVar23._0_4_;
  auVar187._4_4_ = fVar263 * auVar21._4_4_ + fVar210 * auVar22._4_4_ + fVar258 * auVar23._4_4_;
  auVar187._8_4_ = fVar191 * auVar21._8_4_ + fVar211 * auVar22._8_4_ + fVar259 * auVar23._8_4_;
  auVar187._12_4_ = fVar206 * auVar21._12_4_ + fVar212 * auVar22._12_4_ + fVar260 * auVar23._12_4_;
  auVar187._16_4_ = fVar262 * auVar21._16_4_ + fVar208 * auVar22._16_4_ + fVar256 * auVar23._16_4_;
  auVar187._20_4_ = fVar263 * auVar21._20_4_ + fVar210 * auVar22._20_4_ + fVar258 * auVar23._20_4_;
  auVar187._24_4_ = fVar191 * auVar21._24_4_ + fVar211 * auVar22._24_4_ + fVar259 * auVar23._24_4_;
  auVar187._28_4_ = fVar247 + auVar20._28_4_ + auVar23._28_4_;
  auVar147._0_4_ = fVar262 * auVar24._0_4_ + fVar208 * auVar25._0_4_ + auVar26._0_4_ * fVar256;
  auVar147._4_4_ = fVar263 * auVar24._4_4_ + fVar210 * auVar25._4_4_ + auVar26._4_4_ * fVar258;
  auVar147._8_4_ = fVar191 * auVar24._8_4_ + fVar211 * auVar25._8_4_ + auVar26._8_4_ * fVar259;
  auVar147._12_4_ = fVar206 * auVar24._12_4_ + fVar212 * auVar25._12_4_ + auVar26._12_4_ * fVar260;
  auVar147._16_4_ = fVar262 * auVar24._16_4_ + fVar208 * auVar25._16_4_ + auVar26._16_4_ * fVar256;
  auVar147._20_4_ = fVar263 * auVar24._20_4_ + fVar210 * auVar25._20_4_ + auVar26._20_4_ * fVar258;
  auVar147._24_4_ = fVar191 * auVar24._24_4_ + fVar211 * auVar25._24_4_ + auVar26._24_4_ * fVar259;
  auVar147._28_4_ = fVar247 + auVar22._28_4_ + fVar260;
  auVar283._8_4_ = 0x7fffffff;
  auVar283._0_8_ = 0x7fffffff7fffffff;
  auVar283._12_4_ = 0x7fffffff;
  auVar283._16_4_ = 0x7fffffff;
  auVar283._20_4_ = 0x7fffffff;
  auVar283._24_4_ = 0x7fffffff;
  auVar283._28_4_ = 0x7fffffff;
  auVar167._8_4_ = 0x219392ef;
  auVar167._0_8_ = 0x219392ef219392ef;
  auVar167._12_4_ = 0x219392ef;
  auVar167._16_4_ = 0x219392ef;
  auVar167._20_4_ = 0x219392ef;
  auVar167._24_4_ = 0x219392ef;
  auVar167._28_4_ = 0x219392ef;
  auVar146 = vandps_avx(auVar338,auVar283);
  auVar146 = vcmpps_avx(auVar146,auVar167,1);
  auVar301 = vblendvps_avx(auVar338,auVar167,auVar146);
  auVar146 = vandps_avx(auVar329,auVar283);
  auVar146 = vcmpps_avx(auVar146,auVar167,1);
  auVar20 = vblendvps_avx(auVar329,auVar167,auVar146);
  auVar146 = vandps_avx(auVar251,auVar283);
  auVar146 = vcmpps_avx(auVar146,auVar167,1);
  auVar146 = vblendvps_avx(auVar251,auVar167,auVar146);
  auVar21 = vrcpps_avx(auVar301);
  fVar247 = auVar21._0_4_;
  fVar256 = auVar21._4_4_;
  auVar22._4_4_ = auVar301._4_4_ * fVar256;
  auVar22._0_4_ = auVar301._0_4_ * fVar247;
  fVar258 = auVar21._8_4_;
  auVar22._8_4_ = auVar301._8_4_ * fVar258;
  fVar259 = auVar21._12_4_;
  auVar22._12_4_ = auVar301._12_4_ * fVar259;
  fVar260 = auVar21._16_4_;
  auVar22._16_4_ = auVar301._16_4_ * fVar260;
  fVar262 = auVar21._20_4_;
  auVar22._20_4_ = auVar301._20_4_ * fVar262;
  fVar263 = auVar21._24_4_;
  auVar22._24_4_ = auVar301._24_4_ * fVar263;
  auVar22._28_4_ = auVar301._28_4_;
  auVar284._8_4_ = 0x3f800000;
  auVar284._0_8_ = &DAT_3f8000003f800000;
  auVar284._12_4_ = 0x3f800000;
  auVar284._16_4_ = 0x3f800000;
  auVar284._20_4_ = 0x3f800000;
  auVar284._24_4_ = 0x3f800000;
  auVar284._28_4_ = 0x3f800000;
  auVar22 = vsubps_avx(auVar284,auVar22);
  fVar247 = fVar247 + fVar247 * auVar22._0_4_;
  fVar256 = fVar256 + fVar256 * auVar22._4_4_;
  fVar258 = fVar258 + fVar258 * auVar22._8_4_;
  fVar259 = fVar259 + fVar259 * auVar22._12_4_;
  fVar260 = fVar260 + fVar260 * auVar22._16_4_;
  fVar262 = fVar262 + fVar262 * auVar22._20_4_;
  fVar263 = fVar263 + fVar263 * auVar22._24_4_;
  auVar301 = vrcpps_avx(auVar20);
  fVar191 = auVar301._0_4_;
  fVar206 = auVar301._4_4_;
  auVar23._4_4_ = fVar206 * auVar20._4_4_;
  auVar23._0_4_ = fVar191 * auVar20._0_4_;
  fVar208 = auVar301._8_4_;
  auVar23._8_4_ = fVar208 * auVar20._8_4_;
  fVar210 = auVar301._12_4_;
  auVar23._12_4_ = fVar210 * auVar20._12_4_;
  fVar211 = auVar301._16_4_;
  auVar23._16_4_ = fVar211 * auVar20._16_4_;
  fVar212 = auVar301._20_4_;
  auVar23._20_4_ = fVar212 * auVar20._20_4_;
  fVar214 = auVar301._24_4_;
  auVar23._24_4_ = fVar214 * auVar20._24_4_;
  auVar23._28_4_ = auVar20._28_4_;
  auVar301 = vsubps_avx(auVar284,auVar23);
  fVar191 = fVar191 + fVar191 * auVar301._0_4_;
  fVar206 = fVar206 + fVar206 * auVar301._4_4_;
  fVar208 = fVar208 + fVar208 * auVar301._8_4_;
  fVar210 = fVar210 + fVar210 * auVar301._12_4_;
  fVar211 = fVar211 + fVar211 * auVar301._16_4_;
  fVar212 = fVar212 + fVar212 * auVar301._20_4_;
  fVar214 = fVar214 + fVar214 * auVar301._24_4_;
  auVar301 = vrcpps_avx(auVar146);
  fVar216 = auVar301._0_4_;
  fVar231 = auVar301._4_4_;
  auVar20._4_4_ = fVar231 * auVar146._4_4_;
  auVar20._0_4_ = fVar216 * auVar146._0_4_;
  fVar235 = auVar301._8_4_;
  auVar20._8_4_ = fVar235 * auVar146._8_4_;
  fVar239 = auVar301._12_4_;
  auVar20._12_4_ = fVar239 * auVar146._12_4_;
  fVar243 = auVar301._16_4_;
  auVar20._16_4_ = fVar243 * auVar146._16_4_;
  fVar244 = auVar301._20_4_;
  auVar20._20_4_ = fVar244 * auVar146._20_4_;
  fVar245 = auVar301._24_4_;
  auVar20._24_4_ = fVar245 * auVar146._24_4_;
  auVar20._28_4_ = auVar146._28_4_;
  auVar146 = vsubps_avx(auVar284,auVar20);
  auVar194._8_8_ = 0;
  auVar194._0_8_ = *(ulong *)(prim + uVar139 * 7 + 6);
  auVar194 = vpmovsxwd_avx(auVar194);
  auVar182._8_8_ = 0;
  auVar182._0_8_ = *(ulong *)(prim + uVar139 * 7 + 0xe);
  auVar182 = vpmovsxwd_avx(auVar182);
  fVar216 = fVar216 + fVar216 * auVar146._0_4_;
  fVar231 = fVar231 + fVar231 * auVar146._4_4_;
  fVar235 = fVar235 + fVar235 * auVar146._8_4_;
  fVar239 = fVar239 + fVar239 * auVar146._12_4_;
  fVar243 = fVar243 + fVar243 * auVar146._16_4_;
  fVar244 = fVar244 + fVar244 * auVar146._20_4_;
  fVar245 = fVar245 + fVar245 * auVar146._24_4_;
  auVar168._16_16_ = auVar182;
  auVar168._0_16_ = auVar194;
  auVar146 = vcvtdq2ps_avx(auVar168);
  auVar146 = vsubps_avx(auVar146,auVar270);
  auVar223._8_8_ = 0;
  auVar223._0_8_ = *(ulong *)(prim + lVar138 + 6);
  auVar194 = vpmovsxwd_avx(auVar223);
  auVar195._8_8_ = 0;
  auVar195._0_8_ = *(ulong *)(prim + lVar138 + 0xe);
  auVar182 = vpmovsxwd_avx(auVar195);
  auVar165._0_4_ = fVar247 * auVar146._0_4_;
  auVar165._4_4_ = fVar256 * auVar146._4_4_;
  auVar165._8_4_ = fVar258 * auVar146._8_4_;
  auVar165._12_4_ = fVar259 * auVar146._12_4_;
  auVar24._16_4_ = fVar260 * auVar146._16_4_;
  auVar24._0_16_ = auVar165;
  auVar24._20_4_ = fVar262 * auVar146._20_4_;
  auVar24._24_4_ = fVar263 * auVar146._24_4_;
  auVar24._28_4_ = auVar146._28_4_;
  auVar285._16_16_ = auVar182;
  auVar285._0_16_ = auVar194;
  auVar146 = vcvtdq2ps_avx(auVar285);
  auVar146 = vsubps_avx(auVar146,auVar270);
  lVar137 = (ulong)(byte)PVar16 * 0x10;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + lVar137 + 6);
  auVar194 = vpmovsxwd_avx(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + lVar137 + 0xe);
  auVar182 = vpmovsxwd_avx(auVar10);
  lVar137 = lVar137 + uVar139 * -2;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + lVar137 + 6);
  auVar223 = vpmovsxwd_avx(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + lVar137 + 0xe);
  auVar195 = vpmovsxwd_avx(auVar12);
  auVar250._0_4_ = fVar247 * auVar146._0_4_;
  auVar250._4_4_ = fVar256 * auVar146._4_4_;
  auVar250._8_4_ = fVar258 * auVar146._8_4_;
  auVar250._12_4_ = fVar259 * auVar146._12_4_;
  auVar25._16_4_ = fVar260 * auVar146._16_4_;
  auVar25._0_16_ = auVar250;
  auVar25._20_4_ = fVar262 * auVar146._20_4_;
  auVar25._24_4_ = fVar263 * auVar146._24_4_;
  auVar25._28_4_ = auVar21._28_4_ + auVar22._28_4_;
  auVar271._16_16_ = auVar195;
  auVar271._0_16_ = auVar223;
  auVar146 = vcvtdq2ps_avx(auVar271);
  auVar146 = vsubps_avx(auVar146,auVar187);
  auVar266._0_4_ = fVar191 * auVar146._0_4_;
  auVar266._4_4_ = fVar206 * auVar146._4_4_;
  auVar266._8_4_ = fVar208 * auVar146._8_4_;
  auVar266._12_4_ = fVar210 * auVar146._12_4_;
  auVar21._16_4_ = fVar211 * auVar146._16_4_;
  auVar21._0_16_ = auVar266;
  auVar21._20_4_ = fVar212 * auVar146._20_4_;
  auVar21._24_4_ = fVar214 * auVar146._24_4_;
  auVar21._28_4_ = auVar146._28_4_;
  auVar286._16_16_ = auVar182;
  auVar286._0_16_ = auVar194;
  auVar146 = vcvtdq2ps_avx(auVar286);
  auVar146 = vsubps_avx(auVar146,auVar187);
  auVar268._8_8_ = 0;
  auVar268._0_8_ = *(ulong *)(prim + uVar131 + uVar139 + 6);
  auVar194 = vpmovsxwd_avx(auVar268);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar131 + uVar139 + 0xe);
  auVar182 = vpmovsxwd_avx(auVar13);
  auVar181._0_4_ = fVar191 * auVar146._0_4_;
  auVar181._4_4_ = fVar206 * auVar146._4_4_;
  auVar181._8_4_ = fVar208 * auVar146._8_4_;
  auVar181._12_4_ = fVar210 * auVar146._12_4_;
  auVar26._16_4_ = fVar211 * auVar146._16_4_;
  auVar26._0_16_ = auVar181;
  auVar26._20_4_ = fVar212 * auVar146._20_4_;
  auVar26._24_4_ = fVar214 * auVar146._24_4_;
  auVar26._28_4_ = auVar146._28_4_;
  auVar199._16_16_ = auVar182;
  auVar199._0_16_ = auVar194;
  auVar146 = vcvtdq2ps_avx(auVar199);
  auVar146 = vsubps_avx(auVar146,auVar147);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar139 * 0x17 + 6);
  auVar194 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar139 * 0x17 + 0xe);
  auVar182 = vpmovsxwd_avx(auVar15);
  auVar192._0_4_ = fVar216 * auVar146._0_4_;
  auVar192._4_4_ = fVar231 * auVar146._4_4_;
  auVar192._8_4_ = fVar235 * auVar146._8_4_;
  auVar192._12_4_ = fVar239 * auVar146._12_4_;
  auVar27._16_4_ = fVar243 * auVar146._16_4_;
  auVar27._0_16_ = auVar192;
  auVar27._20_4_ = fVar244 * auVar146._20_4_;
  auVar27._24_4_ = fVar245 * auVar146._24_4_;
  auVar27._28_4_ = auVar146._28_4_;
  auVar287._16_16_ = auVar182;
  auVar287._0_16_ = auVar194;
  auVar146 = vcvtdq2ps_avx(auVar287);
  auVar146 = vsubps_avx(auVar146,auVar147);
  auVar144._0_4_ = fVar216 * auVar146._0_4_;
  auVar144._4_4_ = fVar231 * auVar146._4_4_;
  auVar144._8_4_ = fVar235 * auVar146._8_4_;
  auVar144._12_4_ = fVar239 * auVar146._12_4_;
  auVar19._16_4_ = fVar243 * auVar146._16_4_;
  auVar19._0_16_ = auVar144;
  auVar19._20_4_ = fVar244 * auVar146._20_4_;
  auVar19._24_4_ = fVar245 * auVar146._24_4_;
  auVar19._28_4_ = auVar146._28_4_;
  auVar194 = vpminsd_avx(auVar24._16_16_,auVar25._16_16_);
  auVar182 = vpminsd_avx(auVar165,auVar250);
  auVar300._16_16_ = auVar194;
  auVar300._0_16_ = auVar182;
  auVar194 = vpminsd_avx(auVar21._16_16_,auVar26._16_16_);
  auVar182 = vpminsd_avx(auVar266,auVar181);
  auVar330._16_16_ = auVar194;
  auVar330._0_16_ = auVar182;
  auVar146 = vmaxps_avx(auVar300,auVar330);
  auVar194 = vpminsd_avx(auVar27._16_16_,auVar19._16_16_);
  auVar182 = vpminsd_avx(auVar192,auVar144);
  auVar349._16_16_ = auVar194;
  auVar349._0_16_ = auVar182;
  uVar7 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar361._4_4_ = uVar7;
  auVar361._0_4_ = uVar7;
  auVar361._8_4_ = uVar7;
  auVar361._12_4_ = uVar7;
  auVar361._16_4_ = uVar7;
  auVar361._20_4_ = uVar7;
  auVar361._24_4_ = uVar7;
  auVar361._28_4_ = uVar7;
  auVar301 = vmaxps_avx(auVar349,auVar361);
  auVar146 = vmaxps_avx(auVar146,auVar301);
  local_80._4_4_ = auVar146._4_4_ * 0.99999964;
  local_80._0_4_ = auVar146._0_4_ * 0.99999964;
  local_80._8_4_ = auVar146._8_4_ * 0.99999964;
  local_80._12_4_ = auVar146._12_4_ * 0.99999964;
  local_80._16_4_ = auVar146._16_4_ * 0.99999964;
  local_80._20_4_ = auVar146._20_4_ * 0.99999964;
  local_80._24_4_ = auVar146._24_4_ * 0.99999964;
  local_80._28_4_ = auVar146._28_4_;
  auVar304 = ZEXT3264(local_80);
  auVar194 = vpmaxsd_avx(auVar24._16_16_,auVar25._16_16_);
  auVar182 = vpmaxsd_avx(auVar165,auVar250);
  auVar169._16_16_ = auVar194;
  auVar169._0_16_ = auVar182;
  auVar194 = vpmaxsd_avx(auVar21._16_16_,auVar26._16_16_);
  auVar182 = vpmaxsd_avx(auVar266,auVar181);
  auVar188._16_16_ = auVar194;
  auVar188._0_16_ = auVar182;
  auVar146 = vminps_avx(auVar169,auVar188);
  auVar194 = vpmaxsd_avx(auVar27._16_16_,auVar19._16_16_);
  auVar182 = vpmaxsd_avx(auVar192,auVar144);
  auVar148._16_16_ = auVar194;
  auVar148._0_16_ = auVar182;
  fVar247 = ray->tfar;
  auVar189._4_4_ = fVar247;
  auVar189._0_4_ = fVar247;
  auVar189._8_4_ = fVar247;
  auVar189._12_4_ = fVar247;
  auVar189._16_4_ = fVar247;
  auVar189._20_4_ = fVar247;
  auVar189._24_4_ = fVar247;
  auVar189._28_4_ = fVar247;
  auVar301 = vminps_avx(auVar148,auVar189);
  auVar146 = vminps_avx(auVar146,auVar301);
  auVar301._4_4_ = auVar146._4_4_ * 1.0000004;
  auVar301._0_4_ = auVar146._0_4_ * 1.0000004;
  auVar301._8_4_ = auVar146._8_4_ * 1.0000004;
  auVar301._12_4_ = auVar146._12_4_ * 1.0000004;
  auVar301._16_4_ = auVar146._16_4_ * 1.0000004;
  auVar301._20_4_ = auVar146._20_4_ * 1.0000004;
  auVar301._24_4_ = auVar146._24_4_ * 1.0000004;
  auVar301._28_4_ = auVar146._28_4_;
  auVar146 = vcmpps_avx(local_80,auVar301,2);
  auVar194 = vpshufd_avx(ZEXT116((byte)PVar16),0);
  auVar170._16_16_ = auVar194;
  auVar170._0_16_ = auVar194;
  auVar301 = vcvtdq2ps_avx(auVar170);
  auVar301 = vcmpps_avx(_DAT_02020f40,auVar301,1);
  auVar146 = vandps_avx(auVar146,auVar301);
  uVar133 = vmovmskps_avx(auVar146);
  bVar140 = uVar133 != 0;
  if (bVar140) {
    uVar133 = uVar133 & 0xff;
    local_4e0 = mm_lookupmask_ps._16_8_;
    uStack_4d8 = mm_lookupmask_ps._24_8_;
    uStack_4d0 = mm_lookupmask_ps._16_8_;
    uStack_4c8 = mm_lookupmask_ps._24_8_;
    do {
      auVar146 = local_780;
      uVar139 = (ulong)uVar133;
      auVar301 = auVar304._0_32_;
      lVar137 = 0;
      if (uVar139 != 0) {
        for (; (uVar133 >> lVar137 & 1) == 0; lVar137 = lVar137 + 1) {
        }
      }
      uVar139 = uVar139 - 1 & uVar139;
      local_7c4 = *(undefined4 *)(prim + lVar137 * 4 + 6);
      lVar137 = lVar137 * 0x40;
      lVar138 = 0;
      if (uVar139 != 0) {
        for (; (uVar139 >> lVar138 & 1) == 0; lVar138 = lVar138 + 1) {
        }
      }
      uVar131 = (ulong)*(uint *)(prim + 2);
      pGVar17 = (context->scene->geometries).items[uVar131].ptr;
      _local_7c0 = *(undefined1 (*) [16])(prim + lVar137 + lVar111 + 0x16);
      if (((uVar139 != 0) && (uVar134 = uVar139 - 1 & uVar139, uVar134 != 0)) &&
         (lVar138 = 0, uVar134 != 0)) {
        for (; (uVar134 >> lVar138 & 1) == 0; lVar138 = lVar138 + 1) {
        }
      }
      local_430 = *(undefined1 (*) [16])(prim + lVar137 + lVar111 + 0x26);
      local_440 = *(undefined1 (*) [16])(prim + lVar137 + lVar111 + 0x36);
      local_450 = *(undefined1 (*) [16])(prim + lVar137 + lVar111 + 0x46);
      uVar133 = (uint)pGVar17[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar8 = (ray->org).field_0;
      auVar223 = vsubps_avx(_local_7c0,(undefined1  [16])aVar8);
      auVar11 = _local_7c0;
      auVar194 = vshufps_avx(auVar223,auVar223,0);
      auVar182 = vshufps_avx(auVar223,auVar223,0x55);
      auVar223 = vshufps_avx(auVar223,auVar223,0xaa);
      fVar247 = (pre->ray_space).vx.field_0.m128[0];
      fVar256 = (pre->ray_space).vx.field_0.m128[1];
      fVar258 = (pre->ray_space).vx.field_0.m128[2];
      fVar259 = (pre->ray_space).vx.field_0.m128[3];
      fVar260 = (pre->ray_space).vy.field_0.m128[0];
      fVar262 = (pre->ray_space).vy.field_0.m128[1];
      fVar263 = (pre->ray_space).vy.field_0.m128[2];
      fVar191 = (pre->ray_space).vy.field_0.m128[3];
      fVar206 = (pre->ray_space).vz.field_0.m128[0];
      fVar208 = (pre->ray_space).vz.field_0.m128[1];
      fVar210 = (pre->ray_space).vz.field_0.m128[2];
      fVar211 = (pre->ray_space).vz.field_0.m128[3];
      auVar220._0_4_ =
           auVar194._0_4_ * fVar247 + auVar223._0_4_ * fVar206 + auVar182._0_4_ * fVar260;
      auVar220._4_4_ =
           auVar194._4_4_ * fVar256 + auVar223._4_4_ * fVar208 + auVar182._4_4_ * fVar262;
      auVar220._8_4_ =
           auVar194._8_4_ * fVar258 + auVar223._8_4_ * fVar210 + auVar182._8_4_ * fVar263;
      auVar220._12_4_ =
           auVar194._12_4_ * fVar259 + auVar223._12_4_ * fVar211 + auVar182._12_4_ * fVar191;
      auVar194 = vblendps_avx(auVar220,_local_7c0,8);
      auVar195 = vsubps_avx(local_430,(undefined1  [16])aVar8);
      auVar182 = vshufps_avx(auVar195,auVar195,0);
      auVar223 = vshufps_avx(auVar195,auVar195,0x55);
      auVar195 = vshufps_avx(auVar195,auVar195,0xaa);
      auVar221._0_8_ =
           CONCAT44(auVar182._4_4_ * fVar256 + auVar223._4_4_ * fVar262 + auVar195._4_4_ * fVar208,
                    auVar182._0_4_ * fVar247 + auVar223._0_4_ * fVar260 + auVar195._0_4_ * fVar206);
      auVar221._8_4_ =
           auVar182._8_4_ * fVar258 + auVar223._8_4_ * fVar263 + auVar195._8_4_ * fVar210;
      auVar221._12_4_ =
           auVar182._12_4_ * fVar259 + auVar223._12_4_ * fVar191 + auVar195._12_4_ * fVar211;
      auVar182 = vblendps_avx(auVar221,local_430,8);
      auVar9 = vsubps_avx(local_440,(undefined1  [16])aVar8);
      auVar223 = vshufps_avx(auVar9,auVar9,0);
      auVar195 = vshufps_avx(auVar9,auVar9,0x55);
      auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
      auVar222._0_4_ = auVar223._0_4_ * fVar247 + auVar195._0_4_ * fVar260 + auVar9._0_4_ * fVar206;
      auVar222._4_4_ = auVar223._4_4_ * fVar256 + auVar195._4_4_ * fVar262 + auVar9._4_4_ * fVar208;
      auVar222._8_4_ = auVar223._8_4_ * fVar258 + auVar195._8_4_ * fVar263 + auVar9._8_4_ * fVar210;
      auVar222._12_4_ =
           auVar223._12_4_ * fVar259 + auVar195._12_4_ * fVar191 + auVar9._12_4_ * fVar211;
      auVar223 = vblendps_avx(auVar222,local_440,8);
      auVar10 = vsubps_avx(local_450,(undefined1  [16])aVar8);
      auVar195 = vshufps_avx(auVar10,auVar10,0);
      auVar9 = vshufps_avx(auVar10,auVar10,0x55);
      auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
      auVar267._0_4_ = auVar195._0_4_ * fVar247 + auVar10._0_4_ * fVar206 + auVar9._0_4_ * fVar260;
      auVar267._4_4_ = auVar195._4_4_ * fVar256 + auVar10._4_4_ * fVar208 + auVar9._4_4_ * fVar262;
      auVar267._8_4_ = auVar195._8_4_ * fVar258 + auVar10._8_4_ * fVar210 + auVar9._8_4_ * fVar263;
      auVar267._12_4_ =
           auVar195._12_4_ * fVar259 + auVar10._12_4_ * fVar211 + auVar9._12_4_ * fVar191;
      auVar195 = vblendps_avx(auVar267,local_450,8);
      auVar193._8_4_ = 0x7fffffff;
      auVar193._0_8_ = 0x7fffffff7fffffff;
      auVar193._12_4_ = 0x7fffffff;
      auVar194 = vandps_avx(auVar194,auVar193);
      auVar182 = vandps_avx(auVar182,auVar193);
      auVar9 = vmaxps_avx(auVar194,auVar182);
      auVar194 = vandps_avx(auVar223,auVar193);
      auVar182 = vandps_avx(auVar195,auVar193);
      auVar194 = vmaxps_avx(auVar194,auVar182);
      auVar194 = vmaxps_avx(auVar9,auVar194);
      auVar182 = vmovshdup_avx(auVar194);
      auVar182 = vmaxss_avx(auVar182,auVar194);
      auVar194 = vshufpd_avx(auVar194,auVar194,1);
      auVar194 = vmaxss_avx(auVar194,auVar182);
      local_780._0_4_ = auVar194._0_4_;
      lVar137 = (long)(int)uVar133 * 0x44;
      fVar216 = *(float *)(bspline_basis0 + lVar137 + 0x908);
      fVar231 = *(float *)(bspline_basis0 + lVar137 + 0x90c);
      fVar235 = *(float *)(bspline_basis0 + lVar137 + 0x910);
      fVar239 = *(float *)(bspline_basis0 + lVar137 + 0x914);
      fVar243 = *(float *)(bspline_basis0 + lVar137 + 0x918);
      fVar244 = *(float *)(bspline_basis0 + lVar137 + 0x91c);
      fVar245 = *(float *)(bspline_basis0 + lVar137 + 0x920);
      auVar182 = vshufps_avx(auVar222,auVar222,0);
      register0x00001250 = auVar182;
      _local_540 = auVar182;
      auVar223 = vshufps_avx(auVar222,auVar222,0x55);
      register0x00001310 = auVar223;
      _local_700 = auVar223;
      fVar332 = *(float *)(bspline_basis0 + lVar137 + 0xd8c);
      fVar261 = *(float *)(bspline_basis0 + lVar137 + 0xd90);
      fVar333 = *(float *)(bspline_basis0 + lVar137 + 0xd94);
      fVar162 = *(float *)(bspline_basis0 + lVar137 + 0xd98);
      fVar334 = *(float *)(bspline_basis0 + lVar137 + 0xd9c);
      fVar264 = *(float *)(bspline_basis0 + lVar137 + 0xda0);
      fVar336 = *(float *)(bspline_basis0 + lVar137 + 0xda4);
      auVar195 = vshufps_avx(auVar267,auVar267,0);
      register0x00001550 = auVar195;
      _local_400 = auVar195;
      auVar9 = vshufps_avx(auVar267,auVar267,0x55);
      register0x00001390 = auVar9;
      _local_6e0 = auVar9;
      fVar347 = auVar195._0_4_;
      fVar353 = auVar195._4_4_;
      fVar355 = auVar195._8_4_;
      fVar357 = auVar195._12_4_;
      fVar163 = auVar182._0_4_;
      fVar176 = auVar182._4_4_;
      fVar177 = auVar182._8_4_;
      fVar178 = auVar182._12_4_;
      fVar265 = auVar9._0_4_;
      fVar277 = auVar9._4_4_;
      fVar278 = auVar9._8_4_;
      fVar279 = auVar9._12_4_;
      fVar217 = auVar223._0_4_;
      fVar232 = auVar223._4_4_;
      fVar236 = auVar223._8_4_;
      fVar240 = auVar223._12_4_;
      auVar10 = local_440;
      auVar182 = vshufps_avx(local_440,local_440,0xff);
      register0x00001490 = auVar182;
      _local_a0 = auVar182;
      auVar9 = local_450;
      auVar223 = vshufps_avx(local_450,local_450,0xff);
      register0x00001410 = auVar223;
      _local_100 = auVar223;
      fVar246 = auVar223._0_4_;
      fVar180 = auVar223._4_4_;
      fVar281 = auVar223._8_4_;
      fVar293 = auVar223._12_4_;
      fVar308 = auVar182._0_4_;
      fVar314 = auVar182._4_4_;
      fVar315 = auVar182._8_4_;
      auVar115._8_4_ = auVar221._8_4_;
      auVar115._0_8_ = auVar221._0_8_;
      auVar115._12_4_ = auVar221._12_4_;
      auVar223 = vshufps_avx(auVar115,auVar115,0);
      register0x000014d0 = auVar223;
      _local_600 = auVar223;
      pauVar2 = (undefined1 (*) [32])(bspline_basis0 + lVar137 + 0x484);
      fVar247 = *(float *)*pauVar2;
      fVar256 = *(float *)(bspline_basis0 + lVar137 + 0x488);
      fVar258 = *(float *)(bspline_basis0 + lVar137 + 0x48c);
      fVar259 = *(float *)(bspline_basis0 + lVar137 + 0x490);
      fVar260 = *(float *)(bspline_basis0 + lVar137 + 0x494);
      fVar262 = *(float *)(bspline_basis0 + lVar137 + 0x498);
      fVar263 = *(float *)(bspline_basis0 + lVar137 + 0x49c);
      auVar125 = *(undefined1 (*) [28])*pauVar2;
      fVar316 = auVar223._0_4_;
      fVar317 = auVar223._4_4_;
      fVar318 = auVar223._8_4_;
      fVar319 = auVar223._12_4_;
      auVar223 = vshufps_avx(auVar115,auVar115,0x55);
      register0x000015d0 = auVar223;
      _local_760 = auVar223;
      fVar373 = auVar223._0_4_;
      fVar376 = auVar223._4_4_;
      fVar377 = auVar223._8_4_;
      fVar378 = auVar223._12_4_;
      auVar12 = local_430;
      auVar223 = vshufps_avx(local_430,local_430,0xff);
      register0x00001590 = auVar223;
      _local_120 = auVar223;
      _local_380 = *pauVar2;
      auVar25 = _local_380;
      fVar359 = auVar223._0_4_;
      fVar364 = auVar223._4_4_;
      fVar366 = auVar223._8_4_;
      fVar368 = auVar223._12_4_;
      auVar223 = vshufps_avx(auVar220,auVar220,0);
      register0x00001350 = auVar223;
      _local_e0 = auVar223;
      pauVar2 = (undefined1 (*) [32])(bspline_basis0 + lVar137);
      fVar191 = *(float *)*pauVar2;
      fVar206 = *(float *)(bspline_basis0 + lVar137 + 4);
      fVar208 = *(float *)(bspline_basis0 + lVar137 + 8);
      fVar210 = *(float *)(bspline_basis0 + lVar137 + 0xc);
      fVar211 = *(float *)(bspline_basis0 + lVar137 + 0x10);
      fVar212 = *(float *)(bspline_basis0 + lVar137 + 0x14);
      fVar214 = *(float *)(bspline_basis0 + lVar137 + 0x18);
      auVar126 = *(undefined1 (*) [28])*pauVar2;
      fVar248 = auVar223._0_4_;
      fVar257 = auVar223._4_4_;
      fVar143 = auVar223._8_4_;
      fVar158 = auVar223._12_4_;
      auVar339._0_4_ = fVar248 * fVar191 + fVar316 * fVar247 + fVar163 * fVar216 + fVar347 * fVar332
      ;
      auVar339._4_4_ = fVar257 * fVar206 + fVar317 * fVar256 + fVar176 * fVar231 + fVar353 * fVar261
      ;
      auVar339._8_4_ = fVar143 * fVar208 + fVar318 * fVar258 + fVar177 * fVar235 + fVar355 * fVar333
      ;
      auVar339._12_4_ =
           fVar158 * fVar210 + fVar319 * fVar259 + fVar178 * fVar239 + fVar357 * fVar162;
      auVar339._16_4_ =
           fVar248 * fVar211 + fVar316 * fVar260 + fVar163 * fVar243 + fVar347 * fVar334;
      auVar339._20_4_ =
           fVar257 * fVar212 + fVar317 * fVar262 + fVar176 * fVar244 + fVar353 * fVar264;
      auVar339._24_4_ =
           fVar143 * fVar214 + fVar318 * fVar263 + fVar177 * fVar245 + fVar355 * fVar336;
      auVar339._28_4_ = fVar178 + 0.0 + 0.0 + 0.0;
      auVar223 = vshufps_avx(auVar220,auVar220,0x55);
      register0x00001310 = auVar223;
      _local_340 = auVar223;
      fVar218 = auVar223._0_4_;
      fVar233 = auVar223._4_4_;
      fVar237 = auVar223._8_4_;
      fVar241 = auVar223._12_4_;
      auVar272._0_4_ = fVar218 * fVar191 + fVar373 * fVar247 + fVar217 * fVar216 + fVar265 * fVar332
      ;
      auVar272._4_4_ = fVar233 * fVar206 + fVar376 * fVar256 + fVar232 * fVar231 + fVar277 * fVar261
      ;
      auVar272._8_4_ = fVar237 * fVar208 + fVar377 * fVar258 + fVar236 * fVar235 + fVar278 * fVar333
      ;
      auVar272._12_4_ =
           fVar241 * fVar210 + fVar378 * fVar259 + fVar240 * fVar239 + fVar279 * fVar162;
      auVar272._16_4_ =
           fVar218 * fVar211 + fVar373 * fVar260 + fVar217 * fVar243 + fVar265 * fVar334;
      auVar272._20_4_ =
           fVar233 * fVar212 + fVar376 * fVar262 + fVar232 * fVar244 + fVar277 * fVar264;
      auVar272._24_4_ =
           fVar237 * fVar214 + fVar377 * fVar263 + fVar236 * fVar245 + fVar278 * fVar336;
      auVar272._28_4_ = fVar178 + 0.0 + 0.0 + 0.0;
      auVar223 = vpermilps_avx(_local_7c0,0xff);
      register0x00001450 = auVar223;
      _local_140 = auVar223;
      _local_3a0 = *pauVar2;
      auVar24 = _local_3a0;
      fVar294 = auVar223._0_4_;
      fVar295 = auVar223._4_4_;
      fVar296 = auVar223._8_4_;
      fVar141 = fVar294 * fVar191 + fVar359 * fVar247 + fVar308 * fVar216 + fVar246 * fVar332;
      fStack_61c = fVar295 * fVar206 + fVar364 * fVar256 + fVar314 * fVar231 + fVar180 * fVar261;
      fStack_618 = fVar296 * fVar208 + fVar366 * fVar258 + fVar315 * fVar235 + fVar281 * fVar333;
      fStack_614 = auVar223._12_4_ * fVar210 +
                   fVar368 * fVar259 + auVar182._12_4_ * fVar239 + fVar293 * fVar162;
      fStack_610 = fVar294 * fVar211 + fVar359 * fVar260 + fVar308 * fVar243 + fVar246 * fVar334;
      fStack_60c = fVar295 * fVar212 + fVar364 * fVar262 + fVar314 * fVar244 + fVar180 * fVar264;
      fStack_608 = fVar296 * fVar214 + fVar366 * fVar263 + fVar315 * fVar245 + fVar281 * fVar336;
      fStack_604 = *(float *)(bspline_basis0 + lVar137 + 0x924) + 0.0 + 0.0 + 0.0;
      fVar335 = *(float *)(bspline_basis1 + lVar137 + 0x908);
      fVar280 = *(float *)(bspline_basis1 + lVar137 + 0x90c);
      fVar327 = *(float *)(bspline_basis1 + lVar137 + 0x910);
      fVar298 = *(float *)(bspline_basis1 + lVar137 + 0x914);
      fVar305 = *(float *)(bspline_basis1 + lVar137 + 0x918);
      fVar213 = *(float *)(bspline_basis1 + lVar137 + 0x91c);
      fVar328 = *(float *)(bspline_basis1 + lVar137 + 0x920);
      fVar247 = *(float *)*(undefined1 (*) [28])(bspline_basis1 + lVar137 + 0xd8c);
      fVar256 = *(float *)(bspline_basis1 + lVar137 + 0xd90);
      fVar258 = *(float *)(bspline_basis1 + lVar137 + 0xd94);
      fVar259 = *(float *)(bspline_basis1 + lVar137 + 0xd98);
      fVar260 = *(float *)(bspline_basis1 + lVar137 + 0xd9c);
      fVar262 = *(float *)(bspline_basis1 + lVar137 + 0xda0);
      fVar263 = *(float *)(bspline_basis1 + lVar137 + 0xda4);
      auVar127 = *(undefined1 (*) [28])(bspline_basis1 + lVar137 + 0xd8c);
      fVar306 = *(float *)(bspline_basis1 + lVar137 + 0x484);
      fVar307 = *(float *)(bspline_basis1 + lVar137 + 0x488);
      fVar215 = *(float *)(bspline_basis1 + lVar137 + 0x48c);
      fVar179 = *(float *)(bspline_basis1 + lVar137 + 0x490);
      fVar142 = *(float *)(bspline_basis1 + lVar137 + 0x494);
      fVar157 = *(float *)(bspline_basis1 + lVar137 + 0x498);
      fVar159 = *(float *)(bspline_basis1 + lVar137 + 0x49c);
      fVar191 = fVar357 + 0.0;
      fVar160 = *(float *)(bspline_basis1 + lVar137);
      fVar161 = *(float *)(bspline_basis1 + lVar137 + 4);
      fVar370 = *(float *)(bspline_basis1 + lVar137 + 8);
      fVar371 = *(float *)(bspline_basis1 + lVar137 + 0xc);
      fVar372 = *(float *)(bspline_basis1 + lVar137 + 0x10);
      fVar207 = *(float *)(bspline_basis1 + lVar137 + 0x14);
      fVar209 = *(float *)(bspline_basis1 + lVar137 + 0x18);
      auVar225._0_4_ = fVar248 * fVar160 + fVar316 * fVar306 + fVar335 * fVar163 + fVar347 * fVar247
      ;
      auVar225._4_4_ = fVar257 * fVar161 + fVar317 * fVar307 + fVar280 * fVar176 + fVar353 * fVar256
      ;
      auVar225._8_4_ = fVar143 * fVar370 + fVar318 * fVar215 + fVar327 * fVar177 + fVar355 * fVar258
      ;
      auVar225._12_4_ =
           fVar158 * fVar371 + fVar319 * fVar179 + fVar298 * fVar178 + fVar357 * fVar259;
      auVar225._16_4_ =
           fVar248 * fVar372 + fVar316 * fVar142 + fVar305 * fVar163 + fVar347 * fVar260;
      auVar225._20_4_ =
           fVar257 * fVar207 + fVar317 * fVar157 + fVar213 * fVar176 + fVar353 * fVar262;
      auVar225._24_4_ =
           fVar143 * fVar209 + fVar318 * fVar159 + fVar328 * fVar177 + fVar355 * fVar263;
      auVar225._28_4_ = fVar368 + fVar191;
      auVar200._0_4_ = fVar160 * fVar218 + fVar373 * fVar306 + fVar335 * fVar217 + fVar247 * fVar265
      ;
      auVar200._4_4_ = fVar161 * fVar233 + fVar376 * fVar307 + fVar280 * fVar232 + fVar256 * fVar277
      ;
      auVar200._8_4_ = fVar370 * fVar237 + fVar377 * fVar215 + fVar327 * fVar236 + fVar258 * fVar278
      ;
      auVar200._12_4_ =
           fVar371 * fVar241 + fVar378 * fVar179 + fVar298 * fVar240 + fVar259 * fVar279;
      auVar200._16_4_ =
           fVar372 * fVar218 + fVar373 * fVar142 + fVar305 * fVar217 + fVar260 * fVar265;
      auVar200._20_4_ =
           fVar207 * fVar233 + fVar376 * fVar157 + fVar213 * fVar232 + fVar262 * fVar277;
      auVar200._24_4_ =
           fVar209 * fVar237 + fVar377 * fVar159 + fVar328 * fVar236 + fVar263 * fVar278;
      auVar200._28_4_ = fVar191 + fVar357 + 0.0;
      auVar331._0_4_ = fVar359 * fVar306 + fVar308 * fVar335 + fVar246 * fVar247 + fVar294 * fVar160
      ;
      auVar331._4_4_ = fVar364 * fVar307 + fVar314 * fVar280 + fVar180 * fVar256 + fVar295 * fVar161
      ;
      auVar331._8_4_ = fVar366 * fVar215 + fVar315 * fVar327 + fVar281 * fVar258 + fVar296 * fVar370
      ;
      auVar331._12_4_ =
           fVar368 * fVar179 + auVar182._12_4_ * fVar298 + fVar293 * fVar259 +
           auVar223._12_4_ * fVar371;
      auVar331._16_4_ =
           fVar359 * fVar142 + fVar308 * fVar305 + fVar246 * fVar260 + fVar294 * fVar372;
      auVar331._20_4_ =
           fVar364 * fVar157 + fVar314 * fVar213 + fVar180 * fVar262 + fVar295 * fVar207;
      auVar331._24_4_ =
           fVar366 * fVar159 + fVar315 * fVar328 + fVar281 * fVar263 + fVar296 * fVar209;
      auVar331._28_4_ = fVar357 + fVar293 + 0.0 + fVar191;
      auVar22 = vsubps_avx(auVar225,auVar339);
      local_360 = vsubps_avx(auVar200,auVar272);
      fVar247 = auVar22._0_4_;
      fVar258 = auVar22._4_4_;
      auVar28._4_4_ = auVar272._4_4_ * fVar258;
      auVar28._0_4_ = auVar272._0_4_ * fVar247;
      fVar260 = auVar22._8_4_;
      auVar28._8_4_ = auVar272._8_4_ * fVar260;
      fVar263 = auVar22._12_4_;
      auVar28._12_4_ = auVar272._12_4_ * fVar263;
      fVar206 = auVar22._16_4_;
      auVar28._16_4_ = auVar272._16_4_ * fVar206;
      fVar210 = auVar22._20_4_;
      auVar28._20_4_ = auVar272._20_4_ * fVar210;
      fVar212 = auVar22._24_4_;
      auVar28._24_4_ = auVar272._24_4_ * fVar212;
      auVar28._28_4_ = fVar191;
      fVar256 = local_360._0_4_;
      fVar259 = local_360._4_4_;
      auVar29._4_4_ = auVar339._4_4_ * fVar259;
      auVar29._0_4_ = auVar339._0_4_ * fVar256;
      fVar262 = local_360._8_4_;
      auVar29._8_4_ = auVar339._8_4_ * fVar262;
      fVar191 = local_360._12_4_;
      auVar29._12_4_ = auVar339._12_4_ * fVar191;
      fVar208 = local_360._16_4_;
      auVar29._16_4_ = auVar339._16_4_ * fVar208;
      fVar211 = local_360._20_4_;
      auVar29._20_4_ = auVar339._20_4_ * fVar211;
      fVar214 = local_360._24_4_;
      auVar29._24_4_ = auVar339._24_4_ * fVar214;
      auVar29._28_4_ = auVar200._28_4_;
      auVar21 = vsubps_avx(auVar28,auVar29);
      auVar26 = local_360;
      auVar119._4_4_ = fStack_61c;
      auVar119._0_4_ = fVar141;
      auVar119._8_4_ = fStack_618;
      auVar119._12_4_ = fStack_614;
      auVar119._16_4_ = fStack_610;
      auVar119._20_4_ = fStack_60c;
      auVar119._24_4_ = fStack_608;
      auVar119._28_4_ = fStack_604;
      auVar20 = vmaxps_avx(auVar119,auVar331);
      auVar30._4_4_ = auVar20._4_4_ * auVar20._4_4_ * (fVar258 * fVar258 + fVar259 * fVar259);
      auVar30._0_4_ = auVar20._0_4_ * auVar20._0_4_ * (fVar247 * fVar247 + fVar256 * fVar256);
      auVar30._8_4_ = auVar20._8_4_ * auVar20._8_4_ * (fVar260 * fVar260 + fVar262 * fVar262);
      auVar30._12_4_ = auVar20._12_4_ * auVar20._12_4_ * (fVar263 * fVar263 + fVar191 * fVar191);
      auVar30._16_4_ = auVar20._16_4_ * auVar20._16_4_ * (fVar206 * fVar206 + fVar208 * fVar208);
      auVar30._20_4_ = auVar20._20_4_ * auVar20._20_4_ * (fVar210 * fVar210 + fVar211 * fVar211);
      auVar30._24_4_ = auVar20._24_4_ * auVar20._24_4_ * (fVar212 * fVar212 + fVar214 * fVar214);
      auVar30._28_4_ = auVar22._28_4_ + auVar200._28_4_;
      auVar31._4_4_ = auVar21._4_4_ * auVar21._4_4_;
      auVar31._0_4_ = auVar21._0_4_ * auVar21._0_4_;
      auVar31._8_4_ = auVar21._8_4_ * auVar21._8_4_;
      auVar31._12_4_ = auVar21._12_4_ * auVar21._12_4_;
      auVar31._16_4_ = auVar21._16_4_ * auVar21._16_4_;
      auVar31._20_4_ = auVar21._20_4_ * auVar21._20_4_;
      auVar31._24_4_ = auVar21._24_4_ * auVar21._24_4_;
      auVar31._28_4_ = auVar21._28_4_;
      auVar20 = vcmpps_avx(auVar31,auVar30,2);
      fVar247 = auVar194._0_4_ * 4.7683716e-07;
      auVar276 = ZEXT464((uint)fVar247);
      auVar194 = ZEXT416((uint)(float)(int)uVar133);
      _local_420 = auVar194;
      auVar194 = vshufps_avx(auVar194,auVar194,0);
      auVar201._16_16_ = auVar194;
      auVar201._0_16_ = auVar194;
      auVar21 = vcmpps_avx(_DAT_02020f40,auVar201,1);
      auVar205 = ZEXT3264(auVar21);
      auVar194 = vpermilps_avx(auVar220,0xaa);
      register0x00001510 = auVar194;
      _local_160 = auVar194;
      auVar116._8_4_ = auVar221._8_4_;
      auVar116._0_8_ = auVar221._0_8_;
      auVar116._12_4_ = auVar221._12_4_;
      auVar182 = vpermilps_avx(auVar116,0xaa);
      register0x00001550 = auVar182;
      _local_180 = auVar182;
      auVar223 = vpermilps_avx(auVar222,0xaa);
      register0x00001590 = auVar223;
      _local_c0 = auVar223;
      auVar195 = vpermilps_avx(auVar267,0xaa);
      register0x00001310 = auVar195;
      _local_480 = auVar195;
      auVar23 = auVar21 & auVar20;
      local_740 = *(uint *)((long)&(ray->org).field_0 + 0xc);
      uStack_73c = 0;
      fStack_738 = 0.0;
      fStack_734 = 0.0;
      auVar268 = ZEXT416((uint)fVar247);
      fVar247 = fVar265;
      fVar256 = fVar277;
      fVar258 = fVar278;
      fVar259 = fVar279;
      fVar260 = fVar373;
      fVar262 = fVar376;
      fVar263 = fVar377;
      fVar191 = fVar217;
      fVar206 = fVar232;
      fVar208 = fVar236;
      if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar23 >> 0x7f,0) == '\0') &&
            (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar23 >> 0xbf,0) == '\0') &&
          (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar23[0x1f])
      {
        pGVar135 = (Geometry *)0x0;
        auVar304 = ZEXT3264(auVar301);
        auVar230 = ZEXT3264(_local_600);
        local_7d0 = uVar131;
        local_7d8 = ray;
        local_7a8 = pre;
      }
      else {
        local_4c0._0_8_ = pGVar17;
        auVar20 = vandps_avx(auVar20,auVar21);
        fVar337 = auVar194._0_4_;
        fVar344 = auVar194._4_4_;
        fVar345 = auVar194._8_4_;
        fVar346 = auVar194._12_4_;
        fVar348 = auVar182._0_4_;
        fVar354 = auVar182._4_4_;
        fVar356 = auVar182._8_4_;
        fVar358 = auVar182._12_4_;
        fVar360 = auVar223._0_4_;
        fVar365 = auVar223._4_4_;
        fVar367 = auVar223._8_4_;
        fVar369 = auVar223._12_4_;
        local_4a0._0_4_ = auVar127._0_4_;
        local_4a0._4_4_ = auVar127._4_4_;
        fStack_498 = auVar127._8_4_;
        fStack_494 = auVar127._12_4_;
        fStack_490 = auVar127._16_4_;
        fStack_48c = auVar127._20_4_;
        fStack_488 = auVar127._24_4_;
        fVar219 = auVar195._0_4_;
        fVar234 = auVar195._4_4_;
        fVar238 = auVar195._8_4_;
        fVar242 = auVar195._12_4_;
        local_4a0._0_4_ =
             fVar337 * fVar160 +
             fVar348 * fVar306 + fVar360 * fVar335 + fVar219 * (float)local_4a0._0_4_;
        local_4a0._4_4_ =
             fVar344 * fVar161 +
             fVar354 * fVar307 + fVar365 * fVar280 + fVar234 * (float)local_4a0._4_4_;
        fStack_498 = fVar345 * fVar370 +
                     fVar356 * fVar215 + fVar367 * fVar327 + fVar238 * fStack_498;
        fStack_494 = fVar346 * fVar371 +
                     fVar358 * fVar179 + fVar369 * fVar298 + fVar242 * fStack_494;
        fStack_490 = fVar337 * fVar372 +
                     fVar348 * fVar142 + fVar360 * fVar305 + fVar219 * fStack_490;
        fStack_48c = fVar344 * fVar207 +
                     fVar354 * fVar157 + fVar365 * fVar213 + fVar234 * fStack_48c;
        fStack_488 = fVar345 * fVar209 +
                     fVar356 * fVar159 + fVar367 * fVar328 + fVar238 * fStack_488;
        fStack_484 = auVar20._28_4_ +
                     auVar21._28_4_ + *(float *)(bspline_basis1 + lVar137 + 0x924) + 0.0;
        local_3a0._0_4_ = auVar126._0_4_;
        local_3a0._4_4_ = auVar126._4_4_;
        fStack_398 = auVar126._8_4_;
        fStack_394 = auVar126._12_4_;
        fStack_390 = auVar126._16_4_;
        fStack_38c = auVar126._20_4_;
        fStack_388 = auVar126._24_4_;
        local_380._0_4_ = auVar125._0_4_;
        local_380._4_4_ = auVar125._4_4_;
        fStack_378 = auVar125._8_4_;
        fStack_374 = auVar125._12_4_;
        fStack_370 = auVar125._16_4_;
        fStack_36c = auVar125._20_4_;
        fStack_368 = auVar125._24_4_;
        local_5e0 = fVar337 * (float)local_3a0._0_4_ +
                    fVar348 * (float)local_380._0_4_ + fVar360 * fVar216 + fVar219 * fVar332;
        fStack_5dc = fVar344 * (float)local_3a0._4_4_ +
                     fVar354 * (float)local_380._4_4_ + fVar365 * fVar231 + fVar234 * fVar261;
        fStack_5d8 = fVar345 * fStack_398 +
                     fVar356 * fStack_378 + fVar367 * fVar235 + fVar238 * fVar333;
        fStack_5d4 = fVar346 * fStack_394 +
                     fVar358 * fStack_374 + fVar369 * fVar239 + fVar242 * fVar162;
        fStack_5d0 = fVar337 * fStack_390 +
                     fVar348 * fStack_370 + fVar360 * fVar243 + fVar219 * fVar334;
        fStack_5cc = fVar344 * fStack_38c +
                     fVar354 * fStack_36c + fVar365 * fVar244 + fVar234 * fVar264;
        fStack_5c8 = fVar345 * fStack_388 +
                     fVar356 * fStack_368 + fVar367 * fVar245 + fVar238 * fVar336;
        fStack_5c4 = fVar241 + fStack_484 + auVar20._28_4_ + auVar21._28_4_;
        fVar210 = *(float *)(bspline_basis0 + lVar137 + 0x1210);
        fVar211 = *(float *)(bspline_basis0 + lVar137 + 0x1214);
        fVar212 = *(float *)(bspline_basis0 + lVar137 + 0x1218);
        fVar214 = *(float *)(bspline_basis0 + lVar137 + 0x121c);
        fVar216 = *(float *)(bspline_basis0 + lVar137 + 0x1220);
        fVar231 = *(float *)(bspline_basis0 + lVar137 + 0x1224);
        fVar235 = *(float *)(bspline_basis0 + lVar137 + 0x1228);
        fVar239 = *(float *)(bspline_basis0 + lVar137 + 0x1694);
        fVar243 = *(float *)(bspline_basis0 + lVar137 + 0x1698);
        fVar244 = *(float *)(bspline_basis0 + lVar137 + 0x169c);
        fVar245 = *(float *)(bspline_basis0 + lVar137 + 0x16a0);
        fVar332 = *(float *)(bspline_basis0 + lVar137 + 0x16a4);
        fVar261 = *(float *)(bspline_basis0 + lVar137 + 0x16a8);
        fVar333 = *(float *)(bspline_basis0 + lVar137 + 0x16ac);
        fVar162 = *(float *)(bspline_basis0 + lVar137 + 0x1b18);
        fVar334 = *(float *)(bspline_basis0 + lVar137 + 0x1b1c);
        fVar264 = *(float *)(bspline_basis0 + lVar137 + 0x1b20);
        fVar336 = *(float *)(bspline_basis0 + lVar137 + 0x1b24);
        fVar335 = *(float *)(bspline_basis0 + lVar137 + 0x1b28);
        fVar280 = *(float *)(bspline_basis0 + lVar137 + 0x1b2c);
        fVar327 = *(float *)(bspline_basis0 + lVar137 + 0x1b30);
        fVar298 = *(float *)(bspline_basis0 + lVar137 + 0x1f9c);
        fVar305 = *(float *)(bspline_basis0 + lVar137 + 0x1fa0);
        fVar213 = *(float *)(bspline_basis0 + lVar137 + 0x1fa4);
        fVar328 = *(float *)(bspline_basis0 + lVar137 + 0x1fa8);
        fVar306 = *(float *)(bspline_basis0 + lVar137 + 0x1fac);
        fVar307 = *(float *)(bspline_basis0 + lVar137 + 0x1fb0);
        fVar215 = *(float *)(bspline_basis0 + lVar137 + 0x1fb4);
        local_780._16_16_ = auVar146._16_16_;
        local_780._0_16_ = auVar268;
        fVar297 = local_360._28_4_ + *(float *)(bspline_basis1 + lVar137 + 0x4a0);
        fVar179 = *(float *)(bspline_basis0 + lVar137 + 0x1b34) +
                  *(float *)(bspline_basis0 + lVar137 + 0x1fb8);
        fVar320 = *(float *)(bspline_basis0 + lVar137 + 0x16b0) + fVar179;
        auVar171._0_4_ =
             fVar218 * fVar210 + fVar217 * fVar162 + fVar265 * fVar298 + fVar373 * fVar239;
        auVar171._4_4_ =
             fVar233 * fVar211 + fVar232 * fVar334 + fVar277 * fVar305 + fVar376 * fVar243;
        auVar171._8_4_ =
             fVar237 * fVar212 + fVar236 * fVar264 + fVar278 * fVar213 + fVar377 * fVar244;
        auVar171._12_4_ =
             fVar241 * fVar214 + fVar240 * fVar336 + fVar279 * fVar328 + fVar378 * fVar245;
        auVar171._16_4_ =
             fVar218 * fVar216 + fVar217 * fVar335 + fVar265 * fVar306 + fVar373 * fVar332;
        auVar171._20_4_ =
             fVar233 * fVar231 + fVar232 * fVar280 + fVar277 * fVar307 + fVar376 * fVar261;
        auVar171._24_4_ =
             fVar237 * fVar235 + fVar236 * fVar327 + fVar278 * fVar215 + fVar377 * fVar333;
        auVar171._28_4_ =
             fVar179 + local_360._28_4_ + *(float *)(bspline_basis1 + lVar137 + 0x1c) + fVar297;
        auVar288._0_4_ =
             fVar348 * fVar239 + fVar360 * fVar162 + fVar219 * fVar298 + fVar337 * fVar210;
        auVar288._4_4_ =
             fVar354 * fVar243 + fVar365 * fVar334 + fVar234 * fVar305 + fVar344 * fVar211;
        auVar288._8_4_ =
             fVar356 * fVar244 + fVar367 * fVar264 + fVar238 * fVar213 + fVar345 * fVar212;
        auVar288._12_4_ =
             fVar358 * fVar245 + fVar369 * fVar336 + fVar242 * fVar328 + fVar346 * fVar214;
        auVar288._16_4_ =
             fVar348 * fVar332 + fVar360 * fVar335 + fVar219 * fVar306 + fVar337 * fVar216;
        auVar288._20_4_ =
             fVar354 * fVar261 + fVar365 * fVar280 + fVar234 * fVar307 + fVar344 * fVar231;
        auVar288._24_4_ =
             fVar356 * fVar333 + fVar367 * fVar327 + fVar238 * fVar215 + fVar345 * fVar235;
        auVar288._28_4_ = fVar320 + *(float *)(bspline_basis0 + lVar137 + 0x122c);
        fVar179 = *(float *)(bspline_basis1 + lVar137 + 0x1b18);
        fVar142 = *(float *)(bspline_basis1 + lVar137 + 0x1b1c);
        fVar157 = *(float *)(bspline_basis1 + lVar137 + 0x1b20);
        fVar159 = *(float *)(bspline_basis1 + lVar137 + 0x1b24);
        fVar160 = *(float *)(bspline_basis1 + lVar137 + 0x1b28);
        fVar161 = *(float *)(bspline_basis1 + lVar137 + 0x1b2c);
        fVar370 = *(float *)(bspline_basis1 + lVar137 + 0x1b30);
        fVar371 = *(float *)(bspline_basis1 + lVar137 + 0x1f9c);
        fVar372 = *(float *)(bspline_basis1 + lVar137 + 0x1fa0);
        fVar207 = *(float *)(bspline_basis1 + lVar137 + 0x1fa4);
        fVar209 = *(float *)(bspline_basis1 + lVar137 + 0x1fa8);
        fVar246 = *(float *)(bspline_basis1 + lVar137 + 0x1fac);
        fVar180 = *(float *)(bspline_basis1 + lVar137 + 0x1fb0);
        fVar281 = *(float *)(bspline_basis1 + lVar137 + 0x1fb4);
        fVar293 = *(float *)(bspline_basis1 + lVar137 + 0x1694);
        fVar294 = *(float *)(bspline_basis1 + lVar137 + 0x1698);
        fVar295 = *(float *)(bspline_basis1 + lVar137 + 0x169c);
        fVar296 = *(float *)(bspline_basis1 + lVar137 + 0x16a0);
        fVar308 = *(float *)(bspline_basis1 + lVar137 + 0x16a4);
        fVar314 = *(float *)(bspline_basis1 + lVar137 + 0x16a8);
        fVar315 = *(float *)(bspline_basis1 + lVar137 + 0x16ac);
        fVar359 = *(float *)(bspline_basis1 + lVar137 + 0x1210);
        fVar364 = *(float *)(bspline_basis1 + lVar137 + 0x1214);
        fVar366 = *(float *)(bspline_basis1 + lVar137 + 0x1218);
        fVar368 = *(float *)(bspline_basis1 + lVar137 + 0x121c);
        fVar112 = *(float *)(bspline_basis1 + lVar137 + 0x1220);
        fVar113 = *(float *)(bspline_basis1 + lVar137 + 0x1224);
        fVar114 = *(float *)(bspline_basis1 + lVar137 + 0x1228);
        auVar302._0_4_ =
             fVar248 * fVar359 + fVar316 * fVar293 + fVar163 * fVar179 + fVar347 * fVar371;
        auVar302._4_4_ =
             fVar257 * fVar364 + fVar317 * fVar294 + fVar176 * fVar142 + fVar353 * fVar372;
        auVar302._8_4_ =
             fVar143 * fVar366 + fVar318 * fVar295 + fVar177 * fVar157 + fVar355 * fVar207;
        auVar302._12_4_ =
             fVar158 * fVar368 + fVar319 * fVar296 + fVar178 * fVar159 + fVar357 * fVar209;
        auVar302._16_4_ =
             fVar248 * fVar112 + fVar316 * fVar308 + fVar163 * fVar160 + fVar347 * fVar246;
        auVar302._20_4_ =
             fVar257 * fVar113 + fVar317 * fVar314 + fVar176 * fVar161 + fVar353 * fVar180;
        auVar302._24_4_ =
             fVar143 * fVar114 + fVar318 * fVar315 + fVar177 * fVar370 + fVar355 * fVar281;
        auVar302._28_4_ = fVar240 + fVar240 + fVar320 + fVar357;
        auVar310._0_4_ =
             fVar218 * fVar359 + fVar373 * fVar293 + fVar217 * fVar179 + fVar265 * fVar371;
        auVar310._4_4_ =
             fVar233 * fVar364 + fVar376 * fVar294 + fVar232 * fVar142 + fVar277 * fVar372;
        auVar310._8_4_ =
             fVar237 * fVar366 + fVar377 * fVar295 + fVar236 * fVar157 + fVar278 * fVar207;
        auVar310._12_4_ =
             fVar241 * fVar368 + fVar378 * fVar296 + fVar240 * fVar159 + fVar279 * fVar209;
        auVar310._16_4_ =
             fVar218 * fVar112 + fVar373 * fVar308 + fVar217 * fVar160 + fVar265 * fVar246;
        auVar310._20_4_ =
             fVar233 * fVar113 + fVar376 * fVar314 + fVar232 * fVar161 + fVar277 * fVar180;
        auVar310._24_4_ =
             fVar237 * fVar114 + fVar377 * fVar315 + fVar236 * fVar370 + fVar278 * fVar281;
        auVar310._28_4_ = fVar240 + fVar240 + fVar240 + fVar320;
        auVar190._0_4_ =
             fVar337 * fVar359 + fVar348 * fVar293 + fVar360 * fVar179 + fVar371 * fVar219;
        auVar190._4_4_ =
             fVar344 * fVar364 + fVar354 * fVar294 + fVar365 * fVar142 + fVar372 * fVar234;
        auVar190._8_4_ =
             fVar345 * fVar366 + fVar356 * fVar295 + fVar367 * fVar157 + fVar207 * fVar238;
        auVar190._12_4_ =
             fVar346 * fVar368 + fVar358 * fVar296 + fVar369 * fVar159 + fVar209 * fVar242;
        auVar190._16_4_ =
             fVar337 * fVar112 + fVar348 * fVar308 + fVar360 * fVar160 + fVar246 * fVar219;
        auVar190._20_4_ =
             fVar344 * fVar113 + fVar354 * fVar314 + fVar365 * fVar161 + fVar180 * fVar234;
        auVar190._24_4_ =
             fVar345 * fVar114 + fVar356 * fVar315 + fVar367 * fVar370 + fVar281 * fVar238;
        auVar190._28_4_ =
             *(float *)(bspline_basis1 + lVar137 + 0x122c) +
             *(float *)(bspline_basis1 + lVar137 + 0x16b0) +
             *(float *)(bspline_basis1 + lVar137 + 0x1b34) +
             *(float *)(bspline_basis1 + lVar137 + 0x1fb8);
        auVar226._8_4_ = 0x7fffffff;
        auVar226._0_8_ = 0x7fffffff7fffffff;
        auVar226._12_4_ = 0x7fffffff;
        auVar226._16_4_ = 0x7fffffff;
        auVar226._20_4_ = 0x7fffffff;
        auVar226._24_4_ = 0x7fffffff;
        auVar226._28_4_ = 0x7fffffff;
        auVar122._4_4_ =
             fVar257 * fVar211 + fVar317 * fVar243 + fVar176 * fVar334 + fVar353 * fVar305;
        auVar122._0_4_ =
             fVar248 * fVar210 + fVar316 * fVar239 + fVar163 * fVar162 + fVar347 * fVar298;
        auVar122._8_4_ =
             fVar143 * fVar212 + fVar318 * fVar244 + fVar177 * fVar264 + fVar355 * fVar213;
        auVar122._12_4_ =
             fVar158 * fVar214 + fVar319 * fVar245 + fVar178 * fVar336 + fVar357 * fVar328;
        auVar122._16_4_ =
             fVar248 * fVar216 + fVar316 * fVar332 + fVar163 * fVar335 + fVar347 * fVar306;
        auVar122._20_4_ =
             fVar257 * fVar231 + fVar317 * fVar261 + fVar176 * fVar280 + fVar353 * fVar307;
        auVar122._24_4_ =
             fVar143 * fVar235 + fVar318 * fVar333 + fVar177 * fVar327 + fVar355 * fVar215;
        auVar122._28_4_ =
             *(float *)(bspline_basis0 + lVar137 + 0x16b0) +
             *(float *)(bspline_basis0 + lVar137 + 0x1fb8) + fVar297;
        auVar146 = vandps_avx(auVar122,auVar226);
        auVar21 = vandps_avx(auVar171,auVar226);
        auVar21 = vmaxps_avx(auVar146,auVar21);
        auVar146 = vandps_avx(auVar288,auVar226);
        auVar146 = vmaxps_avx(auVar21,auVar146);
        auVar194 = vpermilps_avx(auVar268,0);
        auVar289._16_16_ = auVar194;
        auVar289._0_16_ = auVar194;
        auVar146 = vcmpps_avx(auVar146,auVar289,1);
        auVar23 = vblendvps_avx(auVar122,auVar22,auVar146);
        auVar27 = vblendvps_avx(auVar171,local_360,auVar146);
        auVar146 = vandps_avx(auVar302,auVar226);
        auVar21 = vandps_avx(auVar310,auVar226);
        auVar19 = vmaxps_avx(auVar146,auVar21);
        auVar146 = vandps_avx(auVar190,auVar226);
        auVar146 = vmaxps_avx(auVar19,auVar146);
        auVar19 = vcmpps_avx(auVar146,auVar289,1);
        auVar146 = vblendvps_avx(auVar302,auVar22,auVar19);
        auVar22 = vblendvps_avx(auVar310,local_360,auVar19);
        fVar142 = auVar23._0_4_;
        fVar157 = auVar23._4_4_;
        fVar159 = auVar23._8_4_;
        fVar160 = auVar23._12_4_;
        fVar161 = auVar23._16_4_;
        fVar370 = auVar23._20_4_;
        fVar371 = auVar23._24_4_;
        fVar372 = auVar146._0_4_;
        fVar207 = auVar146._4_4_;
        fVar209 = auVar146._8_4_;
        fVar163 = auVar146._12_4_;
        fVar176 = auVar146._16_4_;
        fVar177 = auVar146._20_4_;
        fVar178 = auVar146._24_4_;
        fStack_564 = -auVar146._28_4_;
        fVar210 = auVar27._0_4_;
        fVar216 = auVar27._4_4_;
        fVar243 = auVar27._8_4_;
        fVar261 = auVar27._12_4_;
        fVar264 = auVar27._16_4_;
        fVar327 = auVar27._20_4_;
        fVar328 = auVar27._24_4_;
        auVar149._0_4_ = fVar210 * fVar210 + fVar142 * fVar142;
        auVar149._4_4_ = fVar216 * fVar216 + fVar157 * fVar157;
        auVar149._8_4_ = fVar243 * fVar243 + fVar159 * fVar159;
        auVar149._12_4_ = fVar261 * fVar261 + fVar160 * fVar160;
        auVar149._16_4_ = fVar264 * fVar264 + fVar161 * fVar161;
        auVar149._20_4_ = fVar327 * fVar327 + fVar370 * fVar370;
        auVar149._24_4_ = fVar328 * fVar328 + fVar371 * fVar371;
        auVar149._28_4_ = auVar310._28_4_ + auVar23._28_4_;
        auVar23 = vrsqrtps_avx(auVar149);
        fVar211 = auVar23._0_4_;
        fVar212 = auVar23._4_4_;
        auVar32._4_4_ = fVar212 * 1.5;
        auVar32._0_4_ = fVar211 * 1.5;
        fVar214 = auVar23._8_4_;
        auVar32._8_4_ = fVar214 * 1.5;
        fVar231 = auVar23._12_4_;
        auVar32._12_4_ = fVar231 * 1.5;
        fVar235 = auVar23._16_4_;
        auVar32._16_4_ = fVar235 * 1.5;
        fVar239 = auVar23._20_4_;
        auVar32._20_4_ = fVar239 * 1.5;
        fVar244 = auVar23._24_4_;
        fVar179 = auVar21._28_4_;
        auVar32._24_4_ = fVar244 * 1.5;
        auVar32._28_4_ = fVar179;
        auVar33._4_4_ = fVar212 * fVar212 * fVar212 * auVar149._4_4_ * 0.5;
        auVar33._0_4_ = fVar211 * fVar211 * fVar211 * auVar149._0_4_ * 0.5;
        auVar33._8_4_ = fVar214 * fVar214 * fVar214 * auVar149._8_4_ * 0.5;
        auVar33._12_4_ = fVar231 * fVar231 * fVar231 * auVar149._12_4_ * 0.5;
        auVar33._16_4_ = fVar235 * fVar235 * fVar235 * auVar149._16_4_ * 0.5;
        auVar33._20_4_ = fVar239 * fVar239 * fVar239 * auVar149._20_4_ * 0.5;
        auVar33._24_4_ = fVar244 * fVar244 * fVar244 * auVar149._24_4_ * 0.5;
        auVar33._28_4_ = auVar149._28_4_;
        auVar21 = vsubps_avx(auVar32,auVar33);
        fVar211 = auVar21._0_4_;
        fVar231 = auVar21._4_4_;
        fVar244 = auVar21._8_4_;
        fVar333 = auVar21._12_4_;
        fVar336 = auVar21._16_4_;
        fVar298 = auVar21._20_4_;
        fVar306 = auVar21._24_4_;
        fVar212 = auVar22._0_4_;
        fVar235 = auVar22._4_4_;
        fVar245 = auVar22._8_4_;
        fVar162 = auVar22._12_4_;
        fVar335 = auVar22._16_4_;
        fVar305 = auVar22._20_4_;
        fVar307 = auVar22._24_4_;
        auVar150._0_4_ = fVar212 * fVar212 + fVar372 * fVar372;
        auVar150._4_4_ = fVar235 * fVar235 + fVar207 * fVar207;
        auVar150._8_4_ = fVar245 * fVar245 + fVar209 * fVar209;
        auVar150._12_4_ = fVar162 * fVar162 + fVar163 * fVar163;
        auVar150._16_4_ = fVar335 * fVar335 + fVar176 * fVar176;
        auVar150._20_4_ = fVar305 * fVar305 + fVar177 * fVar177;
        auVar150._24_4_ = fVar307 * fVar307 + fVar178 * fVar178;
        auVar150._28_4_ = auVar146._28_4_ + auVar21._28_4_;
        auVar146 = vrsqrtps_avx(auVar150);
        fVar214 = auVar146._0_4_;
        fVar239 = auVar146._4_4_;
        auVar34._4_4_ = fVar239 * 1.5;
        auVar34._0_4_ = fVar214 * 1.5;
        fVar332 = auVar146._8_4_;
        auVar34._8_4_ = fVar332 * 1.5;
        fVar334 = auVar146._12_4_;
        auVar34._12_4_ = fVar334 * 1.5;
        fVar280 = auVar146._16_4_;
        auVar34._16_4_ = fVar280 * 1.5;
        fVar213 = auVar146._20_4_;
        auVar34._20_4_ = fVar213 * 1.5;
        fVar215 = auVar146._24_4_;
        auVar34._24_4_ = fVar215 * 1.5;
        auVar34._28_4_ = fVar179;
        auVar35._4_4_ = fVar239 * fVar239 * fVar239 * auVar150._4_4_ * 0.5;
        auVar35._0_4_ = fVar214 * fVar214 * fVar214 * auVar150._0_4_ * 0.5;
        auVar35._8_4_ = fVar332 * fVar332 * fVar332 * auVar150._8_4_ * 0.5;
        auVar35._12_4_ = fVar334 * fVar334 * fVar334 * auVar150._12_4_ * 0.5;
        auVar35._16_4_ = fVar280 * fVar280 * fVar280 * auVar150._16_4_ * 0.5;
        auVar35._20_4_ = fVar213 * fVar213 * fVar213 * auVar150._20_4_ * 0.5;
        auVar35._24_4_ = fVar215 * fVar215 * fVar215 * auVar150._24_4_ * 0.5;
        auVar35._28_4_ = auVar150._28_4_;
        auVar146 = vsubps_avx(auVar34,auVar35);
        fVar214 = auVar146._0_4_;
        fVar239 = auVar146._4_4_;
        fVar332 = auVar146._8_4_;
        fVar334 = auVar146._12_4_;
        fVar280 = auVar146._16_4_;
        fVar213 = auVar146._20_4_;
        fVar215 = auVar146._24_4_;
        local_580 = fVar141 * fVar210 * fVar211;
        fStack_57c = fStack_61c * fVar216 * fVar231;
        auVar36._4_4_ = fStack_57c;
        auVar36._0_4_ = local_580;
        fStack_578 = fStack_618 * fVar243 * fVar244;
        auVar36._8_4_ = fStack_578;
        fStack_574 = fStack_614 * fVar261 * fVar333;
        auVar36._12_4_ = fStack_574;
        fStack_570 = fStack_610 * fVar264 * fVar336;
        auVar36._16_4_ = fStack_570;
        fStack_56c = fStack_60c * fVar327 * fVar298;
        auVar36._20_4_ = fStack_56c;
        fStack_568 = fStack_608 * fVar328 * fVar306;
        auVar36._24_4_ = fStack_568;
        auVar36._28_4_ = fStack_564;
        local_580 = local_580 + auVar339._0_4_;
        fStack_57c = fStack_57c + auVar339._4_4_;
        fStack_578 = fStack_578 + auVar339._8_4_;
        fStack_574 = fStack_574 + auVar339._12_4_;
        fStack_570 = fStack_570 + auVar339._16_4_;
        fStack_56c = fStack_56c + auVar339._20_4_;
        fStack_568 = fStack_568 + auVar339._24_4_;
        fStack_564 = fStack_564 + auVar339._28_4_;
        fVar210 = fVar141 * fVar211 * -fVar142;
        fVar216 = fStack_61c * fVar231 * -fVar157;
        auVar37._4_4_ = fVar216;
        auVar37._0_4_ = fVar210;
        fVar243 = fStack_618 * fVar244 * -fVar159;
        auVar37._8_4_ = fVar243;
        fVar261 = fStack_614 * fVar333 * -fVar160;
        auVar37._12_4_ = fVar261;
        fVar264 = fStack_610 * fVar336 * -fVar161;
        auVar37._16_4_ = fVar264;
        fVar327 = fStack_60c * fVar298 * -fVar370;
        auVar37._20_4_ = fVar327;
        fVar328 = fStack_608 * fVar306 * -fVar371;
        auVar37._24_4_ = fVar328;
        auVar37._28_4_ = fVar179;
        local_520._4_4_ = fVar216 + auVar272._4_4_;
        local_520._0_4_ = fVar210 + auVar272._0_4_;
        fStack_518 = fVar243 + auVar272._8_4_;
        fStack_514 = fVar261 + auVar272._12_4_;
        fStack_510 = fVar264 + auVar272._16_4_;
        fStack_50c = fVar327 + auVar272._20_4_;
        fStack_508 = fVar328 + auVar272._24_4_;
        fStack_504 = fVar179 + auVar272._28_4_;
        fVar210 = fVar211 * 0.0 * fVar141;
        fVar211 = fVar231 * 0.0 * fStack_61c;
        auVar38._4_4_ = fVar211;
        auVar38._0_4_ = fVar210;
        fVar216 = fVar244 * 0.0 * fStack_618;
        auVar38._8_4_ = fVar216;
        fVar231 = fVar333 * 0.0 * fStack_614;
        auVar38._12_4_ = fVar231;
        fVar243 = fVar336 * 0.0 * fStack_610;
        auVar38._16_4_ = fVar243;
        fVar244 = fVar298 * 0.0 * fStack_60c;
        auVar38._20_4_ = fVar244;
        fVar261 = fVar306 * 0.0 * fStack_608;
        auVar38._24_4_ = fVar261;
        auVar38._28_4_ = fVar346;
        auVar120._4_4_ = fStack_5dc;
        auVar120._0_4_ = local_5e0;
        auVar120._8_4_ = fStack_5d8;
        auVar120._12_4_ = fStack_5d4;
        auVar120._16_4_ = fStack_5d0;
        auVar120._20_4_ = fStack_5cc;
        auVar120._24_4_ = fStack_5c8;
        auVar120._28_4_ = fStack_5c4;
        auVar290._0_4_ = fVar210 + local_5e0;
        auVar290._4_4_ = fVar211 + fStack_5dc;
        auVar290._8_4_ = fVar216 + fStack_5d8;
        auVar290._12_4_ = fVar231 + fStack_5d4;
        auVar290._16_4_ = fVar243 + fStack_5d0;
        auVar290._20_4_ = fVar244 + fStack_5cc;
        auVar290._24_4_ = fVar261 + fStack_5c8;
        auVar290._28_4_ = fVar346 + fStack_5c4;
        fVar210 = auVar331._0_4_ * fVar212 * fVar214;
        fVar211 = auVar331._4_4_ * fVar235 * fVar239;
        auVar39._4_4_ = fVar211;
        auVar39._0_4_ = fVar210;
        fVar212 = auVar331._8_4_ * fVar245 * fVar332;
        auVar39._8_4_ = fVar212;
        fVar216 = auVar331._12_4_ * fVar162 * fVar334;
        auVar39._12_4_ = fVar216;
        fVar231 = auVar331._16_4_ * fVar335 * fVar280;
        auVar39._16_4_ = fVar231;
        fVar235 = auVar331._20_4_ * fVar305 * fVar213;
        auVar39._20_4_ = fVar235;
        fVar243 = auVar331._24_4_ * fVar307 * fVar215;
        auVar39._24_4_ = fVar243;
        auVar39._28_4_ = auVar22._28_4_;
        auVar19 = vsubps_avx(auVar339,auVar36);
        auVar311._0_4_ = auVar225._0_4_ + fVar210;
        auVar311._4_4_ = auVar225._4_4_ + fVar211;
        auVar311._8_4_ = auVar225._8_4_ + fVar212;
        auVar311._12_4_ = auVar225._12_4_ + fVar216;
        auVar311._16_4_ = auVar225._16_4_ + fVar231;
        auVar311._20_4_ = auVar225._20_4_ + fVar235;
        auVar311._24_4_ = auVar225._24_4_ + fVar243;
        auVar311._28_4_ = auVar225._28_4_ + auVar22._28_4_;
        fVar210 = auVar331._0_4_ * -fVar372 * fVar214;
        fVar211 = auVar331._4_4_ * -fVar207 * fVar239;
        auVar40._4_4_ = fVar211;
        auVar40._0_4_ = fVar210;
        fVar212 = auVar331._8_4_ * -fVar209 * fVar332;
        auVar40._8_4_ = fVar212;
        fVar216 = auVar331._12_4_ * -fVar163 * fVar334;
        auVar40._12_4_ = fVar216;
        fVar231 = auVar331._16_4_ * -fVar176 * fVar280;
        auVar40._16_4_ = fVar231;
        fVar235 = auVar331._20_4_ * -fVar177 * fVar213;
        auVar40._20_4_ = fVar235;
        fVar243 = auVar331._24_4_ * -fVar178 * fVar215;
        auVar40._24_4_ = fVar243;
        auVar40._28_4_ = fVar358;
        auVar147 = vsubps_avx(auVar272,auVar37);
        auVar322._0_4_ = fVar210 + auVar200._0_4_;
        auVar322._4_4_ = fVar211 + auVar200._4_4_;
        auVar322._8_4_ = fVar212 + auVar200._8_4_;
        auVar322._12_4_ = fVar216 + auVar200._12_4_;
        auVar322._16_4_ = fVar231 + auVar200._16_4_;
        auVar322._20_4_ = fVar235 + auVar200._20_4_;
        auVar322._24_4_ = fVar243 + auVar200._24_4_;
        auVar322._28_4_ = fVar358 + auVar200._28_4_;
        fVar210 = auVar331._0_4_ * fVar214 * 0.0;
        fVar211 = auVar331._4_4_ * fVar239 * 0.0;
        auVar41._4_4_ = fVar211;
        auVar41._0_4_ = fVar210;
        fVar212 = auVar331._8_4_ * fVar332 * 0.0;
        auVar41._8_4_ = fVar212;
        fVar214 = auVar331._12_4_ * fVar334 * 0.0;
        auVar41._12_4_ = fVar214;
        fVar216 = auVar331._16_4_ * fVar280 * 0.0;
        auVar41._16_4_ = fVar216;
        fVar231 = auVar331._20_4_ * fVar213 * 0.0;
        auVar41._20_4_ = fVar231;
        fVar235 = auVar331._24_4_ * fVar215 * 0.0;
        auVar41._24_4_ = fVar235;
        auVar41._28_4_ = auVar331._28_4_;
        auVar167 = vsubps_avx(auVar120,auVar38);
        auVar374._0_4_ = fVar210 + (float)local_4a0._0_4_;
        auVar374._4_4_ = fVar211 + (float)local_4a0._4_4_;
        auVar374._8_4_ = fVar212 + fStack_498;
        auVar374._12_4_ = fVar214 + fStack_494;
        auVar374._16_4_ = fVar216 + fStack_490;
        auVar374._20_4_ = fVar231 + fStack_48c;
        auVar374._24_4_ = fVar235 + fStack_488;
        auVar374._28_4_ = auVar331._28_4_ + fStack_484;
        auVar146 = vsubps_avx(auVar225,auVar39);
        auVar21 = vsubps_avx(auVar200,auVar40);
        auVar22 = vsubps_avx(_local_4a0,auVar41);
        auVar23 = vsubps_avx(auVar322,auVar147);
        auVar27 = vsubps_avx(auVar374,auVar167);
        auVar42._4_4_ = auVar167._4_4_ * auVar23._4_4_;
        auVar42._0_4_ = auVar167._0_4_ * auVar23._0_4_;
        auVar42._8_4_ = auVar167._8_4_ * auVar23._8_4_;
        auVar42._12_4_ = auVar167._12_4_ * auVar23._12_4_;
        auVar42._16_4_ = auVar167._16_4_ * auVar23._16_4_;
        auVar42._20_4_ = auVar167._20_4_ * auVar23._20_4_;
        auVar42._24_4_ = auVar167._24_4_ * auVar23._24_4_;
        auVar42._28_4_ = auVar331._28_4_;
        auVar43._4_4_ = auVar147._4_4_ * auVar27._4_4_;
        auVar43._0_4_ = auVar147._0_4_ * auVar27._0_4_;
        auVar43._8_4_ = auVar147._8_4_ * auVar27._8_4_;
        auVar43._12_4_ = auVar147._12_4_ * auVar27._12_4_;
        auVar43._16_4_ = auVar147._16_4_ * auVar27._16_4_;
        auVar43._20_4_ = auVar147._20_4_ * auVar27._20_4_;
        auVar43._24_4_ = auVar147._24_4_ * auVar27._24_4_;
        auVar43._28_4_ = fStack_484;
        auVar148 = vsubps_avx(auVar43,auVar42);
        auVar44._4_4_ = auVar19._4_4_ * auVar27._4_4_;
        auVar44._0_4_ = auVar19._0_4_ * auVar27._0_4_;
        auVar44._8_4_ = auVar19._8_4_ * auVar27._8_4_;
        auVar44._12_4_ = auVar19._12_4_ * auVar27._12_4_;
        auVar44._16_4_ = auVar19._16_4_ * auVar27._16_4_;
        auVar44._20_4_ = auVar19._20_4_ * auVar27._20_4_;
        auVar44._24_4_ = auVar19._24_4_ * auVar27._24_4_;
        auVar44._28_4_ = auVar27._28_4_;
        auVar168 = vsubps_avx(auVar311,auVar19);
        auVar45._4_4_ = auVar167._4_4_ * auVar168._4_4_;
        auVar45._0_4_ = auVar167._0_4_ * auVar168._0_4_;
        auVar45._8_4_ = auVar167._8_4_ * auVar168._8_4_;
        auVar45._12_4_ = auVar167._12_4_ * auVar168._12_4_;
        auVar45._16_4_ = auVar167._16_4_ * auVar168._16_4_;
        auVar45._20_4_ = auVar167._20_4_ * auVar168._20_4_;
        auVar45._24_4_ = auVar167._24_4_ * auVar168._24_4_;
        auVar45._28_4_ = auVar200._28_4_;
        auVar169 = vsubps_avx(auVar45,auVar44);
        auVar46._4_4_ = auVar168._4_4_ * auVar147._4_4_;
        auVar46._0_4_ = auVar168._0_4_ * auVar147._0_4_;
        auVar46._8_4_ = auVar168._8_4_ * auVar147._8_4_;
        auVar46._12_4_ = auVar168._12_4_ * auVar147._12_4_;
        auVar46._16_4_ = auVar168._16_4_ * auVar147._16_4_;
        auVar46._20_4_ = auVar168._20_4_ * auVar147._20_4_;
        auVar46._24_4_ = auVar168._24_4_ * auVar147._24_4_;
        auVar46._28_4_ = auVar27._28_4_;
        auVar47._4_4_ = auVar19._4_4_ * auVar23._4_4_;
        auVar47._0_4_ = auVar19._0_4_ * auVar23._0_4_;
        auVar47._8_4_ = auVar19._8_4_ * auVar23._8_4_;
        auVar47._12_4_ = auVar19._12_4_ * auVar23._12_4_;
        auVar47._16_4_ = auVar19._16_4_ * auVar23._16_4_;
        auVar47._20_4_ = auVar19._20_4_ * auVar23._20_4_;
        auVar47._24_4_ = auVar19._24_4_ * auVar23._24_4_;
        auVar47._28_4_ = auVar23._28_4_;
        auVar23 = vsubps_avx(auVar47,auVar46);
        auVar151._0_4_ = auVar148._0_4_ * 0.0 + auVar23._0_4_ + auVar169._0_4_ * 0.0;
        auVar151._4_4_ = auVar148._4_4_ * 0.0 + auVar23._4_4_ + auVar169._4_4_ * 0.0;
        auVar151._8_4_ = auVar148._8_4_ * 0.0 + auVar23._8_4_ + auVar169._8_4_ * 0.0;
        auVar151._12_4_ = auVar148._12_4_ * 0.0 + auVar23._12_4_ + auVar169._12_4_ * 0.0;
        auVar151._16_4_ = auVar148._16_4_ * 0.0 + auVar23._16_4_ + auVar169._16_4_ * 0.0;
        auVar151._20_4_ = auVar148._20_4_ * 0.0 + auVar23._20_4_ + auVar169._20_4_ * 0.0;
        auVar151._24_4_ = auVar148._24_4_ * 0.0 + auVar23._24_4_ + auVar169._24_4_ * 0.0;
        auVar151._28_4_ = auVar23._28_4_ + auVar23._28_4_ + auVar169._28_4_;
        auVar148 = vcmpps_avx(auVar151,ZEXT432(0) << 0x20,2);
        auVar123._4_4_ = fStack_57c;
        auVar123._0_4_ = local_580;
        auVar123._8_4_ = fStack_578;
        auVar123._12_4_ = fStack_574;
        auVar123._16_4_ = fStack_570;
        auVar123._20_4_ = fStack_56c;
        auVar123._24_4_ = fStack_568;
        auVar123._28_4_ = fStack_564;
        local_560 = vblendvps_avx(auVar146,auVar123,auVar148);
        auVar146 = vblendvps_avx(auVar21,_local_520,auVar148);
        auVar21 = vblendvps_avx(auVar22,auVar290,auVar148);
        auVar22 = vblendvps_avx(auVar19,auVar311,auVar148);
        auVar23 = vblendvps_avx(auVar147,auVar322,auVar148);
        auVar27 = vblendvps_avx(auVar167,auVar374,auVar148);
        auVar19 = vblendvps_avx(auVar311,auVar19,auVar148);
        auVar147 = vblendvps_avx(auVar322,auVar147,auVar148);
        local_640 = vpackssdw_avx(auVar20._0_16_,auVar20._16_16_);
        auStack_630 = auVar20._16_16_;
        auVar20 = vblendvps_avx(auVar374,auVar167,auVar148);
        auVar19 = vsubps_avx(auVar19,local_560);
        auVar168 = vsubps_avx(auVar147,auVar146);
        auVar169 = vsubps_avx(auVar20,auVar21);
        auVar20 = vsubps_avx(auVar146,auVar23);
        fVar210 = auVar168._0_4_;
        fVar371 = auVar21._0_4_;
        fVar231 = auVar168._4_4_;
        fVar372 = auVar21._4_4_;
        auVar48._4_4_ = fVar372 * fVar231;
        auVar48._0_4_ = fVar371 * fVar210;
        fVar245 = auVar168._8_4_;
        fVar207 = auVar21._8_4_;
        auVar48._8_4_ = fVar207 * fVar245;
        fVar334 = auVar168._12_4_;
        fVar209 = auVar21._12_4_;
        auVar48._12_4_ = fVar209 * fVar334;
        fVar327 = auVar168._16_4_;
        fVar163 = auVar21._16_4_;
        auVar48._16_4_ = fVar163 * fVar327;
        fVar306 = auVar168._20_4_;
        fVar176 = auVar21._20_4_;
        auVar48._20_4_ = fVar176 * fVar306;
        fVar157 = auVar168._24_4_;
        fVar177 = auVar21._24_4_;
        auVar48._24_4_ = fVar177 * fVar157;
        auVar48._28_4_ = auVar147._28_4_;
        fVar211 = auVar146._0_4_;
        fVar143 = auVar169._0_4_;
        fVar235 = auVar146._4_4_;
        fVar158 = auVar169._4_4_;
        auVar49._4_4_ = fVar158 * fVar235;
        auVar49._0_4_ = fVar143 * fVar211;
        fVar332 = auVar146._8_4_;
        fVar246 = auVar169._8_4_;
        auVar49._8_4_ = fVar246 * fVar332;
        fVar264 = auVar146._12_4_;
        fVar180 = auVar169._12_4_;
        auVar49._12_4_ = fVar180 * fVar264;
        fVar298 = auVar146._16_4_;
        fVar281 = auVar169._16_4_;
        auVar49._16_4_ = fVar281 * fVar298;
        fVar307 = auVar146._20_4_;
        fVar293 = auVar169._20_4_;
        auVar49._20_4_ = fVar293 * fVar307;
        fVar159 = auVar146._24_4_;
        fVar294 = auVar169._24_4_;
        uVar7 = auVar167._28_4_;
        auVar49._24_4_ = fVar294 * fVar159;
        auVar49._28_4_ = uVar7;
        auVar147 = vsubps_avx(auVar49,auVar48);
        fVar212 = local_560._0_4_;
        fVar239 = local_560._4_4_;
        auVar50._4_4_ = fVar158 * fVar239;
        auVar50._0_4_ = fVar143 * fVar212;
        fVar261 = local_560._8_4_;
        auVar50._8_4_ = fVar246 * fVar261;
        fVar336 = local_560._12_4_;
        auVar50._12_4_ = fVar180 * fVar336;
        fVar305 = local_560._16_4_;
        auVar50._16_4_ = fVar281 * fVar305;
        fVar215 = local_560._20_4_;
        auVar50._20_4_ = fVar293 * fVar215;
        fVar160 = local_560._24_4_;
        auVar50._24_4_ = fVar294 * fVar160;
        auVar50._28_4_ = uVar7;
        fVar214 = auVar19._0_4_;
        auVar362._0_4_ = fVar371 * fVar214;
        fVar243 = auVar19._4_4_;
        auVar362._4_4_ = fVar372 * fVar243;
        fVar333 = auVar19._8_4_;
        auVar362._8_4_ = fVar207 * fVar333;
        fVar335 = auVar19._12_4_;
        auVar362._12_4_ = fVar209 * fVar335;
        fVar213 = auVar19._16_4_;
        auVar362._16_4_ = fVar163 * fVar213;
        fVar179 = auVar19._20_4_;
        auVar362._20_4_ = fVar176 * fVar179;
        fVar161 = auVar19._24_4_;
        auVar362._24_4_ = fVar177 * fVar161;
        auVar362._28_4_ = 0;
        auVar167 = vsubps_avx(auVar362,auVar50);
        auVar51._4_4_ = fVar235 * fVar243;
        auVar51._0_4_ = fVar211 * fVar214;
        auVar51._8_4_ = fVar332 * fVar333;
        auVar51._12_4_ = fVar264 * fVar335;
        auVar51._16_4_ = fVar298 * fVar213;
        auVar51._20_4_ = fVar307 * fVar179;
        auVar51._24_4_ = fVar159 * fVar161;
        auVar51._28_4_ = uVar7;
        auVar276 = ZEXT3264(auVar21);
        auVar52._4_4_ = fVar239 * fVar231;
        auVar52._0_4_ = fVar212 * fVar210;
        auVar52._8_4_ = fVar261 * fVar245;
        auVar52._12_4_ = fVar336 * fVar334;
        auVar52._16_4_ = fVar305 * fVar327;
        auVar52._20_4_ = fVar215 * fVar306;
        auVar52._24_4_ = fVar160 * fVar157;
        auVar52._28_4_ = auVar374._28_4_;
        auVar170 = vsubps_avx(auVar52,auVar51);
        auVar186 = vsubps_avx(auVar21,auVar27);
        fVar216 = auVar170._28_4_ + auVar167._28_4_;
        auVar291._0_4_ = auVar170._0_4_ + auVar167._0_4_ * 0.0 + auVar147._0_4_ * 0.0;
        auVar291._4_4_ = auVar170._4_4_ + auVar167._4_4_ * 0.0 + auVar147._4_4_ * 0.0;
        auVar291._8_4_ = auVar170._8_4_ + auVar167._8_4_ * 0.0 + auVar147._8_4_ * 0.0;
        auVar291._12_4_ = auVar170._12_4_ + auVar167._12_4_ * 0.0 + auVar147._12_4_ * 0.0;
        auVar291._16_4_ = auVar170._16_4_ + auVar167._16_4_ * 0.0 + auVar147._16_4_ * 0.0;
        auVar291._20_4_ = auVar170._20_4_ + auVar167._20_4_ * 0.0 + auVar147._20_4_ * 0.0;
        auVar291._24_4_ = auVar170._24_4_ + auVar167._24_4_ * 0.0 + auVar147._24_4_ * 0.0;
        auVar291._28_4_ = fVar216 + auVar147._28_4_;
        fVar178 = auVar20._0_4_;
        fVar218 = auVar20._4_4_;
        auVar53._4_4_ = fVar218 * auVar27._4_4_;
        auVar53._0_4_ = fVar178 * auVar27._0_4_;
        fVar233 = auVar20._8_4_;
        auVar53._8_4_ = fVar233 * auVar27._8_4_;
        fVar237 = auVar20._12_4_;
        auVar53._12_4_ = fVar237 * auVar27._12_4_;
        fVar241 = auVar20._16_4_;
        auVar53._16_4_ = fVar241 * auVar27._16_4_;
        fVar248 = auVar20._20_4_;
        auVar53._20_4_ = fVar248 * auVar27._20_4_;
        fVar257 = auVar20._24_4_;
        auVar53._24_4_ = fVar257 * auVar27._24_4_;
        auVar53._28_4_ = fVar216;
        fVar216 = auVar186._0_4_;
        fVar244 = auVar186._4_4_;
        auVar54._4_4_ = auVar23._4_4_ * fVar244;
        auVar54._0_4_ = auVar23._0_4_ * fVar216;
        fVar162 = auVar186._8_4_;
        auVar54._8_4_ = auVar23._8_4_ * fVar162;
        fVar280 = auVar186._12_4_;
        auVar54._12_4_ = auVar23._12_4_ * fVar280;
        fVar328 = auVar186._16_4_;
        auVar54._16_4_ = auVar23._16_4_ * fVar328;
        fVar142 = auVar186._20_4_;
        auVar54._20_4_ = auVar23._20_4_ * fVar142;
        fVar370 = auVar186._24_4_;
        auVar54._24_4_ = auVar23._24_4_ * fVar370;
        auVar54._28_4_ = auVar170._28_4_;
        auVar20 = vsubps_avx(auVar54,auVar53);
        auVar167 = vsubps_avx(local_560,auVar22);
        fVar295 = auVar167._0_4_;
        fVar296 = auVar167._4_4_;
        auVar55._4_4_ = fVar296 * auVar27._4_4_;
        auVar55._0_4_ = fVar295 * auVar27._0_4_;
        fVar308 = auVar167._8_4_;
        auVar55._8_4_ = fVar308 * auVar27._8_4_;
        fVar314 = auVar167._12_4_;
        auVar55._12_4_ = fVar314 * auVar27._12_4_;
        fVar315 = auVar167._16_4_;
        auVar55._16_4_ = fVar315 * auVar27._16_4_;
        fVar316 = auVar167._20_4_;
        auVar55._20_4_ = fVar316 * auVar27._20_4_;
        fVar317 = auVar167._24_4_;
        auVar55._24_4_ = fVar317 * auVar27._24_4_;
        auVar55._28_4_ = auVar27._28_4_;
        auVar56._4_4_ = auVar22._4_4_ * fVar244;
        auVar56._0_4_ = auVar22._0_4_ * fVar216;
        auVar56._8_4_ = auVar22._8_4_ * fVar162;
        auVar56._12_4_ = auVar22._12_4_ * fVar280;
        auVar56._16_4_ = auVar22._16_4_ * fVar328;
        auVar56._20_4_ = auVar22._20_4_ * fVar142;
        auVar56._24_4_ = auVar22._24_4_ * fVar370;
        auVar56._28_4_ = auVar147._28_4_;
        auVar147 = vsubps_avx(auVar55,auVar56);
        auVar57._4_4_ = auVar23._4_4_ * fVar296;
        auVar57._0_4_ = auVar23._0_4_ * fVar295;
        auVar57._8_4_ = auVar23._8_4_ * fVar308;
        auVar57._12_4_ = auVar23._12_4_ * fVar314;
        auVar57._16_4_ = auVar23._16_4_ * fVar315;
        auVar57._20_4_ = auVar23._20_4_ * fVar316;
        auVar57._24_4_ = auVar23._24_4_ * fVar317;
        auVar57._28_4_ = auVar27._28_4_;
        auVar58._4_4_ = auVar22._4_4_ * fVar218;
        auVar58._0_4_ = auVar22._0_4_ * fVar178;
        auVar58._8_4_ = auVar22._8_4_ * fVar233;
        auVar58._12_4_ = auVar22._12_4_ * fVar237;
        auVar58._16_4_ = auVar22._16_4_ * fVar241;
        auVar58._20_4_ = auVar22._20_4_ * fVar248;
        auVar58._24_4_ = auVar22._24_4_ * fVar257;
        auVar58._28_4_ = auVar22._28_4_;
        auVar22 = vsubps_avx(auVar58,auVar57);
        auVar227._0_4_ = auVar20._0_4_ * 0.0 + auVar22._0_4_ + auVar147._0_4_ * 0.0;
        auVar227._4_4_ = auVar20._4_4_ * 0.0 + auVar22._4_4_ + auVar147._4_4_ * 0.0;
        auVar227._8_4_ = auVar20._8_4_ * 0.0 + auVar22._8_4_ + auVar147._8_4_ * 0.0;
        auVar227._12_4_ = auVar20._12_4_ * 0.0 + auVar22._12_4_ + auVar147._12_4_ * 0.0;
        auVar227._16_4_ = auVar20._16_4_ * 0.0 + auVar22._16_4_ + auVar147._16_4_ * 0.0;
        auVar227._20_4_ = auVar20._20_4_ * 0.0 + auVar22._20_4_ + auVar147._20_4_ * 0.0;
        auVar227._24_4_ = auVar20._24_4_ * 0.0 + auVar22._24_4_ + auVar147._24_4_ * 0.0;
        auVar227._28_4_ = auVar22._28_4_ + auVar22._28_4_ + auVar147._28_4_;
        auVar20 = vmaxps_avx(auVar291,auVar227);
        auVar20 = vcmpps_avx(auVar20,ZEXT832(0) << 0x20,2);
        auVar194 = vpackssdw_avx(auVar20._0_16_,auVar20._16_16_);
        auVar194 = vpand_avx(auVar194,local_640);
        auVar182 = vpmovsxwd_avx(auVar194);
        auVar223 = vpunpckhwd_avx(auVar194,auVar194);
        auVar202._16_16_ = auVar223;
        auVar202._0_16_ = auVar182;
        if ((((((((auVar202 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar202 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar202 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar202 >> 0x7f,0) == '\0') &&
              (auVar202 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar223 >> 0x3f,0) == '\0') &&
            (auVar202 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar223[0xf]) {
LAB_010fddf5:
          auVar205 = ZEXT3264(auVar202);
          auVar254._8_8_ = uStack_4d8;
          auVar254._0_8_ = local_4e0;
          auVar254._16_8_ = uStack_4d0;
          auVar254._24_8_ = uStack_4c8;
          auVar304 = ZEXT3264(auVar301);
          auVar323._4_4_ = fStack_61c;
          auVar323._0_4_ = fVar141;
          auVar323._8_4_ = fStack_618;
          auVar323._12_4_ = fStack_614;
          auVar323._16_4_ = fStack_610;
          auVar323._20_4_ = fStack_60c;
          auVar323._24_4_ = fStack_608;
          auVar323._28_4_ = fStack_604;
        }
        else {
          auVar59._4_4_ = fVar244 * fVar231;
          auVar59._0_4_ = fVar216 * fVar210;
          auVar59._8_4_ = fVar162 * fVar245;
          auVar59._12_4_ = fVar280 * fVar334;
          auVar59._16_4_ = fVar328 * fVar327;
          auVar59._20_4_ = fVar142 * fVar306;
          auVar59._24_4_ = fVar370 * fVar157;
          auVar59._28_4_ = auVar223._12_4_;
          auVar340._0_4_ = fVar178 * fVar143;
          auVar340._4_4_ = fVar218 * fVar158;
          auVar340._8_4_ = fVar233 * fVar246;
          auVar340._12_4_ = fVar237 * fVar180;
          auVar340._16_4_ = fVar241 * fVar281;
          auVar340._20_4_ = fVar248 * fVar293;
          auVar340._24_4_ = fVar257 * fVar294;
          auVar340._28_4_ = 0;
          auVar20 = vsubps_avx(auVar340,auVar59);
          auVar60._4_4_ = fVar296 * fVar158;
          auVar60._0_4_ = fVar295 * fVar143;
          auVar60._8_4_ = fVar308 * fVar246;
          auVar60._12_4_ = fVar314 * fVar180;
          auVar60._16_4_ = fVar315 * fVar281;
          auVar60._20_4_ = fVar316 * fVar293;
          auVar60._24_4_ = fVar317 * fVar294;
          auVar60._28_4_ = auVar169._28_4_;
          auVar61._4_4_ = fVar244 * fVar243;
          auVar61._0_4_ = fVar216 * fVar214;
          auVar61._8_4_ = fVar162 * fVar333;
          auVar61._12_4_ = fVar280 * fVar335;
          auVar61._16_4_ = fVar328 * fVar213;
          auVar61._20_4_ = fVar142 * fVar179;
          auVar61._24_4_ = fVar370 * fVar161;
          auVar61._28_4_ = auVar186._28_4_;
          auVar23 = vsubps_avx(auVar61,auVar60);
          auVar62._4_4_ = fVar218 * fVar243;
          auVar62._0_4_ = fVar178 * fVar214;
          auVar62._8_4_ = fVar233 * fVar333;
          auVar62._12_4_ = fVar237 * fVar335;
          auVar62._16_4_ = fVar241 * fVar213;
          auVar62._20_4_ = fVar248 * fVar179;
          auVar62._24_4_ = fVar257 * fVar161;
          auVar62._28_4_ = auVar19._28_4_;
          auVar63._4_4_ = fVar296 * fVar231;
          auVar63._0_4_ = fVar295 * fVar210;
          auVar63._8_4_ = fVar308 * fVar245;
          auVar63._12_4_ = fVar314 * fVar334;
          auVar63._16_4_ = fVar315 * fVar327;
          auVar63._20_4_ = fVar316 * fVar306;
          auVar63._24_4_ = fVar317 * fVar157;
          auVar63._28_4_ = auVar291._28_4_;
          auVar27 = vsubps_avx(auVar63,auVar62);
          auVar292._0_4_ = auVar20._0_4_ * 0.0 + auVar27._0_4_ + auVar23._0_4_ * 0.0;
          auVar292._4_4_ = auVar20._4_4_ * 0.0 + auVar27._4_4_ + auVar23._4_4_ * 0.0;
          auVar292._8_4_ = auVar20._8_4_ * 0.0 + auVar27._8_4_ + auVar23._8_4_ * 0.0;
          auVar292._12_4_ = auVar20._12_4_ * 0.0 + auVar27._12_4_ + auVar23._12_4_ * 0.0;
          auVar292._16_4_ = auVar20._16_4_ * 0.0 + auVar27._16_4_ + auVar23._16_4_ * 0.0;
          auVar292._20_4_ = auVar20._20_4_ * 0.0 + auVar27._20_4_ + auVar23._20_4_ * 0.0;
          auVar292._24_4_ = auVar20._24_4_ * 0.0 + auVar27._24_4_ + auVar23._24_4_ * 0.0;
          auVar292._28_4_ = auVar291._28_4_ + auVar27._28_4_ + auVar19._28_4_;
          auVar22 = vrcpps_avx(auVar292);
          fVar214 = auVar22._0_4_;
          fVar216 = auVar22._4_4_;
          auVar64._4_4_ = auVar292._4_4_ * fVar216;
          auVar64._0_4_ = auVar292._0_4_ * fVar214;
          fVar231 = auVar22._8_4_;
          auVar64._8_4_ = auVar292._8_4_ * fVar231;
          fVar243 = auVar22._12_4_;
          auVar64._12_4_ = auVar292._12_4_ * fVar243;
          fVar244 = auVar22._16_4_;
          auVar64._16_4_ = auVar292._16_4_ * fVar244;
          fVar245 = auVar22._20_4_;
          auVar64._20_4_ = auVar292._20_4_ * fVar245;
          fVar333 = auVar22._24_4_;
          auVar64._24_4_ = auVar292._24_4_ * fVar333;
          auVar64._28_4_ = auVar186._28_4_;
          auVar341._8_4_ = 0x3f800000;
          auVar341._0_8_ = &DAT_3f8000003f800000;
          auVar341._12_4_ = 0x3f800000;
          auVar341._16_4_ = 0x3f800000;
          auVar341._20_4_ = 0x3f800000;
          auVar341._24_4_ = 0x3f800000;
          auVar341._28_4_ = 0x3f800000;
          auVar19 = vsubps_avx(auVar341,auVar64);
          fVar214 = auVar19._0_4_ * fVar214 + fVar214;
          fVar216 = auVar19._4_4_ * fVar216 + fVar216;
          fVar231 = auVar19._8_4_ * fVar231 + fVar231;
          fVar243 = auVar19._12_4_ * fVar243 + fVar243;
          fVar244 = auVar19._16_4_ * fVar244 + fVar244;
          fVar245 = auVar19._20_4_ * fVar245 + fVar245;
          fVar333 = auVar19._24_4_ * fVar333 + fVar333;
          auVar65._4_4_ =
               (auVar20._4_4_ * fVar239 + auVar23._4_4_ * fVar235 + auVar27._4_4_ * fVar372) *
               fVar216;
          auVar65._0_4_ =
               (auVar20._0_4_ * fVar212 + auVar23._0_4_ * fVar211 + auVar27._0_4_ * fVar371) *
               fVar214;
          auVar65._8_4_ =
               (auVar20._8_4_ * fVar261 + auVar23._8_4_ * fVar332 + auVar27._8_4_ * fVar207) *
               fVar231;
          auVar65._12_4_ =
               (auVar20._12_4_ * fVar336 + auVar23._12_4_ * fVar264 + auVar27._12_4_ * fVar209) *
               fVar243;
          auVar65._16_4_ =
               (auVar20._16_4_ * fVar305 + auVar23._16_4_ * fVar298 + auVar27._16_4_ * fVar163) *
               fVar244;
          auVar65._20_4_ =
               (auVar20._20_4_ * fVar215 + auVar23._20_4_ * fVar307 + auVar27._20_4_ * fVar176) *
               fVar245;
          auVar65._24_4_ =
               (auVar20._24_4_ * fVar160 + auVar23._24_4_ * fVar159 + auVar27._24_4_ * fVar177) *
               fVar333;
          auVar65._28_4_ = local_560._28_4_ + auVar168._28_4_ + auVar21._28_4_;
          auVar182 = vpermilps_avx(ZEXT416(local_740),0);
          auVar203._16_16_ = auVar182;
          auVar203._0_16_ = auVar182;
          auVar20 = vcmpps_avx(auVar203,auVar65,2);
          fVar210 = ray->tfar;
          auVar252._4_4_ = fVar210;
          auVar252._0_4_ = fVar210;
          auVar252._8_4_ = fVar210;
          auVar252._12_4_ = fVar210;
          auVar252._16_4_ = fVar210;
          auVar252._20_4_ = fVar210;
          auVar252._24_4_ = fVar210;
          auVar252._28_4_ = fVar210;
          auVar21 = vcmpps_avx(auVar65,auVar252,2);
          auVar20 = vandps_avx(auVar21,auVar20);
          auVar182 = vpackssdw_avx(auVar20._0_16_,auVar20._16_16_);
          auVar194 = vpand_avx(auVar194,auVar182);
          auVar182 = vpmovsxwd_avx(auVar194);
          auVar223 = vpshufd_avx(auVar194,0xee);
          auVar223 = vpmovsxwd_avx(auVar223);
          auVar276 = ZEXT1664(auVar223);
          auVar202._16_16_ = auVar223;
          auVar202._0_16_ = auVar182;
          if ((((((((auVar202 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar202 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar202 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar202 >> 0x7f,0) == '\0') &&
                (auVar202 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar223 >> 0x3f,0) == '\0') &&
              (auVar202 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar223[0xf]) goto LAB_010fddf5;
          auVar20 = vcmpps_avx(ZEXT832(0) << 0x20,auVar292,4);
          auVar182 = vpackssdw_avx(auVar20._0_16_,auVar20._16_16_);
          auVar194 = vpand_avx(auVar194,auVar182);
          auVar182 = vpmovsxwd_avx(auVar194);
          auVar194 = vpunpckhwd_avx(auVar194,auVar194);
          auVar205 = ZEXT1664(auVar194);
          auVar273._16_16_ = auVar194;
          auVar273._0_16_ = auVar182;
          auVar276 = ZEXT3264(auVar273);
          auVar254._8_8_ = uStack_4d8;
          auVar254._0_8_ = local_4e0;
          auVar254._16_8_ = uStack_4d0;
          auVar254._24_8_ = uStack_4c8;
          auVar304 = ZEXT3264(auVar301);
          auVar323._4_4_ = fStack_61c;
          auVar323._0_4_ = fVar141;
          auVar323._8_4_ = fStack_618;
          auVar323._12_4_ = fStack_614;
          auVar323._16_4_ = fStack_610;
          auVar323._20_4_ = fStack_60c;
          auVar323._24_4_ = fStack_608;
          auVar323._28_4_ = fStack_604;
          if ((((((((auVar273 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar273 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar273 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar273 >> 0x7f,0) != '\0') ||
                (auVar273 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar194 >> 0x3f,0) != '\0') ||
              (auVar273 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar194[0xf] < '\0') {
            auVar204._0_4_ = auVar291._0_4_ * fVar214;
            auVar204._4_4_ = auVar291._4_4_ * fVar216;
            auVar204._8_4_ = auVar291._8_4_ * fVar231;
            auVar204._12_4_ = auVar291._12_4_ * fVar243;
            auVar204._16_4_ = auVar291._16_4_ * fVar244;
            auVar204._20_4_ = auVar291._20_4_ * fVar245;
            auVar204._24_4_ = auVar291._24_4_ * fVar333;
            auVar204._28_4_ = 0;
            auVar66._4_4_ = auVar227._4_4_ * fVar216;
            auVar66._0_4_ = auVar227._0_4_ * fVar214;
            auVar66._8_4_ = auVar227._8_4_ * fVar231;
            auVar66._12_4_ = auVar227._12_4_ * fVar243;
            auVar66._16_4_ = auVar227._16_4_ * fVar244;
            auVar66._20_4_ = auVar227._20_4_ * fVar245;
            auVar66._24_4_ = auVar227._24_4_ * fVar333;
            auVar66._28_4_ = auVar19._28_4_ + auVar22._28_4_;
            auVar253._8_4_ = 0x3f800000;
            auVar253._0_8_ = &DAT_3f8000003f800000;
            auVar253._12_4_ = 0x3f800000;
            auVar253._16_4_ = 0x3f800000;
            auVar253._20_4_ = 0x3f800000;
            auVar253._24_4_ = 0x3f800000;
            auVar253._28_4_ = 0x3f800000;
            auVar301 = vsubps_avx(auVar253,auVar204);
            local_1a0 = vblendvps_avx(auVar301,auVar204,auVar148);
            auVar301 = vsubps_avx(auVar253,auVar66);
            auVar205 = ZEXT3264(auVar301);
            _local_3c0 = vblendvps_avx(auVar301,auVar66,auVar148);
            auVar304 = ZEXT3264(auVar65);
            auVar254 = auVar273;
          }
        }
        if ((((((((auVar254 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar254 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar254 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar254 >> 0x7f,0) == '\0') &&
              (auVar254 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar254 >> 0xbf,0) == '\0') &&
            (auVar254 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar254[0x1f]) {
          pGVar135 = (Geometry *)0x0;
          _local_7c0 = auVar11;
LAB_010fcdb5:
          auVar230 = ZEXT3264(_local_600);
          fVar265 = (float)local_6e0._0_4_;
          fVar277 = (float)local_6e0._4_4_;
          fVar278 = fStack_6d8;
          fVar279 = fStack_6d4;
          fVar247 = fStack_6d0;
          fVar256 = fStack_6cc;
          fVar258 = fStack_6c8;
          fVar259 = fStack_6c4;
          auVar11 = _local_7c0;
        }
        else {
          auVar301 = vsubps_avx(auVar331,auVar323);
          auVar205 = ZEXT3264(local_1a0);
          fVar211 = auVar323._0_4_ + auVar301._0_4_ * local_1a0._0_4_;
          fVar212 = auVar323._4_4_ + auVar301._4_4_ * local_1a0._4_4_;
          fVar214 = auVar323._8_4_ + auVar301._8_4_ * local_1a0._8_4_;
          fVar216 = auVar323._12_4_ + auVar301._12_4_ * local_1a0._12_4_;
          fVar231 = auVar323._16_4_ + auVar301._16_4_ * local_1a0._16_4_;
          fVar235 = auVar323._20_4_ + auVar301._20_4_ * local_1a0._20_4_;
          fVar239 = auVar323._24_4_ + auVar301._24_4_ * local_1a0._24_4_;
          fVar243 = auVar323._28_4_ + auVar301._28_4_;
          fVar210 = pre->depth_scale;
          auVar67._4_4_ = (fVar212 + fVar212) * fVar210;
          auVar67._0_4_ = (fVar211 + fVar211) * fVar210;
          auVar67._8_4_ = (fVar214 + fVar214) * fVar210;
          auVar67._12_4_ = (fVar216 + fVar216) * fVar210;
          auVar67._16_4_ = (fVar231 + fVar231) * fVar210;
          auVar67._20_4_ = (fVar235 + fVar235) * fVar210;
          auVar67._24_4_ = (fVar239 + fVar239) * fVar210;
          auVar67._28_4_ = fVar243 + fVar243;
          local_2e0 = auVar304._0_32_;
          auVar301 = vcmpps_avx(local_2e0,auVar67,6);
          auVar20 = auVar254 & auVar301;
          auVar230 = ZEXT3264(_local_600);
          if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar20 >> 0x7f,0) != '\0') ||
                (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar20 >> 0xbf,0) != '\0') ||
              (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar20[0x1f] < '\0') {
            local_260 = vandps_avx(auVar301,auVar254);
            local_300 = (float)local_3c0._0_4_ + (float)local_3c0._0_4_ + -1.0;
            fStack_2fc = (float)local_3c0._4_4_ + (float)local_3c0._4_4_ + -1.0;
            fStack_2f8 = (float)uStack_3b8 + (float)uStack_3b8 + -1.0;
            fStack_2f4 = uStack_3b8._4_4_ + uStack_3b8._4_4_ + -1.0;
            fStack_2f0 = (float)uStack_3b0 + (float)uStack_3b0 + -1.0;
            fStack_2ec = uStack_3b0._4_4_ + uStack_3b0._4_4_ + -1.0;
            fStack_2e8 = (float)uStack_3a8 + (float)uStack_3a8 + -1.0;
            fStack_2e4 = uStack_3a8._4_4_ + uStack_3a8._4_4_ + -1.0;
            local_320 = local_1a0;
            local_2c0 = 0;
            local_2bc = uVar133;
            local_2b0 = local_7c0;
            uStack_2a8 = local_7c0._8_8_;
            local_2a0 = local_430._0_8_;
            uStack_298 = local_430._8_8_;
            local_290 = local_440._0_8_;
            uStack_288 = local_440._8_8_;
            local_280 = local_450._0_8_;
            uStack_278 = local_450._8_8_;
            local_3c0._4_4_ = fStack_2fc;
            local_3c0._0_4_ = local_300;
            uStack_3b8._0_4_ = fStack_2f8;
            uStack_3b8._4_4_ = fStack_2f4;
            uStack_3b0._0_4_ = fStack_2f0;
            uStack_3b0._4_4_ = fStack_2ec;
            auVar128 = _local_3c0;
            uStack_3a8._0_4_ = fStack_2e8;
            uStack_3a8._4_4_ = fStack_2e4;
            auVar301 = _local_3c0;
            if ((pGVar17->mask & ray->mask) != 0) {
              pGVar130 = (Geometry *)context->args;
              pGVar135 = pGVar17;
              if ((((Geometry *)context->args)->device != (Device *)0x0) ||
                 (pGVar135 = (Geometry *)CONCAT71((int7)((ulong)pGVar17 >> 8),1), pGVar130 = pGVar17
                 , local_450 = auVar9, local_440 = auVar10, local_430 = auVar12,
                 pGVar17->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar184._0_4_ = 1.0 / (float)(int)uVar133;
                auVar184._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar194 = vshufps_avx(auVar184,auVar184,0);
                local_240[0] = auVar194._0_4_ * (local_1a0._0_4_ + 0.0);
                local_240[1] = auVar194._4_4_ * (local_1a0._4_4_ + 1.0);
                local_240[2] = auVar194._8_4_ * (local_1a0._8_4_ + 2.0);
                local_240[3] = auVar194._12_4_ * (local_1a0._12_4_ + 3.0);
                fStack_230 = auVar194._0_4_ * (local_1a0._16_4_ + 4.0);
                fStack_22c = auVar194._4_4_ * (local_1a0._20_4_ + 5.0);
                fStack_228 = auVar194._8_4_ * (local_1a0._24_4_ + 6.0);
                fStack_224 = (float)local_1a0._28_4_ + 7.0;
                uStack_3b0 = auVar128._16_8_;
                uStack_3a8 = auVar301._24_8_;
                local_220 = local_3c0;
                uStack_218 = uStack_3b8;
                uStack_210 = uStack_3b0;
                uStack_208 = uStack_3a8;
                local_200 = local_2e0;
                iVar129 = vmovmskps_avx(local_260);
                local_7a0 = CONCAT44((int)((ulong)pGVar130 >> 0x20),iVar129);
                lVar138 = 0;
                if (local_7a0 != 0) {
                  for (; (local_7a0 >> lVar138 & 1) == 0; lVar138 = lVar138 + 1) {
                  }
                }
                uVar134 = CONCAT71((int7)((ulong)pGVar135 >> 8),iVar129 != 0);
                local_450 = auVar9;
                local_440 = auVar10;
                local_430 = auVar12;
                _local_3c0 = auVar301;
                if (iVar129 != 0) {
                  auStack_798 = auVar331._8_24_;
                  _auStack_650 = auVar146._16_16_;
                  _local_660 = local_430;
                  auStack_4f0 = auVar200._16_16_;
                  _local_500 = local_440;
                  _auStack_670 = auVar225._16_16_;
                  _local_680 = local_450;
                  local_720 = local_2e0;
                  local_7d8 = ray;
                  local_7a8 = pre;
                  local_7d0 = uVar131;
                  fVar247 = (float)local_7c0._0_4_;
                  fVar256 = (float)local_7c0._4_4_;
                  fVar258 = (float)uStack_7b8;
                  fVar259 = uStack_7b8._4_4_;
                  _local_7c0 = auVar11;
                  _local_3a0 = auVar24;
                  _local_380 = auVar25;
                  local_360 = auVar26;
                  do {
                    local_620 = (uint)uVar134;
                    local_5a4 = local_240[lVar138];
                    local_5a0 = *(undefined4 *)((long)&local_220 + lVar138 * 4);
                    local_560._0_4_ = ray->tfar;
                    local_640._0_8_ = lVar138;
                    ray->tfar = *(float *)(local_200 + lVar138 * 4);
                    local_6b0.context = context->user;
                    fVar211 = 1.0 - local_5a4;
                    fVar210 = local_5a4 * fVar211 * 4.0;
                    auVar276 = ZEXT464(0x3f000000);
                    auVar194 = ZEXT416((uint)(local_5a4 * local_5a4 * 0.5));
                    auVar194 = vshufps_avx(auVar194,auVar194,0);
                    auVar182 = ZEXT416((uint)((fVar211 * fVar211 + fVar210) * 0.5));
                    auVar182 = vshufps_avx(auVar182,auVar182,0);
                    auVar223 = ZEXT416((uint)((-local_5a4 * local_5a4 - fVar210) * 0.5));
                    auVar223 = vshufps_avx(auVar223,auVar223,0);
                    auVar195 = ZEXT416((uint)(fVar211 * -fVar211 * 0.5));
                    auVar195 = vshufps_avx(auVar195,auVar195,0);
                    auVar197._0_4_ = fVar247 * auVar195._0_4_;
                    auVar197._4_4_ = fVar256 * auVar195._4_4_;
                    auVar197._8_4_ = fVar258 * auVar195._8_4_;
                    auVar197._12_4_ = fVar259 * auVar195._12_4_;
                    auVar205 = ZEXT1664(auVar197);
                    auVar185._0_4_ =
                         auVar197._0_4_ +
                         auVar223._0_4_ * (float)local_660._0_4_ +
                         auVar194._0_4_ * (float)local_680._0_4_ +
                         auVar182._0_4_ * (float)local_500._0_4_;
                    auVar185._4_4_ =
                         auVar197._4_4_ +
                         auVar223._4_4_ * (float)local_660._4_4_ +
                         auVar194._4_4_ * (float)local_680._4_4_ +
                         auVar182._4_4_ * (float)local_500._4_4_;
                    auVar185._8_4_ =
                         auVar197._8_4_ +
                         auVar223._8_4_ * fStack_658 +
                         auVar194._8_4_ * fStack_678 + auVar182._8_4_ * fStack_4f8;
                    auVar185._12_4_ =
                         auVar197._12_4_ +
                         auVar223._12_4_ * fStack_654 +
                         auVar194._12_4_ * fStack_674 + auVar182._12_4_ * fStack_4f4;
                    local_5b0 = vmovlps_avx(auVar185);
                    local_5a8 = vextractps_avx(auVar185,2);
                    local_59c = local_7c4;
                    local_598 = (int)uVar131;
                    local_594 = (local_6b0.context)->instID[0];
                    local_590 = (local_6b0.context)->instPrimID[0];
                    local_7dc = -1;
                    local_6b0.valid = &local_7dc;
                    local_6b0.geometryUserPtr = *(void **)(local_4c0._0_8_ + 0x18);
                    local_6b0.ray = (RTCRayN *)ray;
                    local_6b0.hit = (RTCHitN *)&local_5b0;
                    local_6b0.N = 1;
                    if (*(code **)(local_4c0._0_8_ + 0x48) == (code *)0x0) {
LAB_010fe0dd:
                      p_Var18 = context->args->filter;
                      if (p_Var18 != (RTCFilterFunctionN)0x0) {
                        if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           ((*(byte *)(local_4c0._0_8_ + 0x3e) & 0x40) != 0)) {
                          auVar205 = ZEXT1664(auVar205._0_16_);
                          auVar276 = ZEXT1664(auVar276._0_16_);
                          (*p_Var18)(&local_6b0);
                          auVar304 = ZEXT3264(local_720);
                          uVar131 = local_7d0;
                          ray = local_7d8;
                          pre = local_7a8;
                          fVar247 = (float)local_7c0._0_4_;
                          fVar256 = (float)local_7c0._4_4_;
                          fVar258 = (float)uStack_7b8;
                          fVar259 = uStack_7b8._4_4_;
                          fVar373 = (float)local_760._0_4_;
                          fVar376 = (float)local_760._4_4_;
                          fVar377 = fStack_758;
                          fVar378 = fStack_754;
                          fVar260 = fStack_750;
                          fVar262 = fStack_74c;
                          fVar263 = fStack_748;
                          fVar217 = (float)local_700._0_4_;
                          fVar232 = (float)local_700._4_4_;
                          fVar236 = fStack_6f8;
                          fVar240 = fStack_6f4;
                          fVar191 = fStack_6f0;
                          fVar206 = fStack_6ec;
                          fVar208 = fStack_6e8;
                        }
                        if (*local_6b0.valid == 0) goto LAB_010fe163;
                      }
                      uVar134 = (ulong)local_620;
                      auVar11 = _local_7c0;
                      break;
                    }
                    auVar205 = ZEXT1664(auVar197);
                    auVar276 = ZEXT1664(auVar276._0_16_);
                    (**(code **)(local_4c0._0_8_ + 0x48))(&local_6b0);
                    auVar304 = ZEXT3264(local_720);
                    uVar131 = local_7d0;
                    ray = local_7d8;
                    pre = local_7a8;
                    fVar247 = (float)local_7c0._0_4_;
                    fVar256 = (float)local_7c0._4_4_;
                    fVar258 = (float)uStack_7b8;
                    fVar259 = uStack_7b8._4_4_;
                    fVar373 = (float)local_760._0_4_;
                    fVar376 = (float)local_760._4_4_;
                    fVar377 = fStack_758;
                    fVar378 = fStack_754;
                    fVar260 = fStack_750;
                    fVar262 = fStack_74c;
                    fVar263 = fStack_748;
                    fVar217 = (float)local_700._0_4_;
                    fVar232 = (float)local_700._4_4_;
                    fVar236 = fStack_6f8;
                    fVar240 = fStack_6f4;
                    fVar191 = fStack_6f0;
                    fVar206 = fStack_6ec;
                    fVar208 = fStack_6e8;
                    if (*local_6b0.valid != 0) goto LAB_010fe0dd;
LAB_010fe163:
                    ray->tfar = (float)local_560._0_4_;
                    uVar132 = local_7a0 ^ 1L << (local_640._0_8_ & 0x3f);
                    lVar138 = 0;
                    if (uVar132 != 0) {
                      for (; (uVar132 >> lVar138 & 1) == 0; lVar138 = lVar138 + 1) {
                      }
                    }
                    local_7a0 = uVar132;
                    uVar134 = CONCAT71(local_640._1_7_,uVar132 != 0);
                    auVar11 = _local_7c0;
                  } while (uVar132 != 0);
                }
                _local_7c0 = auVar11;
                pGVar135 = (Geometry *)(uVar134 & 0xffffffffffffff01);
                goto LAB_010fcdb5;
              }
              goto LAB_010fcef7;
            }
          }
          pGVar135 = (Geometry *)0x0;
          local_450 = auVar9;
          local_440 = auVar10;
          local_430 = auVar12;
        }
LAB_010fcef7:
        _local_7c0 = auVar11;
        local_7d0 = uVar131;
        local_7d8 = ray;
        local_7a8 = pre;
        auVar268 = local_780._0_16_;
      }
      if (8 < (int)uVar133) {
        local_360._0_16_ = vpshufd_avx(ZEXT416(uVar133),0);
        auVar194 = vshufps_avx(auVar268,auVar268,0);
        register0x00001210 = auVar194;
        _local_4a0 = auVar194;
        auVar117._4_4_ = uStack_73c;
        auVar117._0_4_ = local_740;
        auVar117._8_4_ = fStack_738;
        auVar117._12_4_ = fStack_734;
        auVar194 = vpermilps_avx(auVar117,0);
        local_4c0._16_16_ = auVar194;
        local_4c0._0_16_ = auVar194;
        auVar145._0_4_ = 1.0 / (float)local_420._0_4_;
        auVar145._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar194 = vshufps_avx(auVar145,auVar145,0);
        _fStack_410 = auVar194;
        _local_420 = auVar194;
        auVar156 = ZEXT3264(_local_420);
        lVar138 = 8;
        local_720 = auVar304._0_32_;
        _local_600 = auVar230._0_32_;
        fVar210 = (float)local_540._0_4_;
        fVar211 = (float)local_540._4_4_;
        fVar212 = fStack_538;
        fVar214 = fStack_534;
        fVar216 = fStack_530;
        fVar231 = fStack_52c;
        fVar235 = fStack_528;
        fVar239 = fStack_524;
        do {
          local_620 = (uint)pGVar135;
          pauVar1 = (undefined1 (*) [28])(bspline_basis0 + lVar138 * 4 + lVar137);
          fVar243 = *(float *)*pauVar1;
          fVar244 = *(float *)(*pauVar1 + 4);
          fVar245 = *(float *)(*pauVar1 + 8);
          fVar332 = *(float *)(*pauVar1 + 0xc);
          fVar261 = *(float *)(*pauVar1 + 0x10);
          fVar333 = *(float *)(*pauVar1 + 0x14);
          fVar162 = *(float *)(*pauVar1 + 0x18);
          auVar126 = *pauVar1;
          pauVar1 = (undefined1 (*) [28])(lVar137 + 0x222bfac + lVar138 * 4);
          fVar334 = *(float *)*pauVar1;
          fVar264 = *(float *)(*pauVar1 + 4);
          fVar336 = *(float *)(*pauVar1 + 8);
          fVar335 = *(float *)(*pauVar1 + 0xc);
          fVar280 = *(float *)(*pauVar1 + 0x10);
          fVar327 = *(float *)(*pauVar1 + 0x14);
          fVar298 = *(float *)(*pauVar1 + 0x18);
          auVar125 = *pauVar1;
          pfVar3 = (float *)(lVar137 + 0x222c430 + lVar138 * 4);
          fVar305 = *pfVar3;
          fVar213 = pfVar3[1];
          fVar328 = pfVar3[2];
          fVar306 = pfVar3[3];
          fVar307 = pfVar3[4];
          fVar215 = pfVar3[5];
          fVar179 = pfVar3[6];
          pfVar3 = (float *)(lVar137 + 0x222c8b4 + lVar138 * 4);
          fVar142 = *pfVar3;
          fVar157 = pfVar3[1];
          fVar159 = pfVar3[2];
          fVar160 = pfVar3[3];
          fVar161 = pfVar3[4];
          fVar370 = pfVar3[5];
          fVar371 = pfVar3[6];
          fVar372 = auVar205._28_4_;
          fStack_724 = fVar372 + fVar372 + auVar156._28_4_;
          fVar246 = fVar372 + fVar372 + pfVar3[7];
          auVar363._0_4_ =
               (float)local_e0._0_4_ * fVar243 +
               fVar334 * auVar230._0_4_ + fVar305 * fVar210 + (float)local_400._0_4_ * fVar142;
          auVar363._4_4_ =
               (float)local_e0._4_4_ * fVar244 +
               fVar264 * auVar230._4_4_ + fVar213 * fVar211 + (float)local_400._4_4_ * fVar157;
          auVar363._8_4_ =
               fStack_d8 * fVar245 +
               fVar336 * auVar230._8_4_ + fVar328 * fVar212 + fStack_3f8 * fVar159;
          auVar363._12_4_ =
               fStack_d4 * fVar332 +
               fVar335 * auVar230._12_4_ + fVar306 * fVar214 + fStack_3f4 * fVar160;
          auVar363._16_4_ =
               fStack_d0 * fVar261 +
               fVar280 * auVar230._16_4_ + fVar307 * fVar216 + fStack_3f0 * fVar161;
          auVar363._20_4_ =
               fStack_cc * fVar333 +
               fVar327 * auVar230._20_4_ + fVar215 * fVar231 + fStack_3ec * fVar370;
          auVar363._24_4_ =
               fStack_c8 * fVar162 +
               fVar298 * auVar230._24_4_ + fVar179 * fVar235 + fStack_3e8 * fVar371;
          auVar363._28_4_ = fVar372 + pfVar3[7] + fStack_724;
          local_780._0_4_ =
               fVar373 * fVar334 + fVar217 * fVar305 + fVar265 * fVar142 +
               (float)local_340._0_4_ * fVar243;
          local_780._4_4_ =
               fVar376 * fVar264 + fVar232 * fVar213 + fVar277 * fVar157 +
               (float)local_340._4_4_ * fVar244;
          local_780._8_4_ =
               fVar377 * fVar336 + fVar236 * fVar328 + fVar278 * fVar159 + fStack_338 * fVar245;
          local_780._12_4_ =
               fVar378 * fVar335 + fVar240 * fVar306 + fVar279 * fVar160 + fStack_334 * fVar332;
          local_780._16_4_ =
               fVar260 * fVar280 + fVar191 * fVar307 + fVar247 * fVar161 + fStack_330 * fVar261;
          local_780._20_4_ =
               fVar262 * fVar327 + fVar206 * fVar215 + fVar256 * fVar370 + fStack_32c * fVar333;
          local_780._24_4_ =
               fVar263 * fVar298 + fVar208 * fVar179 + fVar258 * fVar371 + fStack_328 * fVar162;
          local_780._28_4_ = fVar372 + fVar372 + auVar276._28_4_ + fStack_724;
          fVar143 = fVar243 * (float)local_140._0_4_ +
                    fVar334 * (float)local_120._0_4_ +
                    (float)local_a0._0_4_ * fVar305 + fVar142 * (float)local_100._0_4_;
          fVar158 = fVar244 * (float)local_140._4_4_ +
                    fVar264 * (float)local_120._4_4_ +
                    (float)local_a0._4_4_ * fVar213 + fVar157 * (float)local_100._4_4_;
          fStack_738 = fVar245 * fStack_138 +
                       fVar336 * fStack_118 + fStack_98 * fVar328 + fVar159 * fStack_f8;
          fStack_734 = fVar332 * fStack_134 +
                       fVar335 * fStack_114 + fStack_94 * fVar306 + fVar160 * fStack_f4;
          fStack_730 = fVar261 * fStack_130 +
                       fVar280 * fStack_110 + fStack_90 * fVar307 + fVar161 * fStack_f0;
          fStack_72c = fVar333 * fStack_12c +
                       fVar327 * fStack_10c + fStack_8c * fVar215 + fVar370 * fStack_ec;
          fStack_728 = fVar162 * fStack_128 +
                       fVar298 * fStack_108 + fStack_88 * fVar179 + fVar371 * fStack_e8;
          fStack_724 = fStack_724 + fVar246;
          pfVar3 = (float *)(bspline_basis1 + lVar138 * 4 + lVar137);
          fVar334 = *pfVar3;
          fVar264 = pfVar3[1];
          fVar336 = pfVar3[2];
          fVar335 = pfVar3[3];
          fVar280 = pfVar3[4];
          fVar327 = pfVar3[5];
          fVar298 = pfVar3[6];
          pfVar3 = (float *)(lVar137 + 0x222e3cc + lVar138 * 4);
          fVar372 = *pfVar3;
          fVar207 = pfVar3[1];
          fVar209 = pfVar3[2];
          fVar141 = pfVar3[3];
          fVar163 = pfVar3[4];
          fVar176 = pfVar3[5];
          fVar177 = pfVar3[6];
          pfVar4 = (float *)(lVar137 + 0x222e850 + lVar138 * 4);
          fVar178 = *pfVar4;
          fVar218 = pfVar4[1];
          fVar233 = pfVar4[2];
          fVar237 = pfVar4[3];
          fVar241 = pfVar4[4];
          fVar248 = pfVar4[5];
          fVar257 = pfVar4[6];
          auVar146 = *(undefined1 (*) [32])(lVar137 + 0x222ecd4 + lVar138 * 4);
          auVar156 = ZEXT3264(auVar146);
          fVar243 = auVar146._0_4_;
          fVar244 = auVar146._4_4_;
          fVar245 = auVar146._8_4_;
          fVar332 = auVar146._12_4_;
          fVar261 = auVar146._16_4_;
          fVar333 = auVar146._20_4_;
          fVar162 = auVar146._24_4_;
          fVar246 = fVar239 + fVar239 + fVar246;
          auVar274._0_4_ =
               (float)local_e0._0_4_ * fVar334 +
               fVar372 * auVar230._0_4_ + fVar178 * fVar210 + (float)local_400._0_4_ * fVar243;
          auVar274._4_4_ =
               (float)local_e0._4_4_ * fVar264 +
               fVar207 * auVar230._4_4_ + fVar218 * fVar211 + (float)local_400._4_4_ * fVar244;
          auVar274._8_4_ =
               fStack_d8 * fVar336 +
               fVar209 * auVar230._8_4_ + fVar233 * fVar212 + fStack_3f8 * fVar245;
          auVar274._12_4_ =
               fStack_d4 * fVar335 +
               fVar141 * auVar230._12_4_ + fVar237 * fVar214 + fStack_3f4 * fVar332;
          auVar274._16_4_ =
               fStack_d0 * fVar280 +
               fVar163 * auVar230._16_4_ + fVar241 * fVar216 + fStack_3f0 * fVar261;
          auVar274._20_4_ =
               fStack_cc * fVar327 +
               fVar176 * auVar230._20_4_ + fVar248 * fVar231 + fStack_3ec * fVar333;
          auVar274._24_4_ =
               fStack_c8 * fVar298 +
               fVar177 * auVar230._24_4_ + fVar257 * fVar235 + fStack_3e8 * fVar162;
          auVar274._28_4_ = auVar230._28_4_ + fVar246;
          local_560._0_4_ =
               fVar334 * (float)local_340._0_4_ +
               fVar372 * fVar373 + fVar217 * fVar178 + fVar265 * fVar243;
          local_560._4_4_ =
               fVar264 * (float)local_340._4_4_ +
               fVar207 * fVar376 + fVar232 * fVar218 + fVar277 * fVar244;
          local_560._8_4_ =
               fVar336 * fStack_338 + fVar209 * fVar377 + fVar236 * fVar233 + fVar278 * fVar245;
          local_560._12_4_ =
               fVar335 * fStack_334 + fVar141 * fVar378 + fVar240 * fVar237 + fVar279 * fVar332;
          local_560._16_4_ =
               fVar280 * fStack_330 + fVar163 * fVar260 + fVar191 * fVar241 + fVar247 * fVar261;
          local_560._20_4_ =
               fVar327 * fStack_32c + fVar176 * fVar262 + fVar206 * fVar248 + fVar256 * fVar333;
          local_560._24_4_ =
               fVar298 * fStack_328 + fVar177 * fVar263 + fVar208 * fVar257 + fVar258 * fVar162;
          local_560._28_4_ = fVar246 + fVar239 + fVar239 + fVar259;
          auVar350._0_4_ =
               (float)local_a0._0_4_ * fVar178 + fVar243 * (float)local_100._0_4_ +
               fVar372 * (float)local_120._0_4_ + fVar334 * (float)local_140._0_4_;
          auVar350._4_4_ =
               (float)local_a0._4_4_ * fVar218 + fVar244 * (float)local_100._4_4_ +
               fVar207 * (float)local_120._4_4_ + fVar264 * (float)local_140._4_4_;
          auVar350._8_4_ =
               fStack_98 * fVar233 + fVar245 * fStack_f8 + fVar209 * fStack_118 +
               fVar336 * fStack_138;
          auVar350._12_4_ =
               fStack_94 * fVar237 + fVar332 * fStack_f4 + fVar141 * fStack_114 +
               fVar335 * fStack_134;
          auVar350._16_4_ =
               fStack_90 * fVar241 + fVar261 * fStack_f0 + fVar163 * fStack_110 +
               fVar280 * fStack_130;
          auVar350._20_4_ =
               fStack_8c * fVar248 + fVar333 * fStack_ec + fVar176 * fStack_10c +
               fVar327 * fStack_12c;
          auVar350._24_4_ =
               fStack_88 * fVar257 + fVar162 * fStack_e8 + fVar177 * fStack_108 +
               fVar298 * fStack_128;
          auVar350._28_4_ = fVar239 + fStack_3e4 + fVar239 + fVar246;
          auVar20 = vsubps_avx(auVar274,auVar363);
          _local_3a0 = vsubps_avx(local_560,local_780);
          fVar247 = auVar20._0_4_;
          fVar258 = auVar20._4_4_;
          auVar68._4_4_ = local_780._4_4_ * fVar258;
          auVar68._0_4_ = (float)local_780._0_4_ * fVar247;
          fVar260 = auVar20._8_4_;
          auVar68._8_4_ = local_780._8_4_ * fVar260;
          fVar263 = auVar20._12_4_;
          auVar68._12_4_ = local_780._12_4_ * fVar263;
          fVar211 = auVar20._16_4_;
          auVar68._16_4_ = local_780._16_4_ * fVar211;
          fVar214 = auVar20._20_4_;
          auVar68._20_4_ = local_780._20_4_ * fVar214;
          fVar231 = auVar20._24_4_;
          auVar68._24_4_ = local_780._24_4_ * fVar231;
          auVar68._28_4_ = fVar246;
          fVar256 = local_3a0._0_4_;
          fVar259 = local_3a0._4_4_;
          auVar69._4_4_ = auVar363._4_4_ * fVar259;
          auVar69._0_4_ = auVar363._0_4_ * fVar256;
          fVar262 = local_3a0._8_4_;
          auVar69._8_4_ = auVar363._8_4_ * fVar262;
          fVar210 = local_3a0._12_4_;
          auVar69._12_4_ = auVar363._12_4_ * fVar210;
          fVar212 = local_3a0._16_4_;
          auVar69._16_4_ = auVar363._16_4_ * fVar212;
          fVar216 = local_3a0._20_4_;
          auVar69._20_4_ = auVar363._20_4_ * fVar216;
          fVar235 = local_3a0._24_4_;
          auVar69._24_4_ = auVar363._24_4_ * fVar235;
          auVar69._28_4_ = local_560._28_4_;
          auVar21 = vsubps_avx(auVar68,auVar69);
          auVar118._4_4_ = fVar158;
          auVar118._0_4_ = fVar143;
          auVar118._8_4_ = fStack_738;
          auVar118._12_4_ = fStack_734;
          auVar118._16_4_ = fStack_730;
          auVar118._20_4_ = fStack_72c;
          auVar118._24_4_ = fStack_728;
          auVar118._28_4_ = fStack_724;
          auVar301 = vmaxps_avx(auVar118,auVar350);
          auVar70._4_4_ = auVar301._4_4_ * auVar301._4_4_ * (fVar258 * fVar258 + fVar259 * fVar259);
          auVar70._0_4_ = auVar301._0_4_ * auVar301._0_4_ * (fVar247 * fVar247 + fVar256 * fVar256);
          auVar70._8_4_ = auVar301._8_4_ * auVar301._8_4_ * (fVar260 * fVar260 + fVar262 * fVar262);
          auVar70._12_4_ =
               auVar301._12_4_ * auVar301._12_4_ * (fVar263 * fVar263 + fVar210 * fVar210);
          auVar70._16_4_ =
               auVar301._16_4_ * auVar301._16_4_ * (fVar211 * fVar211 + fVar212 * fVar212);
          auVar70._20_4_ =
               auVar301._20_4_ * auVar301._20_4_ * (fVar214 * fVar214 + fVar216 * fVar216);
          auVar70._24_4_ =
               auVar301._24_4_ * auVar301._24_4_ * (fVar231 * fVar231 + fVar235 * fVar235);
          auVar70._28_4_ = auVar274._28_4_ + local_560._28_4_;
          auVar71._4_4_ = auVar21._4_4_ * auVar21._4_4_;
          auVar71._0_4_ = auVar21._0_4_ * auVar21._0_4_;
          auVar71._8_4_ = auVar21._8_4_ * auVar21._8_4_;
          auVar71._12_4_ = auVar21._12_4_ * auVar21._12_4_;
          auVar71._16_4_ = auVar21._16_4_ * auVar21._16_4_;
          auVar71._20_4_ = auVar21._20_4_ * auVar21._20_4_;
          auVar71._24_4_ = auVar21._24_4_ * auVar21._24_4_;
          auVar71._28_4_ = auVar21._28_4_;
          auVar301 = vcmpps_avx(auVar71,auVar70,2);
          local_740 = (uint)lVar138;
          auVar182 = vpshufd_avx(ZEXT416(local_740),0);
          auVar194 = vpor_avx(auVar182,_DAT_01ff0cf0);
          auVar182 = vpor_avx(auVar182,_DAT_02020ea0);
          auVar194 = vpcmpgtd_avx(local_360._0_16_,auVar194);
          auVar276 = ZEXT1664(auVar194);
          auVar182 = vpcmpgtd_avx(local_360._0_16_,auVar182);
          register0x000012d0 = auVar182;
          _local_380 = auVar194;
          auVar205 = ZEXT3264(_local_380);
          auVar21 = _local_380 & auVar301;
          fVar265 = (float)local_6e0._0_4_;
          fVar277 = (float)local_6e0._4_4_;
          fVar278 = fStack_6d8;
          fVar279 = fStack_6d4;
          fVar247 = fStack_6d0;
          fVar256 = fStack_6cc;
          fVar258 = fStack_6c8;
          fVar259 = fStack_6c4;
          fVar210 = (float)local_540._0_4_;
          fVar211 = (float)local_540._4_4_;
          fVar212 = fStack_538;
          fVar214 = fStack_534;
          fVar216 = fStack_530;
          fVar231 = fStack_52c;
          fVar235 = fStack_528;
          fVar239 = fStack_524;
          fVar373 = (float)local_760._0_4_;
          fVar376 = (float)local_760._4_4_;
          fVar377 = fStack_758;
          fVar378 = fStack_754;
          fVar260 = fStack_750;
          fVar262 = fStack_74c;
          fVar263 = fStack_748;
          if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar21 >> 0x7f,0) == '\0') &&
                (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar21 >> 0xbf,0) == '\0') &&
              (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar21[0x1f]) {
            auVar304 = ZEXT3264(local_720);
            auVar230 = ZEXT3264(_local_600);
            pGVar135 = (Geometry *)((ulong)pGVar135 & 0xffffffff);
          }
          else {
            local_520._0_4_ =
                 fVar334 * (float)local_160._0_4_ +
                 fVar372 * (float)local_180._0_4_ +
                 fVar178 * (float)local_c0._0_4_ + (float)local_480._0_4_ * fVar243;
            local_520._4_4_ =
                 fVar264 * (float)local_160._4_4_ +
                 fVar207 * (float)local_180._4_4_ +
                 fVar218 * (float)local_c0._4_4_ + (float)local_480._4_4_ * fVar244;
            fStack_518 = fVar336 * fStack_158 +
                         fVar209 * fStack_178 + fVar233 * fStack_b8 + fStack_478 * fVar245;
            fStack_514 = fVar335 * fStack_154 +
                         fVar141 * fStack_174 + fVar237 * fStack_b4 + fStack_474 * fVar332;
            fStack_510 = fVar280 * fStack_150 +
                         fVar163 * fStack_170 + fVar241 * fStack_b0 + fStack_470 * fVar261;
            fStack_50c = fVar327 * fStack_14c +
                         fVar176 * fStack_16c + fVar248 * fStack_ac + fStack_46c * fVar333;
            fStack_508 = fVar298 * fStack_148 +
                         fVar177 * fStack_168 + fVar257 * fStack_a8 + fStack_468 * fVar162;
            fStack_504 = pfVar3[7] + auVar146._28_4_ + auVar301._28_4_ + 0.0;
            local_680._0_4_ = auVar125._0_4_;
            local_680._4_4_ = auVar125._4_4_;
            fStack_678 = auVar125._8_4_;
            fStack_674 = auVar125._12_4_;
            auStack_670._0_4_ = auVar125._16_4_;
            auStack_670._4_4_ = auVar125._20_4_;
            fStack_668 = auVar125._24_4_;
            pfVar3 = (float *)(lVar137 + 0x222d640 + lVar138 * 4);
            fVar243 = *pfVar3;
            fVar244 = pfVar3[1];
            fVar245 = pfVar3[2];
            fVar332 = pfVar3[3];
            fVar261 = pfVar3[4];
            fVar333 = pfVar3[5];
            fVar162 = pfVar3[6];
            pfVar4 = (float *)(lVar137 + 0x222dac4 + lVar138 * 4);
            fVar334 = *pfVar4;
            fVar264 = pfVar4[1];
            fVar336 = pfVar4[2];
            fVar335 = pfVar4[3];
            fVar280 = pfVar4[4];
            fVar327 = pfVar4[5];
            fVar298 = pfVar4[6];
            pfVar5 = (float *)(lVar137 + 0x222d1bc + lVar138 * 4);
            fVar372 = *pfVar5;
            fVar207 = pfVar5[1];
            fVar209 = pfVar5[2];
            fVar141 = pfVar5[3];
            fVar163 = pfVar5[4];
            fVar176 = pfVar5[5];
            fVar177 = pfVar5[6];
            fVar246 = pfVar3[7] + pfVar4[7];
            fVar180 = pfVar4[7] + auVar363._28_4_ + 0.0;
            fVar281 = auVar363._28_4_ + auVar350._28_4_ + auVar363._28_4_ + 0.0;
            pfVar3 = (float *)(lVar137 + 0x222cd38 + lVar138 * 4);
            fVar178 = *pfVar3;
            fVar218 = pfVar3[1];
            fVar233 = pfVar3[2];
            fVar237 = pfVar3[3];
            fVar241 = pfVar3[4];
            fVar248 = pfVar3[5];
            fVar257 = pfVar3[6];
            local_580 = (float)local_e0._0_4_ * fVar178 +
                        fVar372 * (float)local_600._0_4_ +
                        (float)local_540._0_4_ * fVar243 + (float)local_400._0_4_ * fVar334;
            fStack_57c = (float)local_e0._4_4_ * fVar218 +
                         fVar207 * (float)local_600._4_4_ +
                         (float)local_540._4_4_ * fVar244 + (float)local_400._4_4_ * fVar264;
            fStack_578 = fStack_d8 * fVar233 +
                         fVar209 * fStack_5f8 + fStack_538 * fVar245 + fStack_3f8 * fVar336;
            fStack_574 = fStack_d4 * fVar237 +
                         fVar141 * fStack_5f4 + fStack_534 * fVar332 + fStack_3f4 * fVar335;
            fStack_570 = fStack_d0 * fVar241 +
                         fVar163 * fStack_5f0 + fStack_530 * fVar261 + fStack_3f0 * fVar280;
            fStack_56c = fStack_cc * fVar248 +
                         fVar176 * fStack_5ec + fStack_52c * fVar333 + fStack_3ec * fVar327;
            fStack_568 = fStack_c8 * fVar257 +
                         fVar177 * fStack_5e8 + fStack_528 * fVar162 + fStack_3e8 * fVar298;
            fStack_564 = fVar246 + fVar180;
            auVar172._0_4_ =
                 (float)local_340._0_4_ * fVar178 +
                 fVar217 * fVar243 + (float)local_6e0._0_4_ * fVar334 +
                 fVar372 * (float)local_760._0_4_;
            auVar172._4_4_ =
                 (float)local_340._4_4_ * fVar218 +
                 fVar232 * fVar244 + (float)local_6e0._4_4_ * fVar264 +
                 fVar207 * (float)local_760._4_4_;
            auVar172._8_4_ =
                 fStack_338 * fVar233 +
                 fVar236 * fVar245 + fStack_6d8 * fVar336 + fVar209 * fStack_758;
            auVar172._12_4_ =
                 fStack_334 * fVar237 +
                 fVar240 * fVar332 + fStack_6d4 * fVar335 + fVar141 * fStack_754;
            auVar172._16_4_ =
                 fStack_330 * fVar241 +
                 fVar191 * fVar261 + fStack_6d0 * fVar280 + fVar163 * fStack_750;
            auVar172._20_4_ =
                 fStack_32c * fVar248 +
                 fVar206 * fVar333 + fStack_6cc * fVar327 + fVar176 * fStack_74c;
            auVar172._24_4_ =
                 fStack_328 * fVar257 +
                 fVar208 * fVar162 + fStack_6c8 * fVar298 + fVar177 * fStack_748;
            auVar172._28_4_ = fVar180 + fVar281;
            auVar351._0_4_ =
                 (float)local_180._0_4_ * fVar372 +
                 (float)local_c0._0_4_ * fVar243 + (float)local_480._0_4_ * fVar334 +
                 fVar178 * (float)local_160._0_4_;
            auVar351._4_4_ =
                 (float)local_180._4_4_ * fVar207 +
                 (float)local_c0._4_4_ * fVar244 + (float)local_480._4_4_ * fVar264 +
                 fVar218 * (float)local_160._4_4_;
            auVar351._8_4_ =
                 fStack_178 * fVar209 + fStack_b8 * fVar245 + fStack_478 * fVar336 +
                 fVar233 * fStack_158;
            auVar351._12_4_ =
                 fStack_174 * fVar141 + fStack_b4 * fVar332 + fStack_474 * fVar335 +
                 fVar237 * fStack_154;
            auVar351._16_4_ =
                 fStack_170 * fVar163 + fStack_b0 * fVar261 + fStack_470 * fVar280 +
                 fVar241 * fStack_150;
            auVar351._20_4_ =
                 fStack_16c * fVar176 + fStack_ac * fVar333 + fStack_46c * fVar327 +
                 fVar248 * fStack_14c;
            auVar351._24_4_ =
                 fStack_168 * fVar177 + fStack_a8 * fVar162 + fStack_468 * fVar298 +
                 fVar257 * fStack_148;
            auVar351._28_4_ = pfVar5[7] + fVar246 + fVar281;
            pfVar3 = (float *)(lVar137 + 0x222fa60 + lVar138 * 4);
            fVar191 = *pfVar3;
            fVar206 = pfVar3[1];
            fVar208 = pfVar3[2];
            fVar243 = pfVar3[3];
            fVar244 = pfVar3[4];
            fVar245 = pfVar3[5];
            fVar332 = pfVar3[6];
            pfVar4 = (float *)(lVar137 + 0x222fee4 + lVar138 * 4);
            fVar261 = *pfVar4;
            fVar333 = pfVar4[1];
            fVar162 = pfVar4[2];
            fVar334 = pfVar4[3];
            fVar264 = pfVar4[4];
            fVar336 = pfVar4[5];
            fVar335 = pfVar4[6];
            pfVar5 = (float *)(lVar137 + 0x222f5dc + lVar138 * 4);
            fVar280 = *pfVar5;
            fVar327 = pfVar5[1];
            fVar298 = pfVar5[2];
            fVar372 = pfVar5[3];
            fVar207 = pfVar5[4];
            fVar209 = pfVar5[5];
            fVar217 = pfVar5[6];
            pfVar6 = (float *)(lVar137 + 0x222f158 + lVar138 * 4);
            fVar232 = *pfVar6;
            fVar236 = pfVar6[1];
            fVar240 = pfVar6[2];
            fVar141 = pfVar6[3];
            fVar163 = pfVar6[4];
            fVar176 = pfVar6[5];
            fVar177 = pfVar6[6];
            auVar312._0_4_ =
                 (float)local_e0._0_4_ * fVar232 +
                 fVar280 * (float)local_600._0_4_ +
                 (float)local_540._0_4_ * fVar191 + (float)local_400._0_4_ * fVar261;
            auVar312._4_4_ =
                 (float)local_e0._4_4_ * fVar236 +
                 fVar327 * (float)local_600._4_4_ +
                 (float)local_540._4_4_ * fVar206 + (float)local_400._4_4_ * fVar333;
            auVar312._8_4_ =
                 fStack_d8 * fVar240 +
                 fVar298 * fStack_5f8 + fStack_538 * fVar208 + fStack_3f8 * fVar162;
            auVar312._12_4_ =
                 fStack_d4 * fVar141 +
                 fVar372 * fStack_5f4 + fStack_534 * fVar243 + fStack_3f4 * fVar334;
            auVar312._16_4_ =
                 fStack_d0 * fVar163 +
                 fVar207 * fStack_5f0 + fStack_530 * fVar244 + fStack_3f0 * fVar264;
            auVar312._20_4_ =
                 fStack_cc * fVar176 +
                 fVar209 * fStack_5ec + fStack_52c * fVar245 + fStack_3ec * fVar336;
            auVar312._24_4_ =
                 fStack_c8 * fVar177 +
                 fVar217 * fStack_5e8 + fStack_528 * fVar332 + fStack_3e8 * fVar335;
            auVar312._28_4_ = fStack_164 + fStack_164 + fStack_524 + fStack_164;
            auVar342._0_4_ =
                 (float)local_340._0_4_ * fVar232 +
                 fVar280 * (float)local_760._0_4_ +
                 fVar191 * (float)local_700._0_4_ + (float)local_6e0._0_4_ * fVar261;
            auVar342._4_4_ =
                 (float)local_340._4_4_ * fVar236 +
                 fVar327 * (float)local_760._4_4_ +
                 fVar206 * (float)local_700._4_4_ + (float)local_6e0._4_4_ * fVar333;
            auVar342._8_4_ =
                 fStack_338 * fVar240 +
                 fVar298 * fStack_758 + fVar208 * fStack_6f8 + fStack_6d8 * fVar162;
            auVar342._12_4_ =
                 fStack_334 * fVar141 +
                 fVar372 * fStack_754 + fVar243 * fStack_6f4 + fStack_6d4 * fVar334;
            auVar342._16_4_ =
                 fStack_330 * fVar163 +
                 fVar207 * fStack_750 + fVar244 * fStack_6f0 + fStack_6d0 * fVar264;
            auVar342._20_4_ =
                 fStack_32c * fVar176 +
                 fVar209 * fStack_74c + fVar245 * fStack_6ec + fStack_6cc * fVar336;
            auVar342._24_4_ =
                 fStack_328 * fVar177 +
                 fVar217 * fStack_748 + fVar332 * fStack_6e8 + fStack_6c8 * fVar335;
            auVar342._28_4_ = fStack_164 + fStack_164 + fStack_6c4 + fStack_164;
            auVar255._8_4_ = 0x7fffffff;
            auVar255._0_8_ = 0x7fffffff7fffffff;
            auVar255._12_4_ = 0x7fffffff;
            auVar255._16_4_ = 0x7fffffff;
            auVar255._20_4_ = 0x7fffffff;
            auVar255._24_4_ = 0x7fffffff;
            auVar255._28_4_ = 0x7fffffff;
            auVar124._4_4_ = fStack_57c;
            auVar124._0_4_ = local_580;
            auVar124._8_4_ = fStack_578;
            auVar124._12_4_ = fStack_574;
            auVar124._16_4_ = fStack_570;
            auVar124._20_4_ = fStack_56c;
            auVar124._24_4_ = fStack_568;
            auVar124._28_4_ = fStack_564;
            auVar146 = vandps_avx(auVar124,auVar255);
            auVar21 = vandps_avx(auVar172,auVar255);
            auVar21 = vmaxps_avx(auVar146,auVar21);
            auVar146 = vandps_avx(auVar351,auVar255);
            auVar21 = vmaxps_avx(auVar21,auVar146);
            auVar21 = vcmpps_avx(auVar21,_local_4a0,1);
            auVar22 = vblendvps_avx(auVar124,auVar20,auVar21);
            auVar153._0_4_ =
                 fVar232 * (float)local_160._0_4_ +
                 fVar280 * (float)local_180._0_4_ +
                 fVar261 * (float)local_480._0_4_ + (float)local_c0._0_4_ * fVar191;
            auVar153._4_4_ =
                 fVar236 * (float)local_160._4_4_ +
                 fVar327 * (float)local_180._4_4_ +
                 fVar333 * (float)local_480._4_4_ + (float)local_c0._4_4_ * fVar206;
            auVar153._8_4_ =
                 fVar240 * fStack_158 +
                 fVar298 * fStack_178 + fVar162 * fStack_478 + fStack_b8 * fVar208;
            auVar153._12_4_ =
                 fVar141 * fStack_154 +
                 fVar372 * fStack_174 + fVar334 * fStack_474 + fStack_b4 * fVar243;
            auVar153._16_4_ =
                 fVar163 * fStack_150 +
                 fVar207 * fStack_170 + fVar264 * fStack_470 + fStack_b0 * fVar244;
            auVar153._20_4_ =
                 fVar176 * fStack_14c +
                 fVar209 * fStack_16c + fVar336 * fStack_46c + fStack_ac * fVar245;
            auVar153._24_4_ =
                 fVar177 * fStack_148 +
                 fVar217 * fStack_168 + fVar335 * fStack_468 + fStack_a8 * fVar332;
            auVar153._28_4_ = auVar146._28_4_ + pfVar5[7] + pfVar4[7] + pfVar3[7];
            auVar23 = vblendvps_avx(auVar172,_local_3a0,auVar21);
            auVar146 = vandps_avx(auVar312,auVar255);
            auVar21 = vandps_avx(auVar342,auVar255);
            auVar24 = vmaxps_avx(auVar146,auVar21);
            auVar146 = vandps_avx(auVar153,auVar255);
            auVar146 = vmaxps_avx(auVar24,auVar146);
            local_660._0_4_ = auVar126._0_4_;
            local_660._4_4_ = auVar126._4_4_;
            fStack_658 = auVar126._8_4_;
            fStack_654 = auVar126._12_4_;
            auStack_650._0_4_ = auVar126._16_4_;
            auStack_650._4_4_ = auVar126._20_4_;
            fStack_648 = auVar126._24_4_;
            auVar21 = vcmpps_avx(auVar146,_local_4a0,1);
            auVar146 = vblendvps_avx(auVar312,auVar20,auVar21);
            auVar154._0_4_ =
                 (float)local_160._0_4_ * (float)local_660._0_4_ +
                 (float)local_180._0_4_ * (float)local_680._0_4_ +
                 (float)local_c0._0_4_ * fVar305 + (float)local_480._0_4_ * fVar142;
            auVar154._4_4_ =
                 (float)local_160._4_4_ * (float)local_660._4_4_ +
                 (float)local_180._4_4_ * (float)local_680._4_4_ +
                 (float)local_c0._4_4_ * fVar213 + (float)local_480._4_4_ * fVar157;
            auVar154._8_4_ =
                 fStack_158 * fStack_658 +
                 fStack_178 * fStack_678 + fStack_b8 * fVar328 + fStack_478 * fVar159;
            auVar154._12_4_ =
                 fStack_154 * fStack_654 +
                 fStack_174 * fStack_674 + fStack_b4 * fVar306 + fStack_474 * fVar160;
            auVar154._16_4_ =
                 fStack_150 * (float)auStack_650._0_4_ +
                 fStack_170 * (float)auStack_670._0_4_ + fStack_b0 * fVar307 + fStack_470 * fVar161;
            auVar154._20_4_ =
                 fStack_14c * (float)auStack_650._4_4_ +
                 fStack_16c * (float)auStack_670._4_4_ + fStack_ac * fVar215 + fStack_46c * fVar370;
            auVar154._24_4_ =
                 fStack_148 * fStack_648 +
                 fStack_168 * fStack_668 + fStack_a8 * fVar179 + fStack_468 * fVar371;
            auVar154._28_4_ = auVar24._28_4_ + fStack_504 + auVar301._28_4_ + 0.0;
            auVar20 = vblendvps_avx(auVar342,_local_3a0,auVar21);
            fVar236 = auVar22._0_4_;
            fVar240 = auVar22._4_4_;
            fVar141 = auVar22._8_4_;
            fVar163 = auVar22._12_4_;
            fVar176 = auVar22._16_4_;
            fVar177 = auVar22._20_4_;
            fVar178 = auVar22._24_4_;
            fVar218 = auVar22._28_4_;
            fVar327 = auVar146._0_4_;
            fVar305 = auVar146._4_4_;
            fVar328 = auVar146._8_4_;
            fVar307 = auVar146._12_4_;
            fVar179 = auVar146._16_4_;
            fVar157 = auVar146._20_4_;
            fVar160 = auVar146._24_4_;
            fVar191 = auVar23._0_4_;
            fVar208 = auVar23._4_4_;
            fVar244 = auVar23._8_4_;
            fVar332 = auVar23._12_4_;
            fVar333 = auVar23._16_4_;
            fVar334 = auVar23._20_4_;
            fVar336 = auVar23._24_4_;
            auVar324._0_4_ = fVar191 * fVar191 + fVar236 * fVar236;
            auVar324._4_4_ = fVar208 * fVar208 + fVar240 * fVar240;
            auVar324._8_4_ = fVar244 * fVar244 + fVar141 * fVar141;
            auVar324._12_4_ = fVar332 * fVar332 + fVar163 * fVar163;
            auVar324._16_4_ = fVar333 * fVar333 + fVar176 * fVar176;
            auVar324._20_4_ = fVar334 * fVar334 + fVar177 * fVar177;
            auVar324._24_4_ = fVar336 * fVar336 + fVar178 * fVar178;
            auVar324._28_4_ = fStack_c4 + local_3a0._28_4_;
            auVar21 = vrsqrtps_avx(auVar324);
            fVar206 = auVar21._0_4_;
            fVar243 = auVar21._4_4_;
            auVar72._4_4_ = fVar243 * 1.5;
            auVar72._0_4_ = fVar206 * 1.5;
            fVar245 = auVar21._8_4_;
            auVar72._8_4_ = fVar245 * 1.5;
            fVar261 = auVar21._12_4_;
            auVar72._12_4_ = fVar261 * 1.5;
            fVar162 = auVar21._16_4_;
            auVar72._16_4_ = fVar162 * 1.5;
            fVar264 = auVar21._20_4_;
            auVar72._20_4_ = fVar264 * 1.5;
            fVar335 = auVar21._24_4_;
            auVar72._24_4_ = fVar335 * 1.5;
            auVar72._28_4_ = auVar342._28_4_;
            auVar73._4_4_ = fVar243 * fVar243 * fVar243 * auVar324._4_4_ * 0.5;
            auVar73._0_4_ = fVar206 * fVar206 * fVar206 * auVar324._0_4_ * 0.5;
            auVar73._8_4_ = fVar245 * fVar245 * fVar245 * auVar324._8_4_ * 0.5;
            auVar73._12_4_ = fVar261 * fVar261 * fVar261 * auVar324._12_4_ * 0.5;
            auVar73._16_4_ = fVar162 * fVar162 * fVar162 * auVar324._16_4_ * 0.5;
            auVar73._20_4_ = fVar264 * fVar264 * fVar264 * auVar324._20_4_ * 0.5;
            auVar73._24_4_ = fVar335 * fVar335 * fVar335 * auVar324._24_4_ * 0.5;
            auVar73._28_4_ = auVar324._28_4_;
            auVar22 = vsubps_avx(auVar72,auVar73);
            fVar370 = auVar22._0_4_;
            fVar371 = auVar22._4_4_;
            fVar372 = auVar22._8_4_;
            fVar207 = auVar22._12_4_;
            fVar209 = auVar22._16_4_;
            fVar217 = auVar22._20_4_;
            fVar232 = auVar22._24_4_;
            fVar206 = auVar20._0_4_;
            fVar243 = auVar20._4_4_;
            fVar245 = auVar20._8_4_;
            fVar261 = auVar20._12_4_;
            fVar162 = auVar20._16_4_;
            fVar264 = auVar20._20_4_;
            fVar335 = auVar20._24_4_;
            auVar303._0_4_ = fVar206 * fVar206 + fVar327 * fVar327;
            auVar303._4_4_ = fVar243 * fVar243 + fVar305 * fVar305;
            auVar303._8_4_ = fVar245 * fVar245 + fVar328 * fVar328;
            auVar303._12_4_ = fVar261 * fVar261 + fVar307 * fVar307;
            auVar303._16_4_ = fVar162 * fVar162 + fVar179 * fVar179;
            auVar303._20_4_ = fVar264 * fVar264 + fVar157 * fVar157;
            auVar303._24_4_ = fVar335 * fVar335 + fVar160 * fVar160;
            auVar303._28_4_ = auVar21._28_4_ + auVar146._28_4_;
            auVar146 = vrsqrtps_avx(auVar303);
            fVar280 = auVar146._0_4_;
            fVar298 = auVar146._4_4_;
            auVar74._4_4_ = fVar298 * 1.5;
            auVar74._0_4_ = fVar280 * 1.5;
            fVar213 = auVar146._8_4_;
            auVar74._8_4_ = fVar213 * 1.5;
            fVar306 = auVar146._12_4_;
            auVar74._12_4_ = fVar306 * 1.5;
            fVar215 = auVar146._16_4_;
            auVar74._16_4_ = fVar215 * 1.5;
            fVar142 = auVar146._20_4_;
            auVar74._20_4_ = fVar142 * 1.5;
            fVar159 = auVar146._24_4_;
            auVar74._24_4_ = fVar159 * 1.5;
            auVar74._28_4_ = auVar342._28_4_;
            auVar75._4_4_ = fVar298 * fVar298 * fVar298 * auVar303._4_4_ * 0.5;
            auVar75._0_4_ = fVar280 * fVar280 * fVar280 * auVar303._0_4_ * 0.5;
            auVar75._8_4_ = fVar213 * fVar213 * fVar213 * auVar303._8_4_ * 0.5;
            auVar75._12_4_ = fVar306 * fVar306 * fVar306 * auVar303._12_4_ * 0.5;
            auVar75._16_4_ = fVar215 * fVar215 * fVar215 * auVar303._16_4_ * 0.5;
            auVar75._20_4_ = fVar142 * fVar142 * fVar142 * auVar303._20_4_ * 0.5;
            auVar75._24_4_ = fVar159 * fVar159 * fVar159 * auVar303._24_4_ * 0.5;
            auVar75._28_4_ = auVar303._28_4_;
            auVar20 = vsubps_avx(auVar74,auVar75);
            fVar298 = auVar20._0_4_;
            fVar213 = auVar20._4_4_;
            fVar306 = auVar20._8_4_;
            fVar215 = auVar20._12_4_;
            fVar142 = auVar20._16_4_;
            fVar159 = auVar20._20_4_;
            fVar161 = auVar20._24_4_;
            fVar191 = fVar143 * fVar370 * fVar191;
            fVar208 = fVar158 * fVar371 * fVar208;
            auVar76._4_4_ = fVar208;
            auVar76._0_4_ = fVar191;
            fVar244 = fStack_738 * fVar372 * fVar244;
            auVar76._8_4_ = fVar244;
            fVar332 = fStack_734 * fVar207 * fVar332;
            auVar76._12_4_ = fVar332;
            fVar333 = fStack_730 * fVar209 * fVar333;
            auVar76._16_4_ = fVar333;
            fVar334 = fStack_72c * fVar217 * fVar334;
            auVar76._20_4_ = fVar334;
            fVar336 = fStack_728 * fVar232 * fVar336;
            auVar76._24_4_ = fVar336;
            auVar76._28_4_ = auVar146._28_4_;
            local_660._4_4_ = fVar208 + auVar363._4_4_;
            local_660._0_4_ = fVar191 + auVar363._0_4_;
            fStack_658 = fVar244 + auVar363._8_4_;
            fStack_654 = fVar332 + auVar363._12_4_;
            auStack_650._0_4_ = fVar333 + auVar363._16_4_;
            auStack_650._4_4_ = fVar334 + auVar363._20_4_;
            fStack_648 = fVar336 + auVar363._24_4_;
            fStack_644 = auVar146._28_4_ + auVar363._28_4_;
            fVar333 = fVar143 * fVar370 * -fVar236;
            fVar334 = fVar158 * fVar371 * -fVar240;
            auVar77._4_4_ = fVar334;
            auVar77._0_4_ = fVar333;
            fVar336 = fStack_738 * fVar372 * -fVar141;
            auVar77._8_4_ = fVar336;
            fVar280 = fStack_734 * fVar207 * -fVar163;
            auVar77._12_4_ = fVar280;
            fStack_5d0 = fStack_730 * fVar209 * -fVar176;
            auVar77._16_4_ = fStack_5d0;
            fStack_5cc = fStack_72c * fVar217 * -fVar177;
            auVar77._20_4_ = fStack_5cc;
            fStack_5c8 = fStack_728 * fVar232 * -fVar178;
            auVar77._24_4_ = fStack_5c8;
            auVar77._28_4_ = -fVar218;
            fStack_5d0 = local_780._16_4_ + fStack_5d0;
            fStack_5cc = local_780._20_4_ + fStack_5cc;
            fStack_5c8 = local_780._24_4_ + fStack_5c8;
            fStack_5c4 = local_780._28_4_ + -fVar218;
            fVar191 = fVar370 * 0.0 * fVar143;
            fVar208 = fVar371 * 0.0 * fVar158;
            auVar78._4_4_ = fVar208;
            auVar78._0_4_ = fVar191;
            fVar244 = fVar372 * 0.0 * fStack_738;
            auVar78._8_4_ = fVar244;
            fVar332 = fVar207 * 0.0 * fStack_734;
            auVar78._12_4_ = fVar332;
            fVar370 = fVar209 * 0.0 * fStack_730;
            auVar78._16_4_ = fVar370;
            fVar371 = fVar217 * 0.0 * fStack_72c;
            auVar78._20_4_ = fVar371;
            fVar372 = fVar232 * 0.0 * fStack_728;
            auVar78._24_4_ = fVar372;
            auVar78._28_4_ = fVar218;
            auVar25 = vsubps_avx(auVar363,auVar76);
            auVar375._0_4_ = fVar191 + auVar154._0_4_;
            auVar375._4_4_ = fVar208 + auVar154._4_4_;
            auVar375._8_4_ = fVar244 + auVar154._8_4_;
            auVar375._12_4_ = fVar332 + auVar154._12_4_;
            auVar375._16_4_ = fVar370 + auVar154._16_4_;
            auVar375._20_4_ = fVar371 + auVar154._20_4_;
            auVar375._24_4_ = fVar372 + auVar154._24_4_;
            auVar375._28_4_ = fVar218 + auVar154._28_4_;
            fVar191 = auVar350._0_4_ * fVar298 * fVar206;
            fVar206 = auVar350._4_4_ * fVar213 * fVar243;
            auVar79._4_4_ = fVar206;
            auVar79._0_4_ = fVar191;
            fVar208 = auVar350._8_4_ * fVar306 * fVar245;
            auVar79._8_4_ = fVar208;
            fVar243 = auVar350._12_4_ * fVar215 * fVar261;
            auVar79._12_4_ = fVar243;
            fVar244 = auVar350._16_4_ * fVar142 * fVar162;
            auVar79._16_4_ = fVar244;
            fVar245 = auVar350._20_4_ * fVar159 * fVar264;
            auVar79._20_4_ = fVar245;
            fVar332 = auVar350._24_4_ * fVar161 * fVar335;
            auVar79._24_4_ = fVar332;
            auVar79._28_4_ = fStack_724;
            auVar147 = vsubps_avx(local_780,auVar77);
            auVar352._0_4_ = auVar274._0_4_ + fVar191;
            auVar352._4_4_ = auVar274._4_4_ + fVar206;
            auVar352._8_4_ = auVar274._8_4_ + fVar208;
            auVar352._12_4_ = auVar274._12_4_ + fVar243;
            auVar352._16_4_ = auVar274._16_4_ + fVar244;
            auVar352._20_4_ = auVar274._20_4_ + fVar245;
            auVar352._24_4_ = auVar274._24_4_ + fVar332;
            auVar352._28_4_ = auVar274._28_4_ + fStack_724;
            fVar191 = fVar298 * -fVar327 * auVar350._0_4_;
            fVar206 = fVar213 * -fVar305 * auVar350._4_4_;
            auVar80._4_4_ = fVar206;
            auVar80._0_4_ = fVar191;
            fVar208 = fVar306 * -fVar328 * auVar350._8_4_;
            auVar80._8_4_ = fVar208;
            fVar243 = fVar215 * -fVar307 * auVar350._12_4_;
            auVar80._12_4_ = fVar243;
            fVar244 = fVar142 * -fVar179 * auVar350._16_4_;
            auVar80._16_4_ = fVar244;
            fVar245 = fVar159 * -fVar157 * auVar350._20_4_;
            auVar80._20_4_ = fVar245;
            fVar332 = fVar161 * -fVar160 * auVar350._24_4_;
            auVar80._24_4_ = fVar332;
            auVar80._28_4_ = auVar363._28_4_;
            auVar148 = vsubps_avx(auVar154,auVar78);
            auVar228._0_4_ = (float)local_560._0_4_ + fVar191;
            auVar228._4_4_ = local_560._4_4_ + fVar206;
            auVar228._8_4_ = local_560._8_4_ + fVar208;
            auVar228._12_4_ = local_560._12_4_ + fVar243;
            auVar228._16_4_ = local_560._16_4_ + fVar244;
            auVar228._20_4_ = local_560._20_4_ + fVar245;
            auVar228._24_4_ = local_560._24_4_ + fVar332;
            auVar228._28_4_ = local_560._28_4_ + auVar363._28_4_;
            fVar191 = fVar298 * 0.0 * auVar350._0_4_;
            fVar206 = fVar213 * 0.0 * auVar350._4_4_;
            auVar81._4_4_ = fVar206;
            auVar81._0_4_ = fVar191;
            fVar208 = fVar306 * 0.0 * auVar350._8_4_;
            auVar81._8_4_ = fVar208;
            fVar243 = fVar215 * 0.0 * auVar350._12_4_;
            auVar81._12_4_ = fVar243;
            fVar244 = fVar142 * 0.0 * auVar350._16_4_;
            auVar81._16_4_ = fVar244;
            fVar245 = fVar159 * 0.0 * auVar350._20_4_;
            auVar81._20_4_ = fVar245;
            fVar332 = fVar161 * 0.0 * auVar350._24_4_;
            auVar81._24_4_ = fVar332;
            auVar81._28_4_ = auVar154._28_4_;
            auVar146 = vsubps_avx(auVar274,auVar79);
            auVar313._0_4_ = (float)local_520._0_4_ + fVar191;
            auVar313._4_4_ = (float)local_520._4_4_ + fVar206;
            auVar313._8_4_ = fStack_518 + fVar208;
            auVar313._12_4_ = fStack_514 + fVar243;
            auVar313._16_4_ = fStack_510 + fVar244;
            auVar313._20_4_ = fStack_50c + fVar245;
            auVar313._24_4_ = fStack_508 + fVar332;
            auVar313._28_4_ = fStack_504 + auVar154._28_4_;
            auVar21 = vsubps_avx(local_560,auVar80);
            auVar22 = vsubps_avx(_local_520,auVar81);
            auVar23 = vsubps_avx(auVar228,auVar147);
            auVar24 = vsubps_avx(auVar313,auVar148);
            auVar82._4_4_ = auVar148._4_4_ * auVar23._4_4_;
            auVar82._0_4_ = auVar148._0_4_ * auVar23._0_4_;
            auVar82._8_4_ = auVar148._8_4_ * auVar23._8_4_;
            auVar82._12_4_ = auVar148._12_4_ * auVar23._12_4_;
            auVar82._16_4_ = auVar148._16_4_ * auVar23._16_4_;
            auVar82._20_4_ = auVar148._20_4_ * auVar23._20_4_;
            auVar82._24_4_ = auVar148._24_4_ * auVar23._24_4_;
            auVar82._28_4_ = auVar342._28_4_;
            auVar83._4_4_ = auVar147._4_4_ * auVar24._4_4_;
            auVar83._0_4_ = auVar147._0_4_ * auVar24._0_4_;
            auVar83._8_4_ = auVar147._8_4_ * auVar24._8_4_;
            auVar83._12_4_ = auVar147._12_4_ * auVar24._12_4_;
            auVar83._16_4_ = auVar147._16_4_ * auVar24._16_4_;
            auVar83._20_4_ = auVar147._20_4_ * auVar24._20_4_;
            auVar83._24_4_ = auVar147._24_4_ * auVar24._24_4_;
            auVar83._28_4_ = fStack_504;
            auVar26 = vsubps_avx(auVar83,auVar82);
            auVar84._4_4_ = auVar25._4_4_ * auVar24._4_4_;
            auVar84._0_4_ = auVar25._0_4_ * auVar24._0_4_;
            auVar84._8_4_ = auVar25._8_4_ * auVar24._8_4_;
            auVar84._12_4_ = auVar25._12_4_ * auVar24._12_4_;
            auVar84._16_4_ = auVar25._16_4_ * auVar24._16_4_;
            auVar84._20_4_ = auVar25._20_4_ * auVar24._20_4_;
            auVar84._24_4_ = auVar25._24_4_ * auVar24._24_4_;
            auVar84._28_4_ = auVar24._28_4_;
            auVar24 = vsubps_avx(auVar352,auVar25);
            auVar85._4_4_ = auVar148._4_4_ * auVar24._4_4_;
            auVar85._0_4_ = auVar148._0_4_ * auVar24._0_4_;
            auVar85._8_4_ = auVar148._8_4_ * auVar24._8_4_;
            auVar85._12_4_ = auVar148._12_4_ * auVar24._12_4_;
            auVar85._16_4_ = auVar148._16_4_ * auVar24._16_4_;
            auVar85._20_4_ = auVar148._20_4_ * auVar24._20_4_;
            auVar85._24_4_ = auVar148._24_4_ * auVar24._24_4_;
            auVar85._28_4_ = auVar20._28_4_;
            auVar27 = vsubps_avx(auVar85,auVar84);
            auVar86._4_4_ = auVar147._4_4_ * auVar24._4_4_;
            auVar86._0_4_ = auVar147._0_4_ * auVar24._0_4_;
            auVar86._8_4_ = auVar147._8_4_ * auVar24._8_4_;
            auVar86._12_4_ = auVar147._12_4_ * auVar24._12_4_;
            auVar86._16_4_ = auVar147._16_4_ * auVar24._16_4_;
            auVar86._20_4_ = auVar147._20_4_ * auVar24._20_4_;
            auVar86._24_4_ = auVar147._24_4_ * auVar24._24_4_;
            auVar86._28_4_ = auVar20._28_4_;
            auVar87._4_4_ = auVar25._4_4_ * auVar23._4_4_;
            auVar87._0_4_ = auVar25._0_4_ * auVar23._0_4_;
            auVar87._8_4_ = auVar25._8_4_ * auVar23._8_4_;
            auVar87._12_4_ = auVar25._12_4_ * auVar23._12_4_;
            auVar87._16_4_ = auVar25._16_4_ * auVar23._16_4_;
            auVar87._20_4_ = auVar25._20_4_ * auVar23._20_4_;
            auVar87._24_4_ = auVar25._24_4_ * auVar23._24_4_;
            auVar87._28_4_ = auVar23._28_4_;
            auVar20 = vsubps_avx(auVar87,auVar86);
            auVar173._0_4_ = auVar26._0_4_ * 0.0 + auVar20._0_4_ + auVar27._0_4_ * 0.0;
            auVar173._4_4_ = auVar26._4_4_ * 0.0 + auVar20._4_4_ + auVar27._4_4_ * 0.0;
            auVar173._8_4_ = auVar26._8_4_ * 0.0 + auVar20._8_4_ + auVar27._8_4_ * 0.0;
            auVar173._12_4_ = auVar26._12_4_ * 0.0 + auVar20._12_4_ + auVar27._12_4_ * 0.0;
            auVar173._16_4_ = auVar26._16_4_ * 0.0 + auVar20._16_4_ + auVar27._16_4_ * 0.0;
            auVar173._20_4_ = auVar26._20_4_ * 0.0 + auVar20._20_4_ + auVar27._20_4_ * 0.0;
            auVar173._24_4_ = auVar26._24_4_ * 0.0 + auVar20._24_4_ + auVar27._24_4_ * 0.0;
            auVar173._28_4_ = auVar26._28_4_ + auVar20._28_4_ + auVar27._28_4_;
            auVar19 = vcmpps_avx(auVar173,ZEXT832(0) << 0x20,2);
            auVar20 = vblendvps_avx(auVar146,_local_660,auVar19);
            auVar205 = ZEXT3264(auVar20);
            auVar121._4_4_ = local_780._4_4_ + fVar334;
            auVar121._0_4_ = (float)local_780._0_4_ + fVar333;
            auVar121._8_4_ = local_780._8_4_ + fVar336;
            auVar121._12_4_ = local_780._12_4_ + fVar280;
            auVar121._16_4_ = fStack_5d0;
            auVar121._20_4_ = fStack_5cc;
            auVar121._24_4_ = fStack_5c8;
            auVar121._28_4_ = fStack_5c4;
            auVar146 = vblendvps_avx(auVar21,auVar121,auVar19);
            auVar21 = vblendvps_avx(auVar22,auVar375,auVar19);
            auVar22 = vblendvps_avx(auVar25,auVar352,auVar19);
            auVar23 = vblendvps_avx(auVar147,auVar228,auVar19);
            auVar24 = vblendvps_avx(auVar148,auVar313,auVar19);
            auVar25 = vblendvps_avx(auVar352,auVar25,auVar19);
            auVar26 = vblendvps_avx(auVar228,auVar147,auVar19);
            auVar27 = vblendvps_avx(auVar313,auVar148,auVar19);
            local_780 = vandps_avx(auVar301,_local_380);
            auVar25 = vsubps_avx(auVar25,auVar20);
            auVar167 = vsubps_avx(auVar26,auVar146);
            auVar27 = vsubps_avx(auVar27,auVar21);
            auVar168 = vsubps_avx(auVar146,auVar23);
            fVar191 = auVar167._0_4_;
            fVar246 = auVar21._0_4_;
            fVar261 = auVar167._4_4_;
            fVar180 = auVar21._4_4_;
            auVar88._4_4_ = fVar180 * fVar261;
            auVar88._0_4_ = fVar246 * fVar191;
            fVar280 = auVar167._8_4_;
            fVar281 = auVar21._8_4_;
            auVar88._8_4_ = fVar281 * fVar280;
            fVar307 = auVar167._12_4_;
            fVar293 = auVar21._12_4_;
            auVar88._12_4_ = fVar293 * fVar307;
            fVar161 = auVar167._16_4_;
            fVar294 = auVar21._16_4_;
            auVar88._16_4_ = fVar294 * fVar161;
            fVar232 = auVar167._20_4_;
            fVar295 = auVar21._20_4_;
            auVar88._20_4_ = fVar295 * fVar232;
            fVar178 = auVar167._24_4_;
            fVar296 = auVar21._24_4_;
            auVar88._24_4_ = fVar296 * fVar178;
            auVar88._28_4_ = auVar26._28_4_;
            fVar206 = auVar146._0_4_;
            fVar308 = auVar27._0_4_;
            fVar333 = auVar146._4_4_;
            fVar314 = auVar27._4_4_;
            auVar89._4_4_ = fVar314 * fVar333;
            auVar89._0_4_ = fVar308 * fVar206;
            fVar327 = auVar146._8_4_;
            fVar315 = auVar27._8_4_;
            auVar89._8_4_ = fVar315 * fVar327;
            fVar215 = auVar146._12_4_;
            fVar316 = auVar27._12_4_;
            auVar89._12_4_ = fVar316 * fVar215;
            fVar370 = auVar146._16_4_;
            fVar317 = auVar27._16_4_;
            auVar89._16_4_ = fVar317 * fVar370;
            fVar236 = auVar146._20_4_;
            fVar318 = auVar27._20_4_;
            auVar89._20_4_ = fVar318 * fVar236;
            fVar218 = auVar146._24_4_;
            fVar319 = auVar27._24_4_;
            uVar7 = auVar147._28_4_;
            auVar89._24_4_ = fVar319 * fVar218;
            auVar89._28_4_ = uVar7;
            auVar26 = vsubps_avx(auVar89,auVar88);
            fVar208 = auVar20._0_4_;
            fVar162 = auVar20._4_4_;
            auVar90._4_4_ = fVar314 * fVar162;
            auVar90._0_4_ = fVar308 * fVar208;
            fVar298 = auVar20._8_4_;
            auVar90._8_4_ = fVar315 * fVar298;
            fVar179 = auVar20._12_4_;
            auVar90._12_4_ = fVar316 * fVar179;
            fVar371 = auVar20._16_4_;
            auVar90._16_4_ = fVar317 * fVar371;
            fVar240 = auVar20._20_4_;
            auVar90._20_4_ = fVar318 * fVar240;
            fVar233 = auVar20._24_4_;
            auVar90._24_4_ = fVar319 * fVar233;
            auVar90._28_4_ = uVar7;
            fVar243 = auVar25._0_4_;
            fVar334 = auVar25._4_4_;
            auVar91._4_4_ = fVar180 * fVar334;
            auVar91._0_4_ = fVar246 * fVar243;
            fVar305 = auVar25._8_4_;
            auVar91._8_4_ = fVar281 * fVar305;
            fVar142 = auVar25._12_4_;
            auVar91._12_4_ = fVar293 * fVar142;
            fVar372 = auVar25._16_4_;
            auVar91._16_4_ = fVar294 * fVar372;
            fVar141 = auVar25._20_4_;
            auVar91._20_4_ = fVar295 * fVar141;
            fVar237 = auVar25._24_4_;
            auVar91._24_4_ = fVar296 * fVar237;
            auVar91._28_4_ = auVar352._28_4_;
            auVar147 = vsubps_avx(auVar91,auVar90);
            auVar92._4_4_ = fVar333 * fVar334;
            auVar92._0_4_ = fVar206 * fVar243;
            auVar92._8_4_ = fVar327 * fVar305;
            auVar92._12_4_ = fVar215 * fVar142;
            auVar92._16_4_ = fVar370 * fVar372;
            auVar92._20_4_ = fVar236 * fVar141;
            auVar92._24_4_ = fVar218 * fVar237;
            auVar92._28_4_ = uVar7;
            auVar93._4_4_ = fVar162 * fVar261;
            auVar93._0_4_ = fVar208 * fVar191;
            auVar93._8_4_ = fVar298 * fVar280;
            auVar93._12_4_ = fVar179 * fVar307;
            auVar93._16_4_ = fVar371 * fVar161;
            auVar93._20_4_ = fVar240 * fVar232;
            auVar93._24_4_ = fVar233 * fVar178;
            auVar93._28_4_ = auVar148._28_4_;
            auVar148 = vsubps_avx(auVar93,auVar92);
            auVar169 = vsubps_avx(auVar21,auVar24);
            fVar245 = auVar148._28_4_ + auVar147._28_4_;
            auVar325._0_4_ = auVar148._0_4_ + auVar147._0_4_ * 0.0 + auVar26._0_4_ * 0.0;
            auVar325._4_4_ = auVar148._4_4_ + auVar147._4_4_ * 0.0 + auVar26._4_4_ * 0.0;
            auVar325._8_4_ = auVar148._8_4_ + auVar147._8_4_ * 0.0 + auVar26._8_4_ * 0.0;
            auVar325._12_4_ = auVar148._12_4_ + auVar147._12_4_ * 0.0 + auVar26._12_4_ * 0.0;
            auVar325._16_4_ = auVar148._16_4_ + auVar147._16_4_ * 0.0 + auVar26._16_4_ * 0.0;
            auVar325._20_4_ = auVar148._20_4_ + auVar147._20_4_ * 0.0 + auVar26._20_4_ * 0.0;
            auVar325._24_4_ = auVar148._24_4_ + auVar147._24_4_ * 0.0 + auVar26._24_4_ * 0.0;
            auVar325._28_4_ = fVar245 + auVar26._28_4_;
            fVar244 = auVar168._0_4_;
            fVar264 = auVar168._4_4_;
            auVar94._4_4_ = auVar24._4_4_ * fVar264;
            auVar94._0_4_ = auVar24._0_4_ * fVar244;
            fVar213 = auVar168._8_4_;
            auVar94._8_4_ = auVar24._8_4_ * fVar213;
            fVar157 = auVar168._12_4_;
            auVar94._12_4_ = auVar24._12_4_ * fVar157;
            fVar207 = auVar168._16_4_;
            auVar94._16_4_ = auVar24._16_4_ * fVar207;
            fVar163 = auVar168._20_4_;
            auVar94._20_4_ = auVar24._20_4_ * fVar163;
            fVar241 = auVar168._24_4_;
            auVar94._24_4_ = auVar24._24_4_ * fVar241;
            auVar94._28_4_ = fVar245;
            fVar245 = auVar169._0_4_;
            fVar336 = auVar169._4_4_;
            auVar95._4_4_ = auVar23._4_4_ * fVar336;
            auVar95._0_4_ = auVar23._0_4_ * fVar245;
            fVar328 = auVar169._8_4_;
            auVar95._8_4_ = auVar23._8_4_ * fVar328;
            fVar159 = auVar169._12_4_;
            auVar95._12_4_ = auVar23._12_4_ * fVar159;
            fVar209 = auVar169._16_4_;
            auVar95._16_4_ = auVar23._16_4_ * fVar209;
            fVar176 = auVar169._20_4_;
            auVar95._20_4_ = auVar23._20_4_ * fVar176;
            fVar248 = auVar169._24_4_;
            auVar95._24_4_ = auVar23._24_4_ * fVar248;
            auVar95._28_4_ = auVar148._28_4_;
            auVar147 = vsubps_avx(auVar95,auVar94);
            auVar148 = vsubps_avx(auVar20,auVar22);
            fVar332 = auVar148._0_4_;
            fVar335 = auVar148._4_4_;
            auVar96._4_4_ = auVar24._4_4_ * fVar335;
            auVar96._0_4_ = auVar24._0_4_ * fVar332;
            fVar306 = auVar148._8_4_;
            auVar96._8_4_ = auVar24._8_4_ * fVar306;
            fVar160 = auVar148._12_4_;
            auVar96._12_4_ = auVar24._12_4_ * fVar160;
            fVar217 = auVar148._16_4_;
            auVar96._16_4_ = auVar24._16_4_ * fVar217;
            fVar177 = auVar148._20_4_;
            auVar96._20_4_ = auVar24._20_4_ * fVar177;
            fVar257 = auVar148._24_4_;
            auVar96._24_4_ = auVar24._24_4_ * fVar257;
            auVar96._28_4_ = auVar24._28_4_;
            auVar97._4_4_ = fVar336 * auVar22._4_4_;
            auVar97._0_4_ = fVar245 * auVar22._0_4_;
            auVar97._8_4_ = fVar328 * auVar22._8_4_;
            auVar97._12_4_ = fVar159 * auVar22._12_4_;
            auVar97._16_4_ = fVar209 * auVar22._16_4_;
            auVar97._20_4_ = fVar176 * auVar22._20_4_;
            auVar97._24_4_ = fVar248 * auVar22._24_4_;
            auVar97._28_4_ = auVar26._28_4_;
            auVar24 = vsubps_avx(auVar96,auVar97);
            auVar98._4_4_ = auVar23._4_4_ * fVar335;
            auVar98._0_4_ = auVar23._0_4_ * fVar332;
            auVar98._8_4_ = auVar23._8_4_ * fVar306;
            auVar98._12_4_ = auVar23._12_4_ * fVar160;
            auVar98._16_4_ = auVar23._16_4_ * fVar217;
            auVar98._20_4_ = auVar23._20_4_ * fVar177;
            auVar98._24_4_ = auVar23._24_4_ * fVar257;
            auVar98._28_4_ = auVar23._28_4_;
            auVar99._4_4_ = fVar264 * auVar22._4_4_;
            auVar99._0_4_ = fVar244 * auVar22._0_4_;
            auVar99._8_4_ = fVar213 * auVar22._8_4_;
            auVar99._12_4_ = fVar157 * auVar22._12_4_;
            auVar99._16_4_ = fVar207 * auVar22._16_4_;
            auVar99._20_4_ = fVar163 * auVar22._20_4_;
            auVar99._24_4_ = fVar241 * auVar22._24_4_;
            auVar99._28_4_ = auVar22._28_4_;
            auVar22 = vsubps_avx(auVar99,auVar98);
            auVar155._0_4_ = auVar147._0_4_ * 0.0 + auVar22._0_4_ + auVar24._0_4_ * 0.0;
            auVar155._4_4_ = auVar147._4_4_ * 0.0 + auVar22._4_4_ + auVar24._4_4_ * 0.0;
            auVar155._8_4_ = auVar147._8_4_ * 0.0 + auVar22._8_4_ + auVar24._8_4_ * 0.0;
            auVar155._12_4_ = auVar147._12_4_ * 0.0 + auVar22._12_4_ + auVar24._12_4_ * 0.0;
            auVar155._16_4_ = auVar147._16_4_ * 0.0 + auVar22._16_4_ + auVar24._16_4_ * 0.0;
            auVar155._20_4_ = auVar147._20_4_ * 0.0 + auVar22._20_4_ + auVar24._20_4_ * 0.0;
            auVar155._24_4_ = auVar147._24_4_ * 0.0 + auVar22._24_4_ + auVar24._24_4_ * 0.0;
            auVar155._28_4_ = auVar24._28_4_ + auVar22._28_4_ + auVar24._28_4_;
            auVar156 = ZEXT3264(auVar155);
            auVar22 = vmaxps_avx(auVar325,auVar155);
            auVar22 = vcmpps_avx(auVar22,ZEXT1232(ZEXT412(0)) << 0x20,2);
            auVar23 = local_780 & auVar22;
            if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar23 >> 0x7f,0) == '\0') &&
                  (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar23 >> 0xbf,0) == '\0') &&
                (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar23[0x1f]) {
LAB_010fddde:
              auVar175._8_8_ = uStack_4d8;
              auVar175._0_8_ = local_4e0;
              auVar175._16_8_ = uStack_4d0;
              auVar175._24_8_ = uStack_4c8;
              auVar276 = ZEXT3264(auVar146);
              auVar326._4_4_ = fVar158;
              auVar326._0_4_ = fVar143;
              auVar326._8_4_ = fStack_738;
              auVar326._12_4_ = fStack_734;
              auVar326._16_4_ = fStack_730;
              auVar326._20_4_ = fStack_72c;
              auVar326._24_4_ = fStack_728;
              auVar326._28_4_ = fStack_724;
            }
            else {
              auVar23 = vandps_avx(auVar22,local_780);
              auVar100._4_4_ = fVar336 * fVar261;
              auVar100._0_4_ = fVar245 * fVar191;
              auVar100._8_4_ = fVar328 * fVar280;
              auVar100._12_4_ = fVar159 * fVar307;
              auVar100._16_4_ = fVar209 * fVar161;
              auVar100._20_4_ = fVar176 * fVar232;
              auVar100._24_4_ = fVar248 * fVar178;
              auVar100._28_4_ = local_780._28_4_;
              auVar101._4_4_ = fVar264 * fVar314;
              auVar101._0_4_ = fVar244 * fVar308;
              auVar101._8_4_ = fVar213 * fVar315;
              auVar101._12_4_ = fVar157 * fVar316;
              auVar101._16_4_ = fVar207 * fVar317;
              auVar101._20_4_ = fVar163 * fVar318;
              auVar101._24_4_ = fVar241 * fVar319;
              auVar101._28_4_ = auVar22._28_4_;
              auVar24 = vsubps_avx(auVar101,auVar100);
              auVar102._4_4_ = fVar335 * fVar314;
              auVar102._0_4_ = fVar332 * fVar308;
              auVar102._8_4_ = fVar306 * fVar315;
              auVar102._12_4_ = fVar160 * fVar316;
              auVar102._16_4_ = fVar217 * fVar317;
              auVar102._20_4_ = fVar177 * fVar318;
              auVar102._24_4_ = fVar257 * fVar319;
              auVar102._28_4_ = auVar27._28_4_;
              auVar103._4_4_ = fVar336 * fVar334;
              auVar103._0_4_ = fVar245 * fVar243;
              auVar103._8_4_ = fVar328 * fVar305;
              auVar103._12_4_ = fVar159 * fVar142;
              auVar103._16_4_ = fVar209 * fVar372;
              auVar103._20_4_ = fVar176 * fVar141;
              auVar103._24_4_ = fVar248 * fVar237;
              auVar103._28_4_ = auVar169._28_4_;
              auVar26 = vsubps_avx(auVar103,auVar102);
              auVar104._4_4_ = fVar264 * fVar334;
              auVar104._0_4_ = fVar244 * fVar243;
              auVar104._8_4_ = fVar213 * fVar305;
              auVar104._12_4_ = fVar157 * fVar142;
              auVar104._16_4_ = fVar207 * fVar372;
              auVar104._20_4_ = fVar163 * fVar141;
              auVar104._24_4_ = fVar241 * fVar237;
              auVar104._28_4_ = auVar25._28_4_;
              auVar105._4_4_ = fVar335 * fVar261;
              auVar105._0_4_ = fVar332 * fVar191;
              auVar105._8_4_ = fVar306 * fVar280;
              auVar105._12_4_ = fVar160 * fVar307;
              auVar105._16_4_ = fVar217 * fVar161;
              auVar105._20_4_ = fVar177 * fVar232;
              auVar105._24_4_ = fVar257 * fVar178;
              auVar105._28_4_ = auVar167._28_4_;
              auVar27 = vsubps_avx(auVar105,auVar104);
              auVar174._0_4_ = auVar24._0_4_ * 0.0 + auVar27._0_4_ + auVar26._0_4_ * 0.0;
              auVar174._4_4_ = auVar24._4_4_ * 0.0 + auVar27._4_4_ + auVar26._4_4_ * 0.0;
              auVar174._8_4_ = auVar24._8_4_ * 0.0 + auVar27._8_4_ + auVar26._8_4_ * 0.0;
              auVar174._12_4_ = auVar24._12_4_ * 0.0 + auVar27._12_4_ + auVar26._12_4_ * 0.0;
              auVar174._16_4_ = auVar24._16_4_ * 0.0 + auVar27._16_4_ + auVar26._16_4_ * 0.0;
              auVar174._20_4_ = auVar24._20_4_ * 0.0 + auVar27._20_4_ + auVar26._20_4_ * 0.0;
              auVar174._24_4_ = auVar24._24_4_ * 0.0 + auVar27._24_4_ + auVar26._24_4_ * 0.0;
              auVar174._28_4_ = auVar167._28_4_ + auVar27._28_4_ + auVar25._28_4_;
              auVar22 = vrcpps_avx(auVar174);
              fVar243 = auVar22._0_4_;
              fVar244 = auVar22._4_4_;
              auVar106._4_4_ = auVar174._4_4_ * fVar244;
              auVar106._0_4_ = auVar174._0_4_ * fVar243;
              fVar245 = auVar22._8_4_;
              auVar106._8_4_ = auVar174._8_4_ * fVar245;
              fVar332 = auVar22._12_4_;
              auVar106._12_4_ = auVar174._12_4_ * fVar332;
              fVar261 = auVar22._16_4_;
              auVar106._16_4_ = auVar174._16_4_ * fVar261;
              fVar334 = auVar22._20_4_;
              auVar106._20_4_ = auVar174._20_4_ * fVar334;
              fVar264 = auVar22._24_4_;
              auVar106._24_4_ = auVar174._24_4_ * fVar264;
              auVar106._28_4_ = auVar169._28_4_;
              auVar343._8_4_ = 0x3f800000;
              auVar343._0_8_ = &DAT_3f8000003f800000;
              auVar343._12_4_ = 0x3f800000;
              auVar343._16_4_ = 0x3f800000;
              auVar343._20_4_ = 0x3f800000;
              auVar343._24_4_ = 0x3f800000;
              auVar343._28_4_ = 0x3f800000;
              auVar22 = vsubps_avx(auVar343,auVar106);
              fVar243 = auVar22._0_4_ * fVar243 + fVar243;
              fVar244 = auVar22._4_4_ * fVar244 + fVar244;
              fVar245 = auVar22._8_4_ * fVar245 + fVar245;
              fVar332 = auVar22._12_4_ * fVar332 + fVar332;
              fVar261 = auVar22._16_4_ * fVar261 + fVar261;
              fVar334 = auVar22._20_4_ * fVar334 + fVar334;
              fVar264 = auVar22._24_4_ * fVar264 + fVar264;
              auVar107._4_4_ =
                   (fVar162 * auVar24._4_4_ + auVar26._4_4_ * fVar333 + auVar27._4_4_ * fVar180) *
                   fVar244;
              auVar107._0_4_ =
                   (fVar208 * auVar24._0_4_ + auVar26._0_4_ * fVar206 + auVar27._0_4_ * fVar246) *
                   fVar243;
              auVar107._8_4_ =
                   (fVar298 * auVar24._8_4_ + auVar26._8_4_ * fVar327 + auVar27._8_4_ * fVar281) *
                   fVar245;
              auVar107._12_4_ =
                   (fVar179 * auVar24._12_4_ + auVar26._12_4_ * fVar215 + auVar27._12_4_ * fVar293)
                   * fVar332;
              auVar107._16_4_ =
                   (fVar371 * auVar24._16_4_ + auVar26._16_4_ * fVar370 + auVar27._16_4_ * fVar294)
                   * fVar261;
              auVar107._20_4_ =
                   (fVar240 * auVar24._20_4_ + auVar26._20_4_ * fVar236 + auVar27._20_4_ * fVar295)
                   * fVar334;
              auVar107._24_4_ =
                   (fVar233 * auVar24._24_4_ + auVar26._24_4_ * fVar218 + auVar27._24_4_ * fVar296)
                   * fVar264;
              auVar107._28_4_ = auVar20._28_4_ + auVar146._28_4_ + auVar21._28_4_;
              auVar205 = ZEXT3264(auVar107);
              fVar191 = local_7d8->tfar;
              auVar229._4_4_ = fVar191;
              auVar229._0_4_ = fVar191;
              auVar229._8_4_ = fVar191;
              auVar229._12_4_ = fVar191;
              auVar229._16_4_ = fVar191;
              auVar229._20_4_ = fVar191;
              auVar229._24_4_ = fVar191;
              auVar229._28_4_ = fVar191;
              auVar146 = vcmpps_avx(local_4c0,auVar107,2);
              auVar20 = vcmpps_avx(auVar107,auVar229,2);
              auVar146 = vandps_avx(auVar146,auVar20);
              auVar21 = auVar23 & auVar146;
              if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar21 >> 0x7f,0) == '\0') &&
                    (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar21 >> 0xbf,0) == '\0') &&
                  (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar21[0x1f]) goto LAB_010fddde;
              auVar146 = vandps_avx(auVar23,auVar146);
              auVar276 = ZEXT3264(auVar146);
              auVar21 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar174,4);
              auVar22 = auVar146 & auVar21;
              auVar175._8_8_ = uStack_4d8;
              auVar175._0_8_ = local_4e0;
              auVar175._16_8_ = uStack_4d0;
              auVar175._24_8_ = uStack_4c8;
              auVar326._4_4_ = fVar158;
              auVar326._0_4_ = fVar143;
              auVar326._8_4_ = fStack_738;
              auVar326._12_4_ = fStack_734;
              auVar326._16_4_ = fStack_730;
              auVar326._20_4_ = fStack_72c;
              auVar326._24_4_ = fStack_728;
              auVar326._28_4_ = fStack_724;
              if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar22 >> 0x7f,0) != '\0') ||
                    (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar22 >> 0xbf,0) != '\0') ||
                  (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar22[0x1f] < '\0') {
                auVar175 = vandps_avx(auVar21,auVar146);
                auVar108._4_4_ = auVar325._4_4_ * fVar244;
                auVar108._0_4_ = auVar325._0_4_ * fVar243;
                auVar108._8_4_ = auVar325._8_4_ * fVar245;
                auVar108._12_4_ = auVar325._12_4_ * fVar332;
                auVar108._16_4_ = auVar325._16_4_ * fVar261;
                auVar108._20_4_ = auVar325._20_4_ * fVar334;
                auVar108._24_4_ = auVar325._24_4_ * fVar264;
                auVar108._28_4_ = auVar20._28_4_;
                auVar109._4_4_ = auVar155._4_4_ * fVar244;
                auVar109._0_4_ = auVar155._0_4_ * fVar243;
                auVar109._8_4_ = auVar155._8_4_ * fVar245;
                auVar109._12_4_ = auVar155._12_4_ * fVar332;
                auVar109._16_4_ = auVar155._16_4_ * fVar261;
                auVar109._20_4_ = auVar155._20_4_ * fVar334;
                auVar109._24_4_ = auVar155._24_4_ * fVar264;
                auVar109._28_4_ = auVar155._28_4_;
                auVar275._8_4_ = 0x3f800000;
                auVar275._0_8_ = &DAT_3f8000003f800000;
                auVar275._12_4_ = 0x3f800000;
                auVar275._16_4_ = 0x3f800000;
                auVar275._20_4_ = 0x3f800000;
                auVar275._24_4_ = 0x3f800000;
                auVar275._28_4_ = 0x3f800000;
                auVar276 = ZEXT3264(auVar275);
                auVar146 = vsubps_avx(auVar275,auVar108);
                local_1c0 = vblendvps_avx(auVar146,auVar108,auVar19);
                auVar146 = vsubps_avx(auVar275,auVar109);
                _local_3e0 = vblendvps_avx(auVar146,auVar109,auVar19);
                auVar156 = ZEXT3264(_local_3e0);
                local_1e0 = auVar107;
              }
            }
            auVar304 = ZEXT3264(local_720);
            pGVar135 = (Geometry *)((ulong)pGVar135 & 0xffffffff);
            fVar217 = (float)local_700._0_4_;
            fVar232 = (float)local_700._4_4_;
            fVar236 = fStack_6f8;
            fVar240 = fStack_6f4;
            fVar191 = fStack_6f0;
            fVar206 = fStack_6ec;
            fVar208 = fStack_6e8;
            if ((((((((auVar175 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar175 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar175 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar175 >> 0x7f,0) != '\0') ||
                  (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar175 >> 0xbf,0) != '\0') ||
                (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar175[0x1f] < '\0') {
              auVar146 = vsubps_avx(auVar350,auVar326);
              auVar205 = ZEXT3264(local_1c0);
              fVar244 = auVar326._0_4_ + auVar146._0_4_ * local_1c0._0_4_;
              fVar245 = auVar326._4_4_ + auVar146._4_4_ * local_1c0._4_4_;
              fVar332 = auVar326._8_4_ + auVar146._8_4_ * local_1c0._8_4_;
              fVar261 = auVar326._12_4_ + auVar146._12_4_ * local_1c0._12_4_;
              fVar333 = auVar326._16_4_ + auVar146._16_4_ * local_1c0._16_4_;
              fVar162 = auVar326._20_4_ + auVar146._20_4_ * local_1c0._20_4_;
              fVar334 = auVar326._24_4_ + auVar146._24_4_ * local_1c0._24_4_;
              fVar264 = auVar326._28_4_ + auVar146._28_4_;
              fVar243 = local_7a8->depth_scale;
              auVar110._4_4_ = (fVar245 + fVar245) * fVar243;
              auVar110._0_4_ = (fVar244 + fVar244) * fVar243;
              auVar110._8_4_ = (fVar332 + fVar332) * fVar243;
              auVar110._12_4_ = (fVar261 + fVar261) * fVar243;
              auVar110._16_4_ = (fVar333 + fVar333) * fVar243;
              auVar110._20_4_ = (fVar162 + fVar162) * fVar243;
              auVar110._24_4_ = (fVar334 + fVar334) * fVar243;
              auVar110._28_4_ = fVar264 + fVar264;
              auVar146 = vcmpps_avx(local_1e0,auVar110,6);
              auVar156 = ZEXT3264(auVar146);
              auVar20 = auVar175 & auVar146;
              if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar20 >> 0x7f,0) != '\0') ||
                    (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar20 >> 0xbf,0) != '\0') ||
                  (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar20[0x1f] < '\0') {
                local_260 = vandps_avx(auVar146,auVar175);
                auVar156 = ZEXT3264(local_260);
                local_300 = (float)local_3e0._0_4_ + (float)local_3e0._0_4_ + -1.0;
                fStack_2fc = (float)local_3e0._4_4_ + (float)local_3e0._4_4_ + -1.0;
                fStack_2f8 = (float)uStack_3d8 + (float)uStack_3d8 + -1.0;
                fStack_2f4 = uStack_3d8._4_4_ + uStack_3d8._4_4_ + -1.0;
                fStack_2f0 = (float)uStack_3d0 + (float)uStack_3d0 + -1.0;
                fStack_2ec = uStack_3d0._4_4_ + uStack_3d0._4_4_ + -1.0;
                fStack_2e8 = (float)uStack_3c8 + (float)uStack_3c8 + -1.0;
                fStack_2e4 = uStack_3c8._4_4_ + uStack_3c8._4_4_ + -1.0;
                local_320 = local_1c0;
                local_2e0 = local_1e0;
                uStack_73c = (undefined4)((ulong)lVar138 >> 0x20);
                local_2c0 = local_740;
                local_2bc = uVar133;
                local_2b0 = local_7c0;
                uStack_2a8 = uStack_7b8;
                local_2a0 = local_430._0_8_;
                uStack_298 = local_430._8_8_;
                local_290 = local_440._0_8_;
                uStack_288 = local_440._8_8_;
                local_280 = local_450._0_8_;
                uStack_278 = local_450._8_8_;
                pGVar17 = (context->scene->geometries).items[local_7d0].ptr;
                local_780._0_8_ = pGVar17;
                local_3e0._4_4_ = fStack_2fc;
                local_3e0._0_4_ = local_300;
                uStack_3d8._0_4_ = fStack_2f8;
                uStack_3d8._4_4_ = fStack_2f4;
                uStack_3d0._0_4_ = fStack_2f0;
                uStack_3d0._4_4_ = fStack_2ec;
                auVar128 = _local_3e0;
                uStack_3c8._0_4_ = fStack_2e8;
                uStack_3c8._4_4_ = fStack_2e4;
                auVar146 = _local_3e0;
                if ((pGVar17->mask & local_7d8->mask) == 0) {
                  bVar136 = 0;
                  auVar230 = ZEXT3264(_local_600);
                }
                else {
                  auVar230 = ZEXT3264(_local_600);
                  pGVar130 = (Geometry *)context->args;
                  if ((((Geometry *)context->args)->device != (Device *)0x0) ||
                     (bVar136 = 1, pGVar130 = pGVar17,
                     pGVar17->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar166._0_4_ = (float)(int)local_740;
                    auVar166._4_8_ = SUB128(ZEXT812(0),4);
                    auVar166._12_4_ = 0;
                    auVar194 = vshufps_avx(auVar166,auVar166,0);
                    local_240[0] = (auVar194._0_4_ + local_1c0._0_4_ + 0.0) * (float)local_420._0_4_
                    ;
                    local_240[1] = (auVar194._4_4_ + local_1c0._4_4_ + 1.0) * (float)local_420._4_4_
                    ;
                    local_240[2] = (auVar194._8_4_ + local_1c0._8_4_ + 2.0) * fStack_418;
                    local_240[3] = (auVar194._12_4_ + local_1c0._12_4_ + 3.0) * fStack_414;
                    fStack_230 = (auVar194._0_4_ + local_1c0._16_4_ + 4.0) * fStack_410;
                    fStack_22c = (auVar194._4_4_ + local_1c0._20_4_ + 5.0) * fStack_40c;
                    fStack_228 = (auVar194._8_4_ + local_1c0._24_4_ + 6.0) * fStack_408;
                    fStack_224 = auVar194._12_4_ + (float)local_1c0._28_4_ + 7.0;
                    uStack_3d0 = auVar128._16_8_;
                    uStack_3c8 = auVar146._24_8_;
                    local_220 = local_3e0;
                    uStack_218 = uStack_3d8;
                    uStack_210 = uStack_3d0;
                    uStack_208 = uStack_3c8;
                    local_200 = local_1e0;
                    iVar129 = vmovmskps_avx(local_260);
                    local_640._0_8_ = CONCAT44((int)((ulong)pGVar130 >> 0x20),iVar129);
                    local_7a0 = 0;
                    if (local_640._0_8_ != 0) {
                      for (; ((ulong)local_640._0_8_ >> local_7a0 & 1) == 0;
                          local_7a0 = local_7a0 + 1) {
                      }
                    }
                    auStack_798 = auVar363._8_24_;
                    stack0xfffffffffffff9c8 = auVar274._8_24_;
                    local_660._0_4_ =
                         (int)CONCAT71((int7)((ulong)local_640._0_8_ >> 8),iVar129 != 0);
                    _local_3e0 = auVar146;
                    if (iVar129 != 0) {
                      auStack_4f0 = auVar301._16_16_;
                      _local_500 = local_430;
                      _auStack_670 = auVar350._16_16_;
                      _local_680 = local_440;
                      local_5e0 = local_450._0_4_;
                      fStack_5dc = local_450._4_4_;
                      fStack_5d8 = local_450._8_4_;
                      fStack_5d4 = local_450._12_4_;
                      do {
                        local_5a4 = local_240[local_7a0];
                        auVar156 = ZEXT464((uint)local_5a4);
                        local_5a0 = *(undefined4 *)((long)&local_220 + local_7a0 * 4);
                        local_560._0_4_ = local_7d8->tfar;
                        local_7d8->tfar = *(float *)(local_200 + local_7a0 * 4);
                        local_6b0.context = context->user;
                        fVar256 = 1.0 - local_5a4;
                        fVar247 = local_5a4 * fVar256 * 4.0;
                        auVar276 = ZEXT464(0x3f000000);
                        auVar194 = ZEXT416((uint)(local_5a4 * local_5a4 * 0.5));
                        auVar194 = vshufps_avx(auVar194,auVar194,0);
                        auVar182 = ZEXT416((uint)((fVar256 * fVar256 + fVar247) * 0.5));
                        auVar182 = vshufps_avx(auVar182,auVar182,0);
                        auVar223 = ZEXT416((uint)((-local_5a4 * local_5a4 - fVar247) * 0.5));
                        auVar223 = vshufps_avx(auVar223,auVar223,0);
                        auVar195 = ZEXT416((uint)(fVar256 * -fVar256 * 0.5));
                        auVar195 = vshufps_avx(auVar195,auVar195,0);
                        auVar196._0_4_ = auVar195._0_4_ * (float)local_7c0._0_4_;
                        auVar196._4_4_ = auVar195._4_4_ * (float)local_7c0._4_4_;
                        auVar196._8_4_ = auVar195._8_4_ * (float)uStack_7b8;
                        auVar196._12_4_ = auVar195._12_4_ * uStack_7b8._4_4_;
                        auVar205 = ZEXT1664(auVar196);
                        auVar183._0_4_ =
                             auVar196._0_4_ +
                             auVar223._0_4_ * (float)local_500._0_4_ +
                             auVar194._0_4_ * local_5e0 + auVar182._0_4_ * (float)local_680._0_4_;
                        auVar183._4_4_ =
                             auVar196._4_4_ +
                             auVar223._4_4_ * (float)local_500._4_4_ +
                             auVar194._4_4_ * fStack_5dc + auVar182._4_4_ * (float)local_680._4_4_;
                        auVar183._8_4_ =
                             auVar196._8_4_ +
                             auVar223._8_4_ * fStack_4f8 +
                             auVar194._8_4_ * fStack_5d8 + auVar182._8_4_ * fStack_678;
                        auVar183._12_4_ =
                             auVar196._12_4_ +
                             auVar223._12_4_ * fStack_4f4 +
                             auVar194._12_4_ * fStack_5d4 + auVar182._12_4_ * fStack_674;
                        local_5b0 = vmovlps_avx(auVar183);
                        local_5a8 = vextractps_avx(auVar183,2);
                        local_59c = local_7c4;
                        local_598 = (int)local_7d0;
                        local_594 = (local_6b0.context)->instID[0];
                        local_590 = (local_6b0.context)->instPrimID[0];
                        local_7dc = -1;
                        local_6b0.valid = &local_7dc;
                        local_6b0.geometryUserPtr = *(void **)(local_780._0_8_ + 0x18);
                        local_6b0.ray = (RTCRayN *)local_7d8;
                        local_6b0.hit = (RTCHitN *)&local_5b0;
                        local_6b0.N = 1;
                        if (*(code **)(local_780._0_8_ + 0x48) == (code *)0x0) {
LAB_010fdc7a:
                          p_Var18 = context->args->filter;
                          if (p_Var18 == (RTCFilterFunctionN)0x0) break;
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             ((*(byte *)(local_780._0_8_ + 0x3e) & 0x40) != 0)) {
                            auVar205 = ZEXT1664(auVar205._0_16_);
                            auVar276 = ZEXT1664(auVar276._0_16_);
                            auVar156._0_8_ = (*p_Var18)(&local_6b0);
                            auVar156._8_56_ = extraout_var_00;
                          }
                          if (*local_6b0.valid != 0) break;
                        }
                        else {
                          auVar205 = ZEXT1664(auVar196);
                          auVar276 = ZEXT1664(auVar276._0_16_);
                          auVar156._0_8_ = (**(code **)(local_780._0_8_ + 0x48))(&local_6b0);
                          auVar156._8_56_ = extraout_var;
                          if (*local_6b0.valid != 0) goto LAB_010fdc7a;
                        }
                        auVar156 = ZEXT464((uint)local_560._0_4_);
                        local_7d8->tfar = (float)local_560._0_4_;
                        uVar131 = local_640._0_8_ ^ 1L << (local_7a0 & 0x3f);
                        lVar138 = 0;
                        if (uVar131 != 0) {
                          for (; (uVar131 >> lVar138 & 1) == 0; lVar138 = lVar138 + 1) {
                          }
                        }
                        local_7a0 = lVar138;
                        local_640._0_8_ = uVar131;
                        local_660._0_4_ = (int)CONCAT71((int7)(uVar131 >> 8),uVar131 != 0);
                      } while (uVar131 != 0);
                    }
                    bVar136 = local_660[0] & 1;
                    auVar304 = ZEXT3264(local_720);
                    auVar230 = ZEXT3264(_local_600);
                    pGVar135 = (Geometry *)(ulong)local_620;
                    fVar265 = (float)local_6e0._0_4_;
                    fVar277 = (float)local_6e0._4_4_;
                    fVar278 = fStack_6d8;
                    fVar279 = fStack_6d4;
                    fVar247 = fStack_6d0;
                    fVar256 = fStack_6cc;
                    fVar258 = fStack_6c8;
                    fVar259 = fStack_6c4;
                    fVar210 = (float)local_540._0_4_;
                    fVar211 = (float)local_540._4_4_;
                    fVar212 = fStack_538;
                    fVar214 = fStack_534;
                    fVar216 = fStack_530;
                    fVar231 = fStack_52c;
                    fVar235 = fStack_528;
                    fVar239 = fStack_524;
                    fVar373 = (float)local_760._0_4_;
                    fVar376 = (float)local_760._4_4_;
                    fVar377 = fStack_758;
                    fVar378 = fStack_754;
                    fVar260 = fStack_750;
                    fVar262 = fStack_74c;
                    fVar263 = fStack_748;
                    fVar217 = (float)local_700._0_4_;
                    fVar232 = (float)local_700._4_4_;
                    fVar236 = fStack_6f8;
                    fVar240 = fStack_6f4;
                    fVar191 = fStack_6f0;
                    fVar206 = fStack_6ec;
                    fVar208 = fStack_6e8;
                  }
                }
                pGVar135 = (Geometry *)
                           CONCAT71((int7)((ulong)pGVar135 >> 8),(byte)pGVar135 | bVar136);
                lVar138 = CONCAT44(uStack_73c,local_740);
                goto LAB_010fd8e6;
              }
            }
            auVar230 = ZEXT3264(_local_600);
          }
LAB_010fd8e6:
          lVar138 = lVar138 + 8;
        } while ((int)lVar138 < (int)uVar133);
      }
      if (((ulong)pGVar135 & 1) != 0) {
        return bVar140;
      }
      fVar247 = local_7d8->tfar;
      auVar152._4_4_ = fVar247;
      auVar152._0_4_ = fVar247;
      auVar152._8_4_ = fVar247;
      auVar152._12_4_ = fVar247;
      auVar152._16_4_ = fVar247;
      auVar152._20_4_ = fVar247;
      auVar152._24_4_ = fVar247;
      auVar152._28_4_ = fVar247;
      auVar146 = vcmpps_avx(local_80,auVar152,2);
      uVar133 = vmovmskps_avx(auVar146);
      uVar133 = (uint)uVar139 & uVar133;
      bVar140 = uVar133 != 0;
      ray = local_7d8;
      pre = local_7a8;
    } while (bVar140);
  }
  return bVar140;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }
          
          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }